

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<8,16>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Primitive PVar11;
  uint uVar12;
  int iVar13;
  undefined4 uVar14;
  RTCFilterFunctionN p_Var15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  long lVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  int iVar93;
  int iVar94;
  int iVar95;
  undefined8 uVar96;
  undefined8 uVar97;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  byte bVar103;
  byte bVar104;
  ulong uVar105;
  uint uVar106;
  uint uVar107;
  ulong uVar108;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  uint uVar109;
  Geometry *pGVar110;
  uint uVar111;
  ulong uVar112;
  long lVar113;
  byte bVar114;
  float fVar115;
  float fVar116;
  float fVar165;
  float fVar166;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar120 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar121 [16];
  float fVar167;
  float fVar169;
  float fVar170;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  float fVar168;
  float fVar171;
  float fVar172;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  float fVar173;
  undefined4 uVar174;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [64];
  undefined8 uVar187;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar191;
  float fVar192;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar205;
  undefined1 auVar204 [64];
  float fVar206;
  float fVar212;
  float fVar213;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [64];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  vint<16> mask;
  RTCFilterFunctionNArguments local_910;
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  Geometry *local_8d0;
  undefined1 (*local_8c8) [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  float local_820;
  float fStack_81c;
  float fStack_818;
  float fStack_814;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined4 local_800;
  undefined4 uStack_7fc;
  undefined8 uStack_7f8;
  LinearSpace3fa *local_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  uint local_760;
  uint uStack_75c;
  uint uStack_758;
  uint uStack_754;
  uint uStack_750;
  uint uStack_74c;
  uint uStack_748;
  uint uStack_744;
  float local_740;
  undefined1 auStack_73c [8];
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined4 local_6c0;
  int local_6bc;
  undefined1 local_6b0 [16];
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  byte local_670;
  float local_660 [4];
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined1 local_620 [32];
  undefined1 local_600 [64];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined8 local_570;
  undefined8 uStack_568;
  undefined1 local_560 [32];
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined4 uStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  PVar11 = prim[1];
  uVar108 = (ulong)(byte)PVar11;
  fVar206 = *(float *)(prim + uVar108 * 0x19 + 0x12);
  auVar30 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar30 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar119 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar188 = vinsertps_avx(auVar119,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar193 = vsubps_avx(auVar30,*(undefined1 (*) [16])(prim + uVar108 * 0x19 + 6));
  fVar191 = fVar206 * auVar193._0_4_;
  fVar173 = fVar206 * auVar188._0_4_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar108 * 4 + 6);
  auVar127 = vpmovsxbd_avx2(auVar30);
  auVar119._8_8_ = 0;
  auVar119._0_8_ = *(ulong *)(prim + uVar108 * 5 + 6);
  auVar125 = vpmovsxbd_avx2(auVar119);
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = *(ulong *)(prim + uVar108 * 6 + 6);
  auVar140 = vpmovsxbd_avx2(auVar118);
  auVar140 = vcvtdq2ps_avx(auVar140);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar108 * 0xb + 6);
  auVar141 = vpmovsxbd_avx2(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar11 * 0xc) + 6);
  auVar138 = vpmovsxbd_avx2(auVar9);
  auVar141 = vcvtdq2ps_avx(auVar141);
  auVar139 = vcvtdq2ps_avx(auVar138);
  auVar176._8_8_ = 0;
  auVar176._0_8_ = *(ulong *)(prim + (uint)(byte)PVar11 * 0xc + uVar108 + 6);
  auVar126 = vpmovsxbd_avx2(auVar176);
  auVar126 = vcvtdq2ps_avx(auVar126);
  uVar112 = (ulong)(uint)((int)(uVar108 * 9) * 2);
  auVar175._8_8_ = 0;
  auVar175._0_8_ = *(ulong *)(prim + uVar112 + 6);
  auVar128 = vpmovsxbd_avx2(auVar175);
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = *(ulong *)(prim + uVar112 + uVar108 + 6);
  auVar129 = vpmovsxbd_avx2(auVar117);
  auVar129 = vcvtdq2ps_avx(auVar129);
  uVar105 = (ulong)(uint)((int)(uVar108 * 5) << 2);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar105 + 6);
  auVar124 = vpmovsxbd_avx2(auVar10);
  auVar130 = vcvtdq2ps_avx(auVar124);
  auVar230._4_4_ = fVar173;
  auVar230._0_4_ = fVar173;
  auVar230._8_4_ = fVar173;
  auVar230._12_4_ = fVar173;
  auVar230._16_4_ = fVar173;
  auVar230._20_4_ = fVar173;
  auVar230._24_4_ = fVar173;
  auVar230._28_4_ = fVar173;
  auVar232._8_4_ = 1;
  auVar232._0_8_ = 0x100000001;
  auVar232._12_4_ = 1;
  auVar232._16_4_ = 1;
  auVar232._20_4_ = 1;
  auVar232._24_4_ = 1;
  auVar232._28_4_ = 1;
  auVar122 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar132 = ZEXT1632(CONCAT412(fVar206 * auVar188._12_4_,
                                CONCAT48(fVar206 * auVar188._8_4_,
                                         CONCAT44(fVar206 * auVar188._4_4_,fVar173))));
  auVar131 = vpermps_avx2(auVar232,auVar132);
  auVar123 = vpermps_avx512vl(auVar122,auVar132);
  fVar173 = auVar123._0_4_;
  fVar212 = auVar123._4_4_;
  auVar132._4_4_ = fVar212 * auVar140._4_4_;
  auVar132._0_4_ = fVar173 * auVar140._0_4_;
  fVar213 = auVar123._8_4_;
  auVar132._8_4_ = fVar213 * auVar140._8_4_;
  fVar192 = auVar123._12_4_;
  auVar132._12_4_ = fVar192 * auVar140._12_4_;
  fVar205 = auVar123._16_4_;
  auVar132._16_4_ = fVar205 * auVar140._16_4_;
  fVar115 = auVar123._20_4_;
  auVar132._20_4_ = fVar115 * auVar140._20_4_;
  fVar116 = auVar123._24_4_;
  auVar132._24_4_ = fVar116 * auVar140._24_4_;
  auVar132._28_4_ = auVar138._28_4_;
  auVar138._4_4_ = auVar126._4_4_ * fVar212;
  auVar138._0_4_ = auVar126._0_4_ * fVar173;
  auVar138._8_4_ = auVar126._8_4_ * fVar213;
  auVar138._12_4_ = auVar126._12_4_ * fVar192;
  auVar138._16_4_ = auVar126._16_4_ * fVar205;
  auVar138._20_4_ = auVar126._20_4_ * fVar115;
  auVar138._24_4_ = auVar126._24_4_ * fVar116;
  auVar138._28_4_ = auVar124._28_4_;
  auVar124._4_4_ = auVar130._4_4_ * fVar212;
  auVar124._0_4_ = auVar130._0_4_ * fVar173;
  auVar124._8_4_ = auVar130._8_4_ * fVar213;
  auVar124._12_4_ = auVar130._12_4_ * fVar192;
  auVar124._16_4_ = auVar130._16_4_ * fVar205;
  auVar124._20_4_ = auVar130._20_4_ * fVar115;
  auVar124._24_4_ = auVar130._24_4_ * fVar116;
  auVar124._28_4_ = auVar123._28_4_;
  auVar30 = vfmadd231ps_fma(auVar132,auVar131,auVar125);
  auVar119 = vfmadd231ps_fma(auVar138,auVar131,auVar139);
  auVar118 = vfmadd231ps_fma(auVar124,auVar129,auVar131);
  auVar30 = vfmadd231ps_fma(ZEXT1632(auVar30),auVar230,auVar127);
  auVar119 = vfmadd231ps_fma(ZEXT1632(auVar119),auVar230,auVar141);
  auVar118 = vfmadd231ps_fma(ZEXT1632(auVar118),auVar128,auVar230);
  auVar231._4_4_ = fVar191;
  auVar231._0_4_ = fVar191;
  auVar231._8_4_ = fVar191;
  auVar231._12_4_ = fVar191;
  auVar231._16_4_ = fVar191;
  auVar231._20_4_ = fVar191;
  auVar231._24_4_ = fVar191;
  auVar231._28_4_ = fVar191;
  auVar124 = ZEXT1632(CONCAT412(fVar206 * auVar193._12_4_,
                                CONCAT48(fVar206 * auVar193._8_4_,
                                         CONCAT44(fVar206 * auVar193._4_4_,fVar191))));
  auVar138 = vpermps_avx2(auVar232,auVar124);
  auVar124 = vpermps_avx512vl(auVar122,auVar124);
  fVar206 = auVar124._0_4_;
  fVar173 = auVar124._4_4_;
  auVar131._4_4_ = fVar173 * auVar140._4_4_;
  auVar131._0_4_ = fVar206 * auVar140._0_4_;
  fVar212 = auVar124._8_4_;
  auVar131._8_4_ = fVar212 * auVar140._8_4_;
  fVar213 = auVar124._12_4_;
  auVar131._12_4_ = fVar213 * auVar140._12_4_;
  fVar192 = auVar124._16_4_;
  auVar131._16_4_ = fVar192 * auVar140._16_4_;
  fVar205 = auVar124._20_4_;
  auVar131._20_4_ = fVar205 * auVar140._20_4_;
  fVar115 = auVar124._24_4_;
  auVar131._24_4_ = fVar115 * auVar140._24_4_;
  auVar131._28_4_ = 1;
  auVar122._4_4_ = auVar126._4_4_ * fVar173;
  auVar122._0_4_ = auVar126._0_4_ * fVar206;
  auVar122._8_4_ = auVar126._8_4_ * fVar212;
  auVar122._12_4_ = auVar126._12_4_ * fVar213;
  auVar122._16_4_ = auVar126._16_4_ * fVar192;
  auVar122._20_4_ = auVar126._20_4_ * fVar205;
  auVar122._24_4_ = auVar126._24_4_ * fVar115;
  auVar122._28_4_ = auVar140._28_4_;
  auVar126._4_4_ = auVar130._4_4_ * fVar173;
  auVar126._0_4_ = auVar130._0_4_ * fVar206;
  auVar126._8_4_ = auVar130._8_4_ * fVar212;
  auVar126._12_4_ = auVar130._12_4_ * fVar213;
  auVar126._16_4_ = auVar130._16_4_ * fVar192;
  auVar126._20_4_ = auVar130._20_4_ * fVar205;
  auVar126._24_4_ = auVar130._24_4_ * fVar115;
  auVar126._28_4_ = auVar124._28_4_;
  auVar8 = vfmadd231ps_fma(auVar131,auVar138,auVar125);
  auVar9 = vfmadd231ps_fma(auVar122,auVar138,auVar139);
  auVar176 = vfmadd231ps_fma(auVar126,auVar138,auVar129);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar231,auVar127);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar231,auVar141);
  auVar223._8_4_ = 0x7fffffff;
  auVar223._0_8_ = 0x7fffffff7fffffff;
  auVar223._12_4_ = 0x7fffffff;
  auVar223._16_4_ = 0x7fffffff;
  auVar223._20_4_ = 0x7fffffff;
  auVar223._24_4_ = 0x7fffffff;
  auVar223._28_4_ = 0x7fffffff;
  auVar176 = vfmadd231ps_fma(ZEXT1632(auVar176),auVar231,auVar128);
  auVar127 = vandps_avx(ZEXT1632(auVar30),auVar223);
  auVar137._8_4_ = 0x219392ef;
  auVar137._0_8_ = 0x219392ef219392ef;
  auVar137._12_4_ = 0x219392ef;
  auVar137._16_4_ = 0x219392ef;
  auVar137._20_4_ = 0x219392ef;
  auVar137._24_4_ = 0x219392ef;
  auVar137._28_4_ = 0x219392ef;
  uVar112 = vcmpps_avx512vl(auVar127,auVar137,1);
  bVar16 = (bool)((byte)uVar112 & 1);
  auVar123._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar30._0_4_;
  bVar16 = (bool)((byte)(uVar112 >> 1) & 1);
  auVar123._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar30._4_4_;
  bVar16 = (bool)((byte)(uVar112 >> 2) & 1);
  auVar123._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar30._8_4_;
  bVar16 = (bool)((byte)(uVar112 >> 3) & 1);
  auVar123._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar30._12_4_;
  auVar123._16_4_ = (uint)((byte)(uVar112 >> 4) & 1) * 0x219392ef;
  auVar123._20_4_ = (uint)((byte)(uVar112 >> 5) & 1) * 0x219392ef;
  auVar123._24_4_ = (uint)((byte)(uVar112 >> 6) & 1) * 0x219392ef;
  auVar123._28_4_ = (uint)(byte)(uVar112 >> 7) * 0x219392ef;
  auVar127 = vandps_avx(ZEXT1632(auVar119),auVar223);
  uVar112 = vcmpps_avx512vl(auVar127,auVar137,1);
  bVar16 = (bool)((byte)uVar112 & 1);
  auVar133._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar119._0_4_;
  bVar16 = (bool)((byte)(uVar112 >> 1) & 1);
  auVar133._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar119._4_4_;
  bVar16 = (bool)((byte)(uVar112 >> 2) & 1);
  auVar133._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar119._8_4_;
  bVar16 = (bool)((byte)(uVar112 >> 3) & 1);
  auVar133._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar119._12_4_;
  auVar133._16_4_ = (uint)((byte)(uVar112 >> 4) & 1) * 0x219392ef;
  auVar133._20_4_ = (uint)((byte)(uVar112 >> 5) & 1) * 0x219392ef;
  auVar133._24_4_ = (uint)((byte)(uVar112 >> 6) & 1) * 0x219392ef;
  auVar133._28_4_ = (uint)(byte)(uVar112 >> 7) * 0x219392ef;
  auVar127 = vandps_avx(ZEXT1632(auVar118),auVar223);
  uVar112 = vcmpps_avx512vl(auVar127,auVar137,1);
  bVar16 = (bool)((byte)uVar112 & 1);
  auVar127._0_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar118._0_4_;
  bVar16 = (bool)((byte)(uVar112 >> 1) & 1);
  auVar127._4_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar118._4_4_;
  bVar16 = (bool)((byte)(uVar112 >> 2) & 1);
  auVar127._8_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar118._8_4_;
  bVar16 = (bool)((byte)(uVar112 >> 3) & 1);
  auVar127._12_4_ = (uint)bVar16 * 0x219392ef | (uint)!bVar16 * auVar118._12_4_;
  auVar127._16_4_ = (uint)((byte)(uVar112 >> 4) & 1) * 0x219392ef;
  auVar127._20_4_ = (uint)((byte)(uVar112 >> 5) & 1) * 0x219392ef;
  auVar127._24_4_ = (uint)((byte)(uVar112 >> 6) & 1) * 0x219392ef;
  auVar127._28_4_ = (uint)(byte)(uVar112 >> 7) * 0x219392ef;
  auVar125 = vrcp14ps_avx512vl(auVar123);
  auVar220._8_4_ = 0x3f800000;
  auVar220._0_8_ = &DAT_3f8000003f800000;
  auVar220._12_4_ = 0x3f800000;
  auVar220._16_4_ = 0x3f800000;
  auVar220._20_4_ = 0x3f800000;
  auVar220._24_4_ = 0x3f800000;
  auVar220._28_4_ = 0x3f800000;
  auVar30 = vfnmadd213ps_fma(auVar123,auVar125,auVar220);
  auVar30 = vfmadd132ps_fma(ZEXT1632(auVar30),auVar125,auVar125);
  auVar125 = vrcp14ps_avx512vl(auVar133);
  auVar119 = vfnmadd213ps_fma(auVar133,auVar125,auVar220);
  auVar119 = vfmadd132ps_fma(ZEXT1632(auVar119),auVar125,auVar125);
  auVar125 = vrcp14ps_avx512vl(auVar127);
  auVar118 = vfnmadd213ps_fma(auVar127,auVar125,auVar220);
  auVar118 = vfmadd132ps_fma(ZEXT1632(auVar118),auVar125,auVar125);
  auVar127 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar108 * 7 + 6));
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar127 = vsubps_avx(auVar127,ZEXT1632(auVar8));
  auVar128._4_4_ = auVar30._4_4_ * auVar127._4_4_;
  auVar128._0_4_ = auVar30._0_4_ * auVar127._0_4_;
  auVar128._8_4_ = auVar30._8_4_ * auVar127._8_4_;
  auVar128._12_4_ = auVar30._12_4_ * auVar127._12_4_;
  auVar128._16_4_ = auVar127._16_4_ * 0.0;
  auVar128._20_4_ = auVar127._20_4_ * 0.0;
  auVar128._24_4_ = auVar127._24_4_ * 0.0;
  auVar128._28_4_ = auVar127._28_4_;
  auVar127 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar108 * 9 + 6));
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar127 = vsubps_avx(auVar127,ZEXT1632(auVar8));
  auVar126 = vpbroadcastd_avx512vl();
  auVar125 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar11 * 0x10 + 6));
  auVar136._0_4_ = auVar30._0_4_ * auVar127._0_4_;
  auVar136._4_4_ = auVar30._4_4_ * auVar127._4_4_;
  auVar136._8_4_ = auVar30._8_4_ * auVar127._8_4_;
  auVar136._12_4_ = auVar30._12_4_ * auVar127._12_4_;
  auVar136._16_4_ = auVar127._16_4_ * 0.0;
  auVar136._20_4_ = auVar127._20_4_ * 0.0;
  auVar136._24_4_ = auVar127._24_4_ * 0.0;
  auVar136._28_4_ = 0;
  auVar127 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar11 * 0x10 + uVar108 * -2 + 6));
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar127 = vsubps_avx(auVar127,ZEXT1632(auVar9));
  auVar129._4_4_ = auVar119._4_4_ * auVar127._4_4_;
  auVar129._0_4_ = auVar119._0_4_ * auVar127._0_4_;
  auVar129._8_4_ = auVar119._8_4_ * auVar127._8_4_;
  auVar129._12_4_ = auVar119._12_4_ * auVar127._12_4_;
  auVar129._16_4_ = auVar127._16_4_ * 0.0;
  auVar129._20_4_ = auVar127._20_4_ * 0.0;
  auVar129._24_4_ = auVar127._24_4_ * 0.0;
  auVar129._28_4_ = auVar127._28_4_;
  auVar221 = ZEXT3264(auVar129);
  auVar127 = vcvtdq2ps_avx(auVar125);
  auVar127 = vsubps_avx(auVar127,ZEXT1632(auVar9));
  auVar135._0_4_ = auVar119._0_4_ * auVar127._0_4_;
  auVar135._4_4_ = auVar119._4_4_ * auVar127._4_4_;
  auVar135._8_4_ = auVar119._8_4_ * auVar127._8_4_;
  auVar135._12_4_ = auVar119._12_4_ * auVar127._12_4_;
  auVar135._16_4_ = auVar127._16_4_ * 0.0;
  auVar135._20_4_ = auVar127._20_4_ * 0.0;
  auVar135._24_4_ = auVar127._24_4_ * 0.0;
  auVar135._28_4_ = 0;
  auVar127 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar105 + uVar108 + 6));
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar127 = vsubps_avx(auVar127,ZEXT1632(auVar176));
  auVar130._4_4_ = auVar127._4_4_ * auVar118._4_4_;
  auVar130._0_4_ = auVar127._0_4_ * auVar118._0_4_;
  auVar130._8_4_ = auVar127._8_4_ * auVar118._8_4_;
  auVar130._12_4_ = auVar127._12_4_ * auVar118._12_4_;
  auVar130._16_4_ = auVar127._16_4_ * 0.0;
  auVar130._20_4_ = auVar127._20_4_ * 0.0;
  auVar130._24_4_ = auVar127._24_4_ * 0.0;
  auVar130._28_4_ = auVar127._28_4_;
  auVar127 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar108 * 0x17 + 6));
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar127 = vsubps_avx(auVar127,ZEXT1632(auVar176));
  auVar134._0_4_ = auVar118._0_4_ * auVar127._0_4_;
  auVar134._4_4_ = auVar118._4_4_ * auVar127._4_4_;
  auVar134._8_4_ = auVar118._8_4_ * auVar127._8_4_;
  auVar134._12_4_ = auVar118._12_4_ * auVar127._12_4_;
  auVar134._16_4_ = auVar127._16_4_ * 0.0;
  auVar134._20_4_ = auVar127._20_4_ * 0.0;
  auVar134._24_4_ = auVar127._24_4_ * 0.0;
  auVar134._28_4_ = 0;
  auVar127 = vpminsd_avx2(auVar128,auVar136);
  auVar125 = vpminsd_avx2(auVar129,auVar135);
  auVar127 = vmaxps_avx(auVar127,auVar125);
  auVar125 = vpminsd_avx2(auVar130,auVar134);
  uVar174 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar140._4_4_ = uVar174;
  auVar140._0_4_ = uVar174;
  auVar140._8_4_ = uVar174;
  auVar140._12_4_ = uVar174;
  auVar140._16_4_ = uVar174;
  auVar140._20_4_ = uVar174;
  auVar140._24_4_ = uVar174;
  auVar140._28_4_ = uVar174;
  auVar125 = vmaxps_avx512vl(auVar125,auVar140);
  auVar127 = vmaxps_avx(auVar127,auVar125);
  auVar125._8_4_ = 0x3f7ffffa;
  auVar125._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar125._12_4_ = 0x3f7ffffa;
  auVar125._16_4_ = 0x3f7ffffa;
  auVar125._20_4_ = 0x3f7ffffa;
  auVar125._24_4_ = 0x3f7ffffa;
  auVar125._28_4_ = 0x3f7ffffa;
  local_320 = vmulps_avx512vl(auVar127,auVar125);
  auVar204 = ZEXT3264(local_320);
  auVar127 = vpmaxsd_avx2(auVar128,auVar136);
  auVar125 = vpmaxsd_avx2(auVar129,auVar135);
  auVar127 = vminps_avx(auVar127,auVar125);
  auVar125 = vpmaxsd_avx2(auVar130,auVar134);
  uVar174 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar141._4_4_ = uVar174;
  auVar141._0_4_ = uVar174;
  auVar141._8_4_ = uVar174;
  auVar141._12_4_ = uVar174;
  auVar141._16_4_ = uVar174;
  auVar141._20_4_ = uVar174;
  auVar141._24_4_ = uVar174;
  auVar141._28_4_ = uVar174;
  auVar125 = vminps_avx512vl(auVar125,auVar141);
  auVar127 = vminps_avx(auVar127,auVar125);
  auVar139._8_4_ = 0x3f800003;
  auVar139._0_8_ = 0x3f8000033f800003;
  auVar139._12_4_ = 0x3f800003;
  auVar139._16_4_ = 0x3f800003;
  auVar139._20_4_ = 0x3f800003;
  auVar139._24_4_ = 0x3f800003;
  auVar139._28_4_ = 0x3f800003;
  auVar127 = vmulps_avx512vl(auVar127,auVar139);
  uVar33 = vpcmpgtd_avx512vl(auVar126,_DAT_0205a920);
  uVar31 = vcmpps_avx512vl(local_320,auVar127,2);
  if ((byte)((byte)uVar31 & (byte)uVar33) != 0) {
    uVar112 = (ulong)(byte)((byte)uVar31 & (byte)uVar33);
    local_7e8 = pre->ray_space + k;
    local_8c8 = (undefined1 (*) [32])local_100;
    auVar186 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar186);
    do {
      auVar125 = auVar221._0_32_;
      auVar127 = auVar204._0_32_;
      local_860 = in_ZMM21._0_32_;
      local_840 = in_ZMM20._0_32_;
      lVar34 = 0;
      for (uVar105 = uVar112; (uVar105 & 1) == 0; uVar105 = uVar105 >> 1 | 0x8000000000000000) {
        lVar34 = lVar34 + 1;
      }
      uVar111 = *(uint *)(prim + 2);
      uVar12 = *(uint *)(prim + lVar34 * 4 + 6);
      pGVar110 = (context->scene->geometries).items[uVar111].ptr;
      uVar105 = (ulong)*(uint *)(*(long *)&pGVar110->field_0x58 +
                                pGVar110[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i * (ulong)uVar12);
      p_Var15 = pGVar110[1].intersectionFilterN;
      lVar34 = *(long *)&pGVar110[1].time_range.upper;
      auVar30 = *(undefined1 (*) [16])(lVar34 + (long)p_Var15 * uVar105);
      pauVar3 = (undefined1 (*) [16])(lVar34 + (uVar105 + 1) * (long)p_Var15);
      uVar31 = *(undefined8 *)*pauVar3;
      uVar33 = *(undefined8 *)(*pauVar3 + 8);
      auVar9 = *pauVar3;
      auVar119 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar34 + (uVar105 + 2) * (long)p_Var15);
      uVar96 = *(undefined8 *)*pauVar4;
      uVar97 = *(undefined8 *)(*pauVar4 + 8);
      auVar8 = *pauVar4;
      auVar118 = *pauVar4;
      uVar112 = uVar112 - 1 & uVar112;
      pauVar5 = (undefined1 (*) [12])(lVar34 + (uVar105 + 3) * (long)p_Var15);
      local_680 = *(undefined8 *)*pauVar5;
      uStack_678 = *(undefined8 *)(*pauVar5 + 8);
      local_8e0 = (float)local_680;
      fStack_8dc = (float)((ulong)local_680 >> 0x20);
      fStack_8d8 = (float)uStack_678;
      fStack_8d4 = (float)((ulong)uStack_678 >> 0x20);
      if (uVar112 != 0) {
        uVar108 = uVar112 - 1 & uVar112;
        for (uVar105 = uVar112; (uVar105 & 1) == 0; uVar105 = uVar105 >> 1 | 0x8000000000000000) {
        }
        if (uVar108 != 0) {
          for (; (uVar108 & 1) == 0; uVar108 = uVar108 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar13 = (int)pGVar110[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar176 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x1c);
      auVar176 = vinsertps_avx(auVar176,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      auVar117 = vsubps_avx(auVar30,auVar176);
      uVar174 = auVar117._0_4_;
      auVar188._4_4_ = uVar174;
      auVar188._0_4_ = uVar174;
      auVar188._8_4_ = uVar174;
      auVar188._12_4_ = uVar174;
      auVar175 = vshufps_avx(auVar117,auVar117,0x55);
      auVar117 = vshufps_avx(auVar117,auVar117,0xaa);
      aVar6 = (local_7e8->vx).field_0;
      aVar7 = (local_7e8->vy).field_0;
      fVar206 = (local_7e8->vz).field_0.m128[0];
      fVar173 = *(float *)((long)&(local_7e8->vz).field_0 + 4);
      fVar212 = *(float *)((long)&(local_7e8->vz).field_0 + 8);
      fVar213 = *(float *)((long)&(local_7e8->vz).field_0 + 0xc);
      auVar225._0_4_ = fVar206 * auVar117._0_4_;
      auVar225._4_4_ = fVar173 * auVar117._4_4_;
      auVar225._8_4_ = fVar212 * auVar117._8_4_;
      auVar225._12_4_ = fVar213 * auVar117._12_4_;
      auVar175 = vfmadd231ps_fma(auVar225,(undefined1  [16])aVar7,auVar175);
      auVar188 = vfmadd231ps_fma(auVar175,(undefined1  [16])aVar6,auVar188);
      auVar175 = vshufps_avx(auVar30,auVar30,0xff);
      auVar10 = vsubps_avx(auVar119,auVar176);
      uVar174 = auVar10._0_4_;
      auVar193._4_4_ = uVar174;
      auVar193._0_4_ = uVar174;
      auVar193._8_4_ = uVar174;
      auVar193._12_4_ = uVar174;
      auVar117 = vshufps_avx(auVar10,auVar10,0x55);
      auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
      auVar226._0_4_ = fVar206 * auVar10._0_4_;
      auVar226._4_4_ = fVar173 * auVar10._4_4_;
      auVar226._8_4_ = fVar212 * auVar10._8_4_;
      auVar226._12_4_ = fVar213 * auVar10._12_4_;
      auVar117 = vfmadd231ps_fma(auVar226,(undefined1  [16])aVar7,auVar117);
      auVar193 = vfmadd231ps_fma(auVar117,(undefined1  [16])aVar6,auVar193);
      auVar119 = vshufps_avx(auVar119,auVar119,0xff);
      auVar10 = vsubps_avx(auVar118,auVar176);
      uVar174 = auVar10._0_4_;
      auVar222._4_4_ = uVar174;
      auVar222._0_4_ = uVar174;
      auVar222._8_4_ = uVar174;
      auVar222._12_4_ = uVar174;
      auVar117 = vshufps_avx(auVar10,auVar10,0x55);
      auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
      auVar121._0_4_ = fVar206 * auVar10._0_4_;
      auVar121._4_4_ = fVar173 * auVar10._4_4_;
      auVar121._8_4_ = fVar212 * auVar10._8_4_;
      auVar121._12_4_ = fVar213 * auVar10._12_4_;
      auVar117 = vfmadd231ps_fma(auVar121,(undefined1  [16])aVar7,auVar117);
      auVar10 = vfmadd231ps_fma(auVar117,(undefined1  [16])aVar6,auVar222);
      auVar118 = vshufps_avx(auVar118,auVar118,0xff);
      auVar35._12_4_ = fStack_8d4;
      auVar35._0_12_ = *pauVar5;
      auVar117 = vsubps_avx512vl(auVar35,auVar176);
      uVar174 = auVar117._0_4_;
      auVar120._4_4_ = uVar174;
      auVar120._0_4_ = uVar174;
      auVar120._8_4_ = uVar174;
      auVar120._12_4_ = uVar174;
      auVar176 = vshufps_avx(auVar117,auVar117,0x55);
      auVar117 = vshufps_avx(auVar117,auVar117,0xaa);
      auVar228._0_4_ = fVar206 * auVar117._0_4_;
      auVar228._4_4_ = fVar173 * auVar117._4_4_;
      auVar228._8_4_ = fVar212 * auVar117._8_4_;
      auVar228._12_4_ = fVar213 * auVar117._12_4_;
      auVar176 = vfmadd231ps_fma(auVar228,(undefined1  [16])aVar7,auVar176);
      auVar176 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar6,auVar120);
      lVar34 = (long)iVar13 * 0x44;
      auVar140 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar34);
      auVar117 = vshufps_avx512vl(auVar35,auVar35,0xff);
      local_7a0 = vbroadcastss_avx512vl(auVar188);
      auVar207._8_4_ = 1;
      auVar207._0_8_ = 0x100000001;
      auVar207._12_4_ = 1;
      auVar207._16_4_ = 1;
      auVar207._20_4_ = 1;
      auVar207._24_4_ = 1;
      auVar207._28_4_ = 1;
      local_7c0 = vpermps_avx512vl(auVar207,ZEXT1632(auVar188));
      uVar187 = auVar175._0_8_;
      local_340._8_8_ = uVar187;
      local_340._0_8_ = uVar187;
      local_340._16_8_ = uVar187;
      local_340._24_8_ = uVar187;
      auVar141 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar34 + 0x484);
      uVar174 = auVar193._0_4_;
      local_8c0._4_4_ = uVar174;
      local_8c0._0_4_ = uVar174;
      local_8c0._8_4_ = uVar174;
      local_8c0._12_4_ = uVar174;
      local_8c0._16_4_ = uVar174;
      local_8c0._20_4_ = uVar174;
      local_8c0._24_4_ = uVar174;
      local_8c0._28_4_ = uVar174;
      local_560 = vpermps_avx512vl(auVar207,ZEXT1632(auVar193));
      uVar187 = auVar119._0_8_;
      local_360._8_8_ = uVar187;
      local_360._0_8_ = uVar187;
      local_360._16_8_ = uVar187;
      local_360._24_8_ = uVar187;
      auVar139 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar34 + 0x908);
      local_380 = vbroadcastss_avx512vl(auVar10);
      local_3a0 = vpermps_avx512vl(auVar207,ZEXT1632(auVar10));
      local_3c0 = vbroadcastsd_avx512vl(auVar118);
      auVar126 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar34 + 0xd8c);
      local_880 = vbroadcastss_avx512vl(auVar176);
      auVar186 = ZEXT3264(local_880);
      local_8a0 = vpermps_avx512vl(auVar207,ZEXT1632(auVar176));
      auVar240 = ZEXT3264(local_8a0);
      _local_3e0 = vbroadcastsd_avx512vl(auVar117);
      auVar128 = vmulps_avx512vl(local_880,auVar126);
      auVar129 = vmulps_avx512vl(local_8a0,auVar126);
      auVar128 = vfmadd231ps_avx512vl(auVar128,auVar139,local_380);
      auVar129 = vfmadd231ps_avx512vl(auVar129,auVar139,local_3a0);
      auVar119 = vfmadd231ps_fma(auVar128,auVar141,local_8c0);
      auVar130 = vfmadd231ps_avx512vl(auVar129,auVar141,local_560);
      auVar124 = vfmadd231ps_avx512vl(ZEXT1632(auVar119),auVar140,local_7a0);
      auVar128 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar34);
      auVar129 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar34 + 0x484);
      auVar131 = vfmadd231ps_avx512vl(auVar130,auVar140,local_7c0);
      auVar130 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar34 + 0x908);
      auVar138 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar34 + 0xd8c);
      auVar132 = vmulps_avx512vl(local_880,auVar138);
      auVar122 = vmulps_avx512vl(local_8a0,auVar138);
      auVar132 = vfmadd231ps_avx512vl(auVar132,auVar130,local_380);
      auVar122 = vfmadd231ps_avx512vl(auVar122,auVar130,local_3a0);
      auVar132 = vfmadd231ps_avx512vl(auVar132,auVar129,local_8c0);
      auVar122 = vfmadd231ps_avx512vl(auVar122,auVar129,local_560);
      auVar132 = vfmadd231ps_avx512vl(auVar132,auVar128,local_7a0);
      auVar122 = vfmadd231ps_avx512vl(auVar122,auVar128,local_7c0);
      auVar123 = vsubps_avx512vl(auVar132,auVar124);
      auVar133 = vsubps_avx512vl(auVar122,auVar131);
      auVar134 = vmulps_avx512vl(auVar131,auVar123);
      auVar135 = vmulps_avx512vl(auVar124,auVar133);
      auVar134 = vsubps_avx512vl(auVar134,auVar135);
      auVar135 = vmulps_avx512vl(_local_3e0,auVar126);
      auVar135 = vfmadd231ps_avx512vl(auVar135,auVar139,local_3c0);
      auVar119 = vfmadd231ps_fma(auVar135,auVar141,local_360);
      auVar135 = vfmadd231ps_avx512vl(ZEXT1632(auVar119),auVar140,local_340);
      auVar136 = vmulps_avx512vl(_local_3e0,auVar138);
      auVar136 = vfmadd231ps_avx512vl(auVar136,auVar130,local_3c0);
      auVar136 = vfmadd231ps_avx512vl(auVar136,auVar129,local_360);
      auVar175 = vfmadd231ps_fma(auVar136,auVar128,local_340);
      auVar136 = vmulps_avx512vl(auVar133,auVar133);
      auVar136 = vfmadd231ps_avx512vl(auVar136,auVar123,auVar123);
      auVar137 = vmaxps_avx512vl(auVar135,ZEXT1632(auVar175));
      auVar137 = vmulps_avx512vl(auVar137,auVar137);
      auVar136 = vmulps_avx512vl(auVar137,auVar136);
      auVar134 = vmulps_avx512vl(auVar134,auVar134);
      uVar187 = vcmpps_avx512vl(auVar134,auVar136,2);
      auVar119 = vblendps_avx(auVar188,auVar30,8);
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar118 = vandps_avx512vl(auVar119,auVar117);
      auVar119 = vblendps_avx(auVar193,*pauVar3,8);
      auVar119 = vandps_avx512vl(auVar119,auVar117);
      auVar118 = vmaxps_avx(auVar118,auVar119);
      auVar119 = vblendps_avx(auVar10,*pauVar4,8);
      auVar120 = vandps_avx512vl(auVar119,auVar117);
      auVar119 = vblendps_avx(auVar176,auVar35,8);
      auVar119 = vandps_avx512vl(auVar119,auVar117);
      auVar119 = vmaxps_avx(auVar120,auVar119);
      auVar119 = vmaxps_avx(auVar118,auVar119);
      auVar118 = vmovshdup_avx(auVar119);
      auVar118 = vmaxss_avx(auVar118,auVar119);
      auVar119 = vshufpd_avx(auVar119,auVar119,1);
      auVar119 = vmaxss_avx(auVar119,auVar118);
      auVar229._0_4_ = (float)iVar13;
      _auStack_73c = auVar188._4_12_;
      auVar229._4_4_ = auVar229._0_4_;
      auVar229._8_4_ = auVar229._0_4_;
      auVar229._12_4_ = auVar229._0_4_;
      auVar229._16_4_ = auVar229._0_4_;
      auVar229._20_4_ = auVar229._0_4_;
      auVar229._24_4_ = auVar229._0_4_;
      auVar229._28_4_ = auVar229._0_4_;
      uVar32 = vcmpps_avx512vl(auVar229,_DAT_02020f40,0xe);
      bVar114 = (byte)uVar187 & (byte)uVar32;
      auVar119 = vmulss_avx512f(auVar119,ZEXT416(0x35000000));
      auVar202._8_4_ = 2;
      auVar202._0_8_ = 0x200000002;
      auVar202._12_4_ = 2;
      auVar202._16_4_ = 2;
      auVar202._20_4_ = 2;
      auVar202._24_4_ = 2;
      auVar202._28_4_ = 2;
      local_400 = vpermps_avx512vl(auVar202,ZEXT1632(auVar188));
      local_420 = vpermps_avx512vl(auVar202,ZEXT1632(auVar193));
      local_440 = vpermps_avx512vl(auVar202,ZEXT1632(auVar10));
      local_460 = vpermps_avx2(auVar202,ZEXT1632(auVar176));
      uVar109 = *(uint *)(ray + k * 4 + 0xc0);
      auVar118 = local_560._0_16_;
      local_740 = auVar229._0_4_;
      if (bVar114 == 0) {
        auVar118 = vxorps_avx512vl(auVar118,auVar118);
        auVar239 = ZEXT1664(auVar118);
        auVar221 = ZEXT3264(auVar125);
        in_ZMM20 = ZEXT3264(local_840);
        auVar204 = ZEXT3264(auVar127);
        in_ZMM21 = ZEXT3264(local_860);
        auVar237 = ZEXT3264(local_7a0);
        auVar236 = ZEXT3264(local_7c0);
        auVar235 = ZEXT3264(local_8c0);
      }
      else {
        local_7e0._0_16_ = ZEXT416(uVar109);
        local_780._0_16_ = auVar119;
        auVar138 = vmulps_avx512vl(local_460,auVar138);
        auVar130 = vfmadd213ps_avx512vl(auVar130,local_440,auVar138);
        auVar129 = vfmadd213ps_avx512vl(auVar129,local_420,auVar130);
        auVar129 = vfmadd213ps_avx512vl(auVar128,local_400,auVar129);
        auVar126 = vmulps_avx512vl(local_460,auVar126);
        auVar139 = vfmadd213ps_avx512vl(auVar139,local_440,auVar126);
        auVar130 = vfmadd213ps_avx512vl(auVar141,local_420,auVar139);
        auVar141 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar34 + 0x1210);
        auVar139 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar34 + 0x1694);
        auVar126 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar34 + 0x1b18);
        auVar128 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar34 + 0x1f9c);
        auVar130 = vfmadd213ps_avx512vl(auVar140,local_400,auVar130);
        auVar140 = vmulps_avx512vl(local_880,auVar128);
        auVar138 = vmulps_avx512vl(local_8a0,auVar128);
        auVar128 = vmulps_avx512vl(local_460,auVar128);
        auVar140 = vfmadd231ps_avx512vl(auVar140,auVar126,local_380);
        auVar138 = vfmadd231ps_avx512vl(auVar138,auVar126,local_3a0);
        auVar126 = vfmadd231ps_avx512vl(auVar128,local_440,auVar126);
        auVar140 = vfmadd231ps_avx512vl(auVar140,auVar139,local_8c0);
        auVar128 = vfmadd231ps_avx512vl(auVar138,auVar139,local_560);
        auVar138 = vfmadd231ps_avx512vl(auVar126,local_420,auVar139);
        auVar134 = vfmadd231ps_avx512vl(auVar140,auVar141,local_7a0);
        auVar236 = ZEXT3264(local_7c0);
        auVar128 = vfmadd231ps_avx512vl(auVar128,auVar141,local_7c0);
        auVar140 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar34 + 0x1210);
        auVar139 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar34 + 0x1b18);
        auVar126 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar34 + 0x1f9c);
        auVar138 = vfmadd231ps_avx512vl(auVar138,local_400,auVar141);
        auVar141 = vmulps_avx512vl(local_880,auVar126);
        auVar136 = vmulps_avx512vl(local_8a0,auVar126);
        auVar126 = vmulps_avx512vl(local_460,auVar126);
        auVar238 = ZEXT1664(auVar119);
        auVar137 = vfmadd231ps_avx512vl(auVar141,auVar139,local_380);
        auVar136 = vfmadd231ps_avx512vl(auVar136,auVar139,local_3a0);
        auVar139 = vfmadd231ps_avx512vl(auVar126,local_440,auVar139);
        auVar141 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar34 + 0x1694);
        auVar126 = vfmadd231ps_avx512vl(auVar137,auVar141,local_8c0);
        auVar136 = vfmadd231ps_avx512vl(auVar136,auVar141,local_560);
        auVar141 = vfmadd231ps_avx512vl(auVar139,local_420,auVar141);
        auVar139 = vfmadd231ps_avx512vl(auVar126,auVar140,local_7a0);
        auVar126 = vfmadd231ps_avx512vl(auVar136,auVar140,local_7c0);
        auVar136 = vfmadd231ps_avx512vl(auVar141,local_400,auVar140);
        auVar233._8_4_ = 0x7fffffff;
        auVar233._0_8_ = 0x7fffffff7fffffff;
        auVar233._12_4_ = 0x7fffffff;
        auVar233._16_4_ = 0x7fffffff;
        auVar233._20_4_ = 0x7fffffff;
        auVar233._24_4_ = 0x7fffffff;
        auVar233._28_4_ = 0x7fffffff;
        auVar140 = vandps_avx(auVar134,auVar233);
        auVar141 = vandps_avx(auVar128,auVar233);
        auVar141 = vmaxps_avx(auVar140,auVar141);
        auVar140 = vandps_avx(auVar138,auVar233);
        auVar140 = vmaxps_avx(auVar141,auVar140);
        auVar138 = vbroadcastss_avx512vl(auVar119);
        uVar105 = vcmpps_avx512vl(auVar140,auVar138,1);
        bVar16 = (bool)((byte)uVar105 & 1);
        auVar142._0_4_ = (float)((uint)bVar16 * auVar123._0_4_ | (uint)!bVar16 * auVar134._0_4_);
        bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
        auVar142._4_4_ = (float)((uint)bVar16 * auVar123._4_4_ | (uint)!bVar16 * auVar134._4_4_);
        bVar16 = (bool)((byte)(uVar105 >> 2) & 1);
        auVar142._8_4_ = (float)((uint)bVar16 * auVar123._8_4_ | (uint)!bVar16 * auVar134._8_4_);
        bVar16 = (bool)((byte)(uVar105 >> 3) & 1);
        auVar142._12_4_ = (float)((uint)bVar16 * auVar123._12_4_ | (uint)!bVar16 * auVar134._12_4_);
        bVar16 = (bool)((byte)(uVar105 >> 4) & 1);
        auVar142._16_4_ = (float)((uint)bVar16 * auVar123._16_4_ | (uint)!bVar16 * auVar134._16_4_);
        bVar16 = (bool)((byte)(uVar105 >> 5) & 1);
        auVar142._20_4_ = (float)((uint)bVar16 * auVar123._20_4_ | (uint)!bVar16 * auVar134._20_4_);
        bVar16 = (bool)((byte)(uVar105 >> 6) & 1);
        auVar142._24_4_ = (float)((uint)bVar16 * auVar123._24_4_ | (uint)!bVar16 * auVar134._24_4_);
        bVar16 = SUB81(uVar105 >> 7,0);
        auVar142._28_4_ = (uint)bVar16 * auVar123._28_4_ | (uint)!bVar16 * auVar134._28_4_;
        bVar16 = (bool)((byte)uVar105 & 1);
        auVar143._0_4_ = (float)((uint)bVar16 * auVar133._0_4_ | (uint)!bVar16 * auVar128._0_4_);
        bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
        auVar143._4_4_ = (float)((uint)bVar16 * auVar133._4_4_ | (uint)!bVar16 * auVar128._4_4_);
        bVar16 = (bool)((byte)(uVar105 >> 2) & 1);
        auVar143._8_4_ = (float)((uint)bVar16 * auVar133._8_4_ | (uint)!bVar16 * auVar128._8_4_);
        bVar16 = (bool)((byte)(uVar105 >> 3) & 1);
        auVar143._12_4_ = (float)((uint)bVar16 * auVar133._12_4_ | (uint)!bVar16 * auVar128._12_4_);
        bVar16 = (bool)((byte)(uVar105 >> 4) & 1);
        auVar143._16_4_ = (float)((uint)bVar16 * auVar133._16_4_ | (uint)!bVar16 * auVar128._16_4_);
        bVar16 = (bool)((byte)(uVar105 >> 5) & 1);
        auVar143._20_4_ = (float)((uint)bVar16 * auVar133._20_4_ | (uint)!bVar16 * auVar128._20_4_);
        bVar16 = (bool)((byte)(uVar105 >> 6) & 1);
        auVar143._24_4_ = (float)((uint)bVar16 * auVar133._24_4_ | (uint)!bVar16 * auVar128._24_4_);
        bVar16 = SUB81(uVar105 >> 7,0);
        auVar143._28_4_ = (uint)bVar16 * auVar133._28_4_ | (uint)!bVar16 * auVar128._28_4_;
        auVar140 = vandps_avx(auVar233,auVar139);
        auVar141 = vandps_avx(auVar126,auVar233);
        auVar141 = vmaxps_avx(auVar140,auVar141);
        auVar140 = vandps_avx(auVar136,auVar233);
        auVar140 = vmaxps_avx(auVar141,auVar140);
        uVar105 = vcmpps_avx512vl(auVar140,auVar138,1);
        bVar16 = (bool)((byte)uVar105 & 1);
        auVar144._0_4_ = (float)((uint)bVar16 * auVar123._0_4_ | (uint)!bVar16 * auVar139._0_4_);
        bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
        auVar144._4_4_ = (float)((uint)bVar16 * auVar123._4_4_ | (uint)!bVar16 * auVar139._4_4_);
        bVar16 = (bool)((byte)(uVar105 >> 2) & 1);
        auVar144._8_4_ = (float)((uint)bVar16 * auVar123._8_4_ | (uint)!bVar16 * auVar139._8_4_);
        bVar16 = (bool)((byte)(uVar105 >> 3) & 1);
        auVar144._12_4_ = (float)((uint)bVar16 * auVar123._12_4_ | (uint)!bVar16 * auVar139._12_4_);
        bVar16 = (bool)((byte)(uVar105 >> 4) & 1);
        auVar144._16_4_ = (float)((uint)bVar16 * auVar123._16_4_ | (uint)!bVar16 * auVar139._16_4_);
        bVar16 = (bool)((byte)(uVar105 >> 5) & 1);
        auVar144._20_4_ = (float)((uint)bVar16 * auVar123._20_4_ | (uint)!bVar16 * auVar139._20_4_);
        bVar16 = (bool)((byte)(uVar105 >> 6) & 1);
        auVar144._24_4_ = (float)((uint)bVar16 * auVar123._24_4_ | (uint)!bVar16 * auVar139._24_4_);
        bVar16 = SUB81(uVar105 >> 7,0);
        auVar144._28_4_ = (uint)bVar16 * auVar123._28_4_ | (uint)!bVar16 * auVar139._28_4_;
        bVar16 = (bool)((byte)uVar105 & 1);
        auVar145._0_4_ = (float)((uint)bVar16 * auVar133._0_4_ | (uint)!bVar16 * auVar126._0_4_);
        bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
        auVar145._4_4_ = (float)((uint)bVar16 * auVar133._4_4_ | (uint)!bVar16 * auVar126._4_4_);
        bVar16 = (bool)((byte)(uVar105 >> 2) & 1);
        auVar145._8_4_ = (float)((uint)bVar16 * auVar133._8_4_ | (uint)!bVar16 * auVar126._8_4_);
        bVar16 = (bool)((byte)(uVar105 >> 3) & 1);
        auVar145._12_4_ = (float)((uint)bVar16 * auVar133._12_4_ | (uint)!bVar16 * auVar126._12_4_);
        bVar16 = (bool)((byte)(uVar105 >> 4) & 1);
        auVar145._16_4_ = (float)((uint)bVar16 * auVar133._16_4_ | (uint)!bVar16 * auVar126._16_4_);
        bVar16 = (bool)((byte)(uVar105 >> 5) & 1);
        auVar145._20_4_ = (float)((uint)bVar16 * auVar133._20_4_ | (uint)!bVar16 * auVar126._20_4_);
        bVar16 = (bool)((byte)(uVar105 >> 6) & 1);
        auVar145._24_4_ = (float)((uint)bVar16 * auVar133._24_4_ | (uint)!bVar16 * auVar126._24_4_);
        bVar16 = SUB81(uVar105 >> 7,0);
        auVar145._28_4_ = (uint)bVar16 * auVar133._28_4_ | (uint)!bVar16 * auVar126._28_4_;
        auVar121 = vxorps_avx512vl(auVar118,auVar118);
        auVar239 = ZEXT1664(auVar121);
        auVar140 = vfmadd213ps_avx512vl(auVar142,auVar142,ZEXT1632(auVar121));
        auVar118 = vfmadd231ps_fma(auVar140,auVar143,auVar143);
        auVar140 = vrsqrt14ps_avx512vl(ZEXT1632(auVar118));
        fVar206 = auVar140._0_4_;
        fVar173 = auVar140._4_4_;
        fVar212 = auVar140._8_4_;
        fVar213 = auVar140._12_4_;
        fVar192 = auVar140._16_4_;
        fVar205 = auVar140._20_4_;
        fVar115 = auVar140._24_4_;
        auVar47._4_4_ = fVar173 * fVar173 * fVar173 * auVar118._4_4_ * -0.5;
        auVar47._0_4_ = fVar206 * fVar206 * fVar206 * auVar118._0_4_ * -0.5;
        auVar47._8_4_ = fVar212 * fVar212 * fVar212 * auVar118._8_4_ * -0.5;
        auVar47._12_4_ = fVar213 * fVar213 * fVar213 * auVar118._12_4_ * -0.5;
        auVar47._16_4_ = fVar192 * fVar192 * fVar192 * -0.0;
        auVar47._20_4_ = fVar205 * fVar205 * fVar205 * -0.0;
        auVar47._24_4_ = fVar115 * fVar115 * fVar115 * -0.0;
        auVar47._28_4_ = 0;
        auVar141 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar139 = vfmadd231ps_avx512vl(auVar47,auVar141,auVar140);
        auVar48._4_4_ = auVar143._4_4_ * auVar139._4_4_;
        auVar48._0_4_ = auVar143._0_4_ * auVar139._0_4_;
        auVar48._8_4_ = auVar143._8_4_ * auVar139._8_4_;
        auVar48._12_4_ = auVar143._12_4_ * auVar139._12_4_;
        auVar48._16_4_ = auVar143._16_4_ * auVar139._16_4_;
        auVar48._20_4_ = auVar143._20_4_ * auVar139._20_4_;
        auVar48._24_4_ = auVar143._24_4_ * auVar139._24_4_;
        auVar48._28_4_ = auVar140._28_4_;
        auVar49._4_4_ = auVar139._4_4_ * -auVar142._4_4_;
        auVar49._0_4_ = auVar139._0_4_ * -auVar142._0_4_;
        auVar49._8_4_ = auVar139._8_4_ * -auVar142._8_4_;
        auVar49._12_4_ = auVar139._12_4_ * -auVar142._12_4_;
        auVar49._16_4_ = auVar139._16_4_ * -auVar142._16_4_;
        auVar49._20_4_ = auVar139._20_4_ * -auVar142._20_4_;
        auVar49._24_4_ = auVar139._24_4_ * -auVar142._24_4_;
        auVar49._28_4_ = auVar142._28_4_ ^ 0x80000000;
        auVar140 = vmulps_avx512vl(auVar139,ZEXT1632(auVar121));
        auVar123 = ZEXT1632(auVar121);
        auVar126 = vfmadd213ps_avx512vl(auVar144,auVar144,auVar123);
        auVar118 = vfmadd231ps_fma(auVar126,auVar145,auVar145);
        auVar126 = vrsqrt14ps_avx512vl(ZEXT1632(auVar118));
        fVar206 = auVar126._0_4_;
        fVar173 = auVar126._4_4_;
        fVar212 = auVar126._8_4_;
        fVar213 = auVar126._12_4_;
        fVar192 = auVar126._16_4_;
        fVar205 = auVar126._20_4_;
        fVar115 = auVar126._24_4_;
        auVar50._4_4_ = fVar173 * fVar173 * fVar173 * auVar118._4_4_ * -0.5;
        auVar50._0_4_ = fVar206 * fVar206 * fVar206 * auVar118._0_4_ * -0.5;
        auVar50._8_4_ = fVar212 * fVar212 * fVar212 * auVar118._8_4_ * -0.5;
        auVar50._12_4_ = fVar213 * fVar213 * fVar213 * auVar118._12_4_ * -0.5;
        auVar50._16_4_ = fVar192 * fVar192 * fVar192 * -0.0;
        auVar50._20_4_ = fVar205 * fVar205 * fVar205 * -0.0;
        auVar50._24_4_ = fVar115 * fVar115 * fVar115 * -0.0;
        auVar50._28_4_ = 0;
        auVar141 = vfmadd231ps_avx512vl(auVar50,auVar141,auVar126);
        auVar51._4_4_ = auVar145._4_4_ * auVar141._4_4_;
        auVar51._0_4_ = auVar145._0_4_ * auVar141._0_4_;
        auVar51._8_4_ = auVar145._8_4_ * auVar141._8_4_;
        auVar51._12_4_ = auVar145._12_4_ * auVar141._12_4_;
        auVar51._16_4_ = auVar145._16_4_ * auVar141._16_4_;
        auVar51._20_4_ = auVar145._20_4_ * auVar141._20_4_;
        auVar51._24_4_ = auVar145._24_4_ * auVar141._24_4_;
        auVar51._28_4_ = auVar126._28_4_;
        auVar52._4_4_ = -auVar144._4_4_ * auVar141._4_4_;
        auVar52._0_4_ = -auVar144._0_4_ * auVar141._0_4_;
        auVar52._8_4_ = -auVar144._8_4_ * auVar141._8_4_;
        auVar52._12_4_ = -auVar144._12_4_ * auVar141._12_4_;
        auVar52._16_4_ = -auVar144._16_4_ * auVar141._16_4_;
        auVar52._20_4_ = -auVar144._20_4_ * auVar141._20_4_;
        auVar52._24_4_ = -auVar144._24_4_ * auVar141._24_4_;
        auVar52._28_4_ = auVar139._28_4_;
        auVar141 = vmulps_avx512vl(auVar141,auVar123);
        auVar118 = vfmadd213ps_fma(auVar48,auVar135,auVar124);
        auVar176 = vfmadd213ps_fma(auVar49,auVar135,auVar131);
        auVar139 = vfmadd213ps_avx512vl(auVar140,auVar135,auVar130);
        auVar126 = vfmadd213ps_avx512vl(auVar51,ZEXT1632(auVar175),auVar132);
        auVar35 = vfnmadd213ps_fma(auVar48,auVar135,auVar124);
        auVar138 = ZEXT1632(auVar175);
        auVar117 = vfmadd213ps_fma(auVar52,auVar138,auVar122);
        auVar120 = vfnmadd213ps_fma(auVar49,auVar135,auVar131);
        auVar10 = vfmadd213ps_fma(auVar141,auVar138,auVar129);
        auVar128 = vfnmadd231ps_avx512vl(auVar130,auVar135,auVar140);
        auVar222 = vfnmadd213ps_fma(auVar51,auVar138,auVar132);
        auVar225 = vfnmadd213ps_fma(auVar52,auVar138,auVar122);
        auVar226 = vfnmadd231ps_fma(auVar129,ZEXT1632(auVar175),auVar141);
        auVar141 = vsubps_avx512vl(auVar126,ZEXT1632(auVar35));
        auVar140 = vsubps_avx(ZEXT1632(auVar117),ZEXT1632(auVar120));
        auVar129 = vsubps_avx512vl(ZEXT1632(auVar10),auVar128);
        auVar130 = vmulps_avx512vl(auVar140,auVar128);
        auVar188 = vfmsub231ps_fma(auVar130,ZEXT1632(auVar120),auVar129);
        auVar53._4_4_ = auVar35._4_4_ * auVar129._4_4_;
        auVar53._0_4_ = auVar35._0_4_ * auVar129._0_4_;
        auVar53._8_4_ = auVar35._8_4_ * auVar129._8_4_;
        auVar53._12_4_ = auVar35._12_4_ * auVar129._12_4_;
        auVar53._16_4_ = auVar129._16_4_ * 0.0;
        auVar53._20_4_ = auVar129._20_4_ * 0.0;
        auVar53._24_4_ = auVar129._24_4_ * 0.0;
        auVar53._28_4_ = auVar129._28_4_;
        auVar129 = vfmsub231ps_avx512vl(auVar53,auVar128,auVar141);
        auVar54._4_4_ = auVar120._4_4_ * auVar141._4_4_;
        auVar54._0_4_ = auVar120._0_4_ * auVar141._0_4_;
        auVar54._8_4_ = auVar120._8_4_ * auVar141._8_4_;
        auVar54._12_4_ = auVar120._12_4_ * auVar141._12_4_;
        auVar54._16_4_ = auVar141._16_4_ * 0.0;
        auVar54._20_4_ = auVar141._20_4_ * 0.0;
        auVar54._24_4_ = auVar141._24_4_ * 0.0;
        auVar54._28_4_ = auVar141._28_4_;
        auVar193 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar35),auVar140);
        auVar140 = vfmadd231ps_avx512vl(ZEXT1632(auVar193),auVar123,auVar129);
        auVar140 = vfmadd231ps_avx512vl(auVar140,auVar123,ZEXT1632(auVar188));
        auVar122 = ZEXT1632(auVar121);
        uVar105 = vcmpps_avx512vl(auVar140,auVar122,2);
        bVar104 = (byte)uVar105;
        fVar115 = (float)((uint)(bVar104 & 1) * auVar118._0_4_ |
                         (uint)!(bool)(bVar104 & 1) * auVar222._0_4_);
        bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
        fVar191 = (float)((uint)bVar16 * auVar118._4_4_ | (uint)!bVar16 * auVar222._4_4_);
        bVar16 = (bool)((byte)(uVar105 >> 2) & 1);
        fVar166 = (float)((uint)bVar16 * auVar118._8_4_ | (uint)!bVar16 * auVar222._8_4_);
        bVar16 = (bool)((byte)(uVar105 >> 3) & 1);
        fVar169 = (float)((uint)bVar16 * auVar118._12_4_ | (uint)!bVar16 * auVar222._12_4_);
        auVar130 = ZEXT1632(CONCAT412(fVar169,CONCAT48(fVar166,CONCAT44(fVar191,fVar115))));
        fVar116 = (float)((uint)(bVar104 & 1) * auVar176._0_4_ |
                         (uint)!(bool)(bVar104 & 1) * auVar225._0_4_);
        bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
        fVar165 = (float)((uint)bVar16 * auVar176._4_4_ | (uint)!bVar16 * auVar225._4_4_);
        bVar16 = (bool)((byte)(uVar105 >> 2) & 1);
        fVar167 = (float)((uint)bVar16 * auVar176._8_4_ | (uint)!bVar16 * auVar225._8_4_);
        bVar16 = (bool)((byte)(uVar105 >> 3) & 1);
        fVar170 = (float)((uint)bVar16 * auVar176._12_4_ | (uint)!bVar16 * auVar225._12_4_);
        auVar138 = ZEXT1632(CONCAT412(fVar170,CONCAT48(fVar167,CONCAT44(fVar165,fVar116))));
        auVar146._0_4_ =
             (float)((uint)(bVar104 & 1) * auVar139._0_4_ |
                    (uint)!(bool)(bVar104 & 1) * auVar226._0_4_);
        bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
        auVar146._4_4_ = (float)((uint)bVar16 * auVar139._4_4_ | (uint)!bVar16 * auVar226._4_4_);
        bVar16 = (bool)((byte)(uVar105 >> 2) & 1);
        auVar146._8_4_ = (float)((uint)bVar16 * auVar139._8_4_ | (uint)!bVar16 * auVar226._8_4_);
        bVar16 = (bool)((byte)(uVar105 >> 3) & 1);
        auVar146._12_4_ = (float)((uint)bVar16 * auVar139._12_4_ | (uint)!bVar16 * auVar226._12_4_);
        fVar206 = (float)((uint)((byte)(uVar105 >> 4) & 1) * auVar139._16_4_);
        auVar146._16_4_ = fVar206;
        fVar173 = (float)((uint)((byte)(uVar105 >> 5) & 1) * auVar139._20_4_);
        auVar146._20_4_ = fVar173;
        fVar212 = (float)((uint)((byte)(uVar105 >> 6) & 1) * auVar139._24_4_);
        auVar146._24_4_ = fVar212;
        iVar1 = (uint)(byte)(uVar105 >> 7) * auVar139._28_4_;
        auVar146._28_4_ = iVar1;
        auVar141 = vblendmps_avx512vl(ZEXT1632(auVar35),auVar126);
        auVar147._0_4_ =
             (uint)(bVar104 & 1) * auVar141._0_4_ | (uint)!(bool)(bVar104 & 1) * auVar188._0_4_;
        bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
        auVar147._4_4_ = (uint)bVar16 * auVar141._4_4_ | (uint)!bVar16 * auVar188._4_4_;
        bVar16 = (bool)((byte)(uVar105 >> 2) & 1);
        auVar147._8_4_ = (uint)bVar16 * auVar141._8_4_ | (uint)!bVar16 * auVar188._8_4_;
        bVar16 = (bool)((byte)(uVar105 >> 3) & 1);
        auVar147._12_4_ = (uint)bVar16 * auVar141._12_4_ | (uint)!bVar16 * auVar188._12_4_;
        auVar147._16_4_ = (uint)((byte)(uVar105 >> 4) & 1) * auVar141._16_4_;
        auVar147._20_4_ = (uint)((byte)(uVar105 >> 5) & 1) * auVar141._20_4_;
        auVar147._24_4_ = (uint)((byte)(uVar105 >> 6) & 1) * auVar141._24_4_;
        auVar147._28_4_ = (uint)(byte)(uVar105 >> 7) * auVar141._28_4_;
        auVar141 = vblendmps_avx512vl(ZEXT1632(auVar120),ZEXT1632(auVar117));
        auVar148._0_4_ =
             (float)((uint)(bVar104 & 1) * auVar141._0_4_ |
                    (uint)!(bool)(bVar104 & 1) * auVar176._0_4_);
        bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
        auVar148._4_4_ = (float)((uint)bVar16 * auVar141._4_4_ | (uint)!bVar16 * auVar176._4_4_);
        bVar16 = (bool)((byte)(uVar105 >> 2) & 1);
        auVar148._8_4_ = (float)((uint)bVar16 * auVar141._8_4_ | (uint)!bVar16 * auVar176._8_4_);
        bVar16 = (bool)((byte)(uVar105 >> 3) & 1);
        auVar148._12_4_ = (float)((uint)bVar16 * auVar141._12_4_ | (uint)!bVar16 * auVar176._12_4_);
        fVar213 = (float)((uint)((byte)(uVar105 >> 4) & 1) * auVar141._16_4_);
        auVar148._16_4_ = fVar213;
        fVar192 = (float)((uint)((byte)(uVar105 >> 5) & 1) * auVar141._20_4_);
        auVar148._20_4_ = fVar192;
        fVar205 = (float)((uint)((byte)(uVar105 >> 6) & 1) * auVar141._24_4_);
        auVar148._24_4_ = fVar205;
        auVar148._28_4_ = (uint)(byte)(uVar105 >> 7) * auVar141._28_4_;
        auVar141 = vblendmps_avx512vl(auVar128,ZEXT1632(auVar10));
        auVar149._0_4_ =
             (float)((uint)(bVar104 & 1) * auVar141._0_4_ |
                    (uint)!(bool)(bVar104 & 1) * auVar139._0_4_);
        bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
        auVar149._4_4_ = (float)((uint)bVar16 * auVar141._4_4_ | (uint)!bVar16 * auVar139._4_4_);
        bVar16 = (bool)((byte)(uVar105 >> 2) & 1);
        auVar149._8_4_ = (float)((uint)bVar16 * auVar141._8_4_ | (uint)!bVar16 * auVar139._8_4_);
        bVar16 = (bool)((byte)(uVar105 >> 3) & 1);
        auVar149._12_4_ = (float)((uint)bVar16 * auVar141._12_4_ | (uint)!bVar16 * auVar139._12_4_);
        bVar16 = (bool)((byte)(uVar105 >> 4) & 1);
        auVar149._16_4_ = (float)((uint)bVar16 * auVar141._16_4_ | (uint)!bVar16 * auVar139._16_4_);
        bVar16 = (bool)((byte)(uVar105 >> 5) & 1);
        auVar149._20_4_ = (float)((uint)bVar16 * auVar141._20_4_ | (uint)!bVar16 * auVar139._20_4_);
        bVar16 = (bool)((byte)(uVar105 >> 6) & 1);
        auVar149._24_4_ = (float)((uint)bVar16 * auVar141._24_4_ | (uint)!bVar16 * auVar139._24_4_);
        bVar16 = SUB81(uVar105 >> 7,0);
        auVar149._28_4_ = (uint)bVar16 * auVar141._28_4_ | (uint)!bVar16 * auVar139._28_4_;
        auVar150._0_4_ =
             (uint)(bVar104 & 1) * (int)auVar35._0_4_ | (uint)!(bool)(bVar104 & 1) * auVar126._0_4_;
        bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
        auVar150._4_4_ = (uint)bVar16 * (int)auVar35._4_4_ | (uint)!bVar16 * auVar126._4_4_;
        bVar16 = (bool)((byte)(uVar105 >> 2) & 1);
        auVar150._8_4_ = (uint)bVar16 * (int)auVar35._8_4_ | (uint)!bVar16 * auVar126._8_4_;
        bVar16 = (bool)((byte)(uVar105 >> 3) & 1);
        auVar150._12_4_ = (uint)bVar16 * (int)auVar35._12_4_ | (uint)!bVar16 * auVar126._12_4_;
        auVar150._16_4_ = (uint)!(bool)((byte)(uVar105 >> 4) & 1) * auVar126._16_4_;
        auVar150._20_4_ = (uint)!(bool)((byte)(uVar105 >> 5) & 1) * auVar126._20_4_;
        auVar150._24_4_ = (uint)!(bool)((byte)(uVar105 >> 6) & 1) * auVar126._24_4_;
        auVar150._28_4_ = (uint)!SUB81(uVar105 >> 7,0) * auVar126._28_4_;
        bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar105 >> 2) & 1);
        bVar19 = (bool)((byte)(uVar105 >> 3) & 1);
        auVar151._0_4_ =
             (uint)(bVar104 & 1) * auVar128._0_4_ | (uint)!(bool)(bVar104 & 1) * auVar10._0_4_;
        bVar17 = (bool)((byte)(uVar105 >> 1) & 1);
        auVar151._4_4_ = (uint)bVar17 * auVar128._4_4_ | (uint)!bVar17 * auVar10._4_4_;
        bVar17 = (bool)((byte)(uVar105 >> 2) & 1);
        auVar151._8_4_ = (uint)bVar17 * auVar128._8_4_ | (uint)!bVar17 * auVar10._8_4_;
        bVar17 = (bool)((byte)(uVar105 >> 3) & 1);
        auVar151._12_4_ = (uint)bVar17 * auVar128._12_4_ | (uint)!bVar17 * auVar10._12_4_;
        auVar151._16_4_ = (uint)((byte)(uVar105 >> 4) & 1) * auVar128._16_4_;
        auVar151._20_4_ = (uint)((byte)(uVar105 >> 5) & 1) * auVar128._20_4_;
        auVar151._24_4_ = (uint)((byte)(uVar105 >> 6) & 1) * auVar128._24_4_;
        iVar2 = (uint)(byte)(uVar105 >> 7) * auVar128._28_4_;
        auVar151._28_4_ = iVar2;
        auVar124 = vsubps_avx512vl(auVar150,auVar130);
        auVar141 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar120._12_4_ |
                                                 (uint)!bVar19 * auVar117._12_4_,
                                                 CONCAT48((uint)bVar18 * (int)auVar120._8_4_ |
                                                          (uint)!bVar18 * auVar117._8_4_,
                                                          CONCAT44((uint)bVar16 *
                                                                   (int)auVar120._4_4_ |
                                                                   (uint)!bVar16 * auVar117._4_4_,
                                                                   (uint)(bVar104 & 1) *
                                                                   (int)auVar120._0_4_ |
                                                                   (uint)!(bool)(bVar104 & 1) *
                                                                   auVar117._0_4_)))),auVar138);
        auVar139 = vsubps_avx(auVar151,auVar146);
        auVar126 = vsubps_avx(auVar130,auVar147);
        auVar128 = vsubps_avx(auVar138,auVar148);
        auVar129 = vsubps_avx(auVar146,auVar149);
        auVar55._4_4_ = auVar139._4_4_ * fVar191;
        auVar55._0_4_ = auVar139._0_4_ * fVar115;
        auVar55._8_4_ = auVar139._8_4_ * fVar166;
        auVar55._12_4_ = auVar139._12_4_ * fVar169;
        auVar55._16_4_ = auVar139._16_4_ * 0.0;
        auVar55._20_4_ = auVar139._20_4_ * 0.0;
        auVar55._24_4_ = auVar139._24_4_ * 0.0;
        auVar55._28_4_ = iVar2;
        auVar118 = vfmsub231ps_fma(auVar55,auVar146,auVar124);
        auVar56._4_4_ = fVar165 * auVar124._4_4_;
        auVar56._0_4_ = fVar116 * auVar124._0_4_;
        auVar56._8_4_ = fVar167 * auVar124._8_4_;
        auVar56._12_4_ = fVar170 * auVar124._12_4_;
        auVar56._16_4_ = auVar124._16_4_ * 0.0;
        auVar56._20_4_ = auVar124._20_4_ * 0.0;
        auVar56._24_4_ = auVar124._24_4_ * 0.0;
        auVar56._28_4_ = auVar140._28_4_;
        auVar176 = vfmsub231ps_fma(auVar56,auVar130,auVar141);
        auVar140 = vfmadd231ps_avx512vl(ZEXT1632(auVar176),auVar122,ZEXT1632(auVar118));
        auVar208._0_4_ = auVar141._0_4_ * auVar146._0_4_;
        auVar208._4_4_ = auVar141._4_4_ * auVar146._4_4_;
        auVar208._8_4_ = auVar141._8_4_ * auVar146._8_4_;
        auVar208._12_4_ = auVar141._12_4_ * auVar146._12_4_;
        auVar208._16_4_ = auVar141._16_4_ * fVar206;
        auVar208._20_4_ = auVar141._20_4_ * fVar173;
        auVar208._24_4_ = auVar141._24_4_ * fVar212;
        auVar208._28_4_ = 0;
        auVar118 = vfmsub231ps_fma(auVar208,auVar138,auVar139);
        auVar131 = vfmadd231ps_avx512vl(auVar140,auVar122,ZEXT1632(auVar118));
        auVar140 = vmulps_avx512vl(auVar129,auVar147);
        auVar140 = vfmsub231ps_avx512vl(auVar140,auVar126,auVar149);
        auVar57._4_4_ = auVar128._4_4_ * auVar149._4_4_;
        auVar57._0_4_ = auVar128._0_4_ * auVar149._0_4_;
        auVar57._8_4_ = auVar128._8_4_ * auVar149._8_4_;
        auVar57._12_4_ = auVar128._12_4_ * auVar149._12_4_;
        auVar57._16_4_ = auVar128._16_4_ * auVar149._16_4_;
        auVar57._20_4_ = auVar128._20_4_ * auVar149._20_4_;
        auVar57._24_4_ = auVar128._24_4_ * auVar149._24_4_;
        auVar57._28_4_ = auVar149._28_4_;
        auVar118 = vfmsub231ps_fma(auVar57,auVar148,auVar129);
        auVar209._0_4_ = auVar148._0_4_ * auVar126._0_4_;
        auVar209._4_4_ = auVar148._4_4_ * auVar126._4_4_;
        auVar209._8_4_ = auVar148._8_4_ * auVar126._8_4_;
        auVar209._12_4_ = auVar148._12_4_ * auVar126._12_4_;
        auVar209._16_4_ = fVar213 * auVar126._16_4_;
        auVar209._20_4_ = fVar192 * auVar126._20_4_;
        auVar209._24_4_ = fVar205 * auVar126._24_4_;
        auVar209._28_4_ = 0;
        auVar176 = vfmsub231ps_fma(auVar209,auVar128,auVar147);
        auVar140 = vfmadd231ps_avx512vl(ZEXT1632(auVar176),auVar122,auVar140);
        auVar132 = vfmadd231ps_avx512vl(auVar140,auVar122,ZEXT1632(auVar118));
        auVar140 = vmaxps_avx(auVar131,auVar132);
        uVar187 = vcmpps_avx512vl(auVar140,auVar122,2);
        bVar114 = bVar114 & (byte)uVar187;
        in_ZMM20 = ZEXT3264(local_840);
        in_ZMM21 = ZEXT3264(local_860);
        auVar237 = ZEXT3264(local_7a0);
        auVar235 = ZEXT3264(local_8c0);
        if (bVar114 == 0) {
          bVar114 = 0;
          auVar221 = ZEXT3264(auVar125);
          auVar204 = ZEXT3264(auVar127);
        }
        else {
          auVar58._4_4_ = auVar129._4_4_ * auVar141._4_4_;
          auVar58._0_4_ = auVar129._0_4_ * auVar141._0_4_;
          auVar58._8_4_ = auVar129._8_4_ * auVar141._8_4_;
          auVar58._12_4_ = auVar129._12_4_ * auVar141._12_4_;
          auVar58._16_4_ = auVar129._16_4_ * auVar141._16_4_;
          auVar58._20_4_ = auVar129._20_4_ * auVar141._20_4_;
          auVar58._24_4_ = auVar129._24_4_ * auVar141._24_4_;
          auVar58._28_4_ = auVar140._28_4_;
          auVar117 = vfmsub231ps_fma(auVar58,auVar128,auVar139);
          auVar59._4_4_ = auVar139._4_4_ * auVar126._4_4_;
          auVar59._0_4_ = auVar139._0_4_ * auVar126._0_4_;
          auVar59._8_4_ = auVar139._8_4_ * auVar126._8_4_;
          auVar59._12_4_ = auVar139._12_4_ * auVar126._12_4_;
          auVar59._16_4_ = auVar139._16_4_ * auVar126._16_4_;
          auVar59._20_4_ = auVar139._20_4_ * auVar126._20_4_;
          auVar59._24_4_ = auVar139._24_4_ * auVar126._24_4_;
          auVar59._28_4_ = auVar139._28_4_;
          auVar176 = vfmsub231ps_fma(auVar59,auVar124,auVar129);
          auVar60._4_4_ = auVar128._4_4_ * auVar124._4_4_;
          auVar60._0_4_ = auVar128._0_4_ * auVar124._0_4_;
          auVar60._8_4_ = auVar128._8_4_ * auVar124._8_4_;
          auVar60._12_4_ = auVar128._12_4_ * auVar124._12_4_;
          auVar60._16_4_ = auVar128._16_4_ * auVar124._16_4_;
          auVar60._20_4_ = auVar128._20_4_ * auVar124._20_4_;
          auVar60._24_4_ = auVar128._24_4_ * auVar124._24_4_;
          auVar60._28_4_ = auVar128._28_4_;
          auVar10 = vfmsub231ps_fma(auVar60,auVar126,auVar141);
          auVar118 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar176),ZEXT1632(auVar10));
          auVar140 = vfmadd231ps_avx512vl(ZEXT1632(auVar118),ZEXT1632(auVar117),auVar122);
          auVar141 = vrcp14ps_avx512vl(auVar140);
          auVar36._8_4_ = 0x3f800000;
          auVar36._0_8_ = &DAT_3f8000003f800000;
          auVar36._12_4_ = 0x3f800000;
          auVar36._16_4_ = 0x3f800000;
          auVar36._20_4_ = 0x3f800000;
          auVar36._24_4_ = 0x3f800000;
          auVar36._28_4_ = 0x3f800000;
          auVar139 = vfnmadd213ps_avx512vl(auVar141,auVar140,auVar36);
          auVar118 = vfmadd132ps_fma(auVar139,auVar141,auVar141);
          auVar61._4_4_ = auVar10._4_4_ * auVar146._4_4_;
          auVar61._0_4_ = auVar10._0_4_ * auVar146._0_4_;
          auVar61._8_4_ = auVar10._8_4_ * auVar146._8_4_;
          auVar61._12_4_ = auVar10._12_4_ * auVar146._12_4_;
          auVar61._16_4_ = fVar206 * 0.0;
          auVar61._20_4_ = fVar173 * 0.0;
          auVar61._24_4_ = fVar212 * 0.0;
          auVar61._28_4_ = iVar1;
          auVar176 = vfmadd231ps_fma(auVar61,auVar138,ZEXT1632(auVar176));
          auVar176 = vfmadd231ps_fma(ZEXT1632(auVar176),auVar130,ZEXT1632(auVar117));
          fVar206 = auVar118._0_4_;
          fVar173 = auVar118._4_4_;
          fVar212 = auVar118._8_4_;
          fVar213 = auVar118._12_4_;
          auVar141 = ZEXT1632(CONCAT412(auVar176._12_4_ * fVar213,
                                        CONCAT48(auVar176._8_4_ * fVar212,
                                                 CONCAT44(auVar176._4_4_ * fVar173,
                                                          auVar176._0_4_ * fVar206))));
          auVar224._4_4_ = uVar109;
          auVar224._0_4_ = uVar109;
          auVar224._8_4_ = uVar109;
          auVar224._12_4_ = uVar109;
          auVar224._16_4_ = uVar109;
          auVar224._20_4_ = uVar109;
          auVar224._24_4_ = uVar109;
          auVar224._28_4_ = uVar109;
          uVar187 = vcmpps_avx512vl(auVar224,auVar141,2);
          uVar174 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar37._4_4_ = uVar174;
          auVar37._0_4_ = uVar174;
          auVar37._8_4_ = uVar174;
          auVar37._12_4_ = uVar174;
          auVar37._16_4_ = uVar174;
          auVar37._20_4_ = uVar174;
          auVar37._24_4_ = uVar174;
          auVar37._28_4_ = uVar174;
          uVar32 = vcmpps_avx512vl(auVar141,auVar37,2);
          bVar114 = (byte)uVar187 & (byte)uVar32 & bVar114;
          if (bVar114 == 0) {
            bVar114 = 0;
            auVar221 = ZEXT3264(auVar125);
            auVar204 = ZEXT3264(auVar127);
          }
          else {
            uVar187 = vcmpps_avx512vl(auVar140,auVar122,4);
            if ((bVar114 & (byte)uVar187) == 0) {
              bVar114 = 0;
              auVar221 = ZEXT3264(auVar125);
              auVar204 = ZEXT3264(auVar127);
            }
            else {
              bVar114 = bVar114 & (byte)uVar187;
              fVar192 = auVar131._0_4_ * fVar206;
              fVar205 = auVar131._4_4_ * fVar173;
              auVar62._4_4_ = fVar205;
              auVar62._0_4_ = fVar192;
              fVar115 = auVar131._8_4_ * fVar212;
              auVar62._8_4_ = fVar115;
              fVar116 = auVar131._12_4_ * fVar213;
              auVar62._12_4_ = fVar116;
              fVar191 = auVar131._16_4_ * 0.0;
              auVar62._16_4_ = fVar191;
              fVar165 = auVar131._20_4_ * 0.0;
              auVar62._20_4_ = fVar165;
              fVar166 = auVar131._24_4_ * 0.0;
              auVar62._24_4_ = fVar166;
              auVar62._28_4_ = auVar131._28_4_;
              fVar206 = auVar132._0_4_ * fVar206;
              fVar173 = auVar132._4_4_ * fVar173;
              auVar63._4_4_ = fVar173;
              auVar63._0_4_ = fVar206;
              fVar212 = auVar132._8_4_ * fVar212;
              auVar63._8_4_ = fVar212;
              fVar213 = auVar132._12_4_ * fVar213;
              auVar63._12_4_ = fVar213;
              fVar167 = auVar132._16_4_ * 0.0;
              auVar63._16_4_ = fVar167;
              fVar169 = auVar132._20_4_ * 0.0;
              auVar63._20_4_ = fVar169;
              fVar170 = auVar132._24_4_ * 0.0;
              auVar63._24_4_ = fVar170;
              auVar63._28_4_ = auVar132._28_4_;
              auVar218._8_4_ = 0x3f800000;
              auVar218._0_8_ = &DAT_3f8000003f800000;
              auVar218._12_4_ = 0x3f800000;
              auVar218._16_4_ = 0x3f800000;
              auVar218._20_4_ = 0x3f800000;
              auVar218._24_4_ = 0x3f800000;
              auVar218._28_4_ = 0x3f800000;
              auVar127 = vsubps_avx(auVar218,auVar62);
              bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
              bVar17 = (bool)((byte)(uVar105 >> 2) & 1);
              bVar18 = (bool)((byte)(uVar105 >> 3) & 1);
              bVar19 = (bool)((byte)(uVar105 >> 4) & 1);
              bVar20 = (bool)((byte)(uVar105 >> 5) & 1);
              bVar21 = (bool)((byte)(uVar105 >> 6) & 1);
              bVar22 = SUB81(uVar105 >> 7,0);
              auVar221 = ZEXT3264(CONCAT428((uint)bVar22 * auVar131._28_4_ |
                                            (uint)!bVar22 * auVar127._28_4_,
                                            CONCAT424((uint)bVar21 * (int)fVar166 |
                                                      (uint)!bVar21 * auVar127._24_4_,
                                                      CONCAT420((uint)bVar20 * (int)fVar165 |
                                                                (uint)!bVar20 * auVar127._20_4_,
                                                                CONCAT416((uint)bVar19 *
                                                                          (int)fVar191 |
                                                                          (uint)!bVar19 *
                                                                          auVar127._16_4_,
                                                                          CONCAT412((uint)bVar18 *
                                                                                    (int)fVar116 |
                                                                                    (uint)!bVar18 *
                                                                                    auVar127._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar17 * (int)fVar115 |
                                                  (uint)!bVar17 * auVar127._8_4_,
                                                  CONCAT44((uint)bVar16 * (int)fVar205 |
                                                           (uint)!bVar16 * auVar127._4_4_,
                                                           (uint)(bVar104 & 1) * (int)fVar192 |
                                                           (uint)!(bool)(bVar104 & 1) *
                                                           auVar127._0_4_))))))));
              auVar127 = vsubps_avx(auVar218,auVar63);
              local_5a0._0_4_ =
                   (uint)(bVar104 & 1) * (int)fVar206 | (uint)!(bool)(bVar104 & 1) * auVar127._0_4_;
              bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
              local_5a0._4_4_ = (uint)bVar16 * (int)fVar173 | (uint)!bVar16 * auVar127._4_4_;
              bVar16 = (bool)((byte)(uVar105 >> 2) & 1);
              local_5a0._8_4_ = (uint)bVar16 * (int)fVar212 | (uint)!bVar16 * auVar127._8_4_;
              bVar16 = (bool)((byte)(uVar105 >> 3) & 1);
              local_5a0._12_4_ = (uint)bVar16 * (int)fVar213 | (uint)!bVar16 * auVar127._12_4_;
              bVar16 = (bool)((byte)(uVar105 >> 4) & 1);
              local_5a0._16_4_ = (uint)bVar16 * (int)fVar167 | (uint)!bVar16 * auVar127._16_4_;
              bVar16 = (bool)((byte)(uVar105 >> 5) & 1);
              local_5a0._20_4_ = (uint)bVar16 * (int)fVar169 | (uint)!bVar16 * auVar127._20_4_;
              bVar16 = (bool)((byte)(uVar105 >> 6) & 1);
              local_5a0._24_4_ = (uint)bVar16 * (int)fVar170 | (uint)!bVar16 * auVar127._24_4_;
              bVar16 = SUB81(uVar105 >> 7,0);
              local_5a0._28_4_ = (uint)bVar16 * auVar132._28_4_ | (uint)!bVar16 * auVar127._28_4_;
              auVar204 = ZEXT3264(auVar141);
            }
          }
        }
        auVar240 = ZEXT3264(local_8a0);
        auVar186 = ZEXT3264(local_880);
        if (bVar114 != 0) {
          auVar127 = vsubps_avx(ZEXT1632(auVar175),auVar135);
          auVar140 = auVar221._0_32_;
          auVar118 = vfmadd213ps_fma(auVar127,auVar140,auVar135);
          uVar174 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
          auVar38._4_4_ = uVar174;
          auVar38._0_4_ = uVar174;
          auVar38._8_4_ = uVar174;
          auVar38._12_4_ = uVar174;
          auVar38._16_4_ = uVar174;
          auVar38._20_4_ = uVar174;
          auVar38._24_4_ = uVar174;
          auVar38._28_4_ = uVar174;
          auVar127 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar118._12_4_ + auVar118._12_4_,
                                                        CONCAT48(auVar118._8_4_ + auVar118._8_4_,
                                                                 CONCAT44(auVar118._4_4_ +
                                                                          auVar118._4_4_,
                                                                          auVar118._0_4_ +
                                                                          auVar118._0_4_)))),auVar38
                                    );
          auVar125 = auVar204._0_32_;
          uVar187 = vcmpps_avx512vl(auVar125,auVar127,6);
          bVar114 = bVar114 & (byte)uVar187;
          if (bVar114 != 0) {
            auVar179._8_4_ = 0xbf800000;
            auVar179._0_8_ = 0xbf800000bf800000;
            auVar179._12_4_ = 0xbf800000;
            auVar179._16_4_ = 0xbf800000;
            auVar179._20_4_ = 0xbf800000;
            auVar179._24_4_ = 0xbf800000;
            auVar179._28_4_ = 0xbf800000;
            auVar39._8_4_ = 0x40000000;
            auVar39._0_8_ = 0x4000000040000000;
            auVar39._12_4_ = 0x40000000;
            auVar39._16_4_ = 0x40000000;
            auVar39._20_4_ = 0x40000000;
            auVar39._24_4_ = 0x40000000;
            auVar39._28_4_ = 0x40000000;
            local_700 = vfmadd132ps_avx512vl(local_5a0,auVar179,auVar39);
            local_5a0 = local_700;
            auVar127 = local_5a0;
            local_6c0 = 0;
            local_5a0 = auVar127;
            if ((pGVar110->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
              fVar206 = 1.0 / auVar229._0_4_;
              local_660[0] = fVar206 * (auVar221._0_4_ + 0.0);
              local_660[1] = fVar206 * (auVar221._4_4_ + 1.0);
              local_660[2] = fVar206 * (auVar221._8_4_ + 2.0);
              local_660[3] = fVar206 * (auVar221._12_4_ + 3.0);
              fStack_650 = fVar206 * (auVar221._16_4_ + 4.0);
              fStack_64c = fVar206 * (auVar221._20_4_ + 5.0);
              fStack_648 = fVar206 * (auVar221._24_4_ + 6.0);
              fStack_644 = auVar221._28_4_ + 7.0;
              local_5a0._0_8_ = local_700._0_8_;
              local_5a0._8_8_ = local_700._8_8_;
              local_5a0._16_8_ = local_700._16_8_;
              local_5a0._24_8_ = local_700._24_8_;
              local_640 = local_5a0._0_8_;
              uStack_638 = local_5a0._8_8_;
              uStack_630 = local_5a0._16_8_;
              uStack_628 = local_5a0._24_8_;
              local_620 = auVar125;
              auVar180._8_4_ = 0x7f800000;
              auVar180._0_8_ = 0x7f8000007f800000;
              auVar180._12_4_ = 0x7f800000;
              auVar180._16_4_ = 0x7f800000;
              auVar180._20_4_ = 0x7f800000;
              auVar180._24_4_ = 0x7f800000;
              auVar180._28_4_ = 0x7f800000;
              auVar127 = vblendmps_avx512vl(auVar180,auVar125);
              auVar152._0_4_ =
                   (uint)(bVar114 & 1) * auVar127._0_4_ | (uint)!(bool)(bVar114 & 1) * 0x7f800000;
              bVar16 = (bool)(bVar114 >> 1 & 1);
              auVar152._4_4_ = (uint)bVar16 * auVar127._4_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar114 >> 2 & 1);
              auVar152._8_4_ = (uint)bVar16 * auVar127._8_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar114 >> 3 & 1);
              auVar152._12_4_ = (uint)bVar16 * auVar127._12_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar114 >> 4 & 1);
              auVar152._16_4_ = (uint)bVar16 * auVar127._16_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar114 >> 5 & 1);
              auVar152._20_4_ = (uint)bVar16 * auVar127._20_4_ | (uint)!bVar16 * 0x7f800000;
              bVar16 = (bool)(bVar114 >> 6 & 1);
              auVar152._24_4_ = (uint)bVar16 * auVar127._24_4_ | (uint)!bVar16 * 0x7f800000;
              auVar152._28_4_ =
                   (uint)(bVar114 >> 7) * auVar127._28_4_ | (uint)!(bool)(bVar114 >> 7) * 0x7f800000
              ;
              auVar127 = vshufps_avx(auVar152,auVar152,0xb1);
              auVar127 = vminps_avx(auVar152,auVar127);
              auVar141 = vshufpd_avx(auVar127,auVar127,5);
              auVar127 = vminps_avx(auVar127,auVar141);
              auVar141 = vpermpd_avx2(auVar127,0x4e);
              auVar127 = vminps_avx(auVar127,auVar141);
              uVar187 = vcmpps_avx512vl(auVar152,auVar127,0);
              bVar103 = (byte)uVar187 & bVar114;
              bVar104 = bVar114;
              if (bVar103 != 0) {
                bVar104 = bVar103;
              }
              uVar107 = 0;
              for (uVar106 = (uint)bVar104; (uVar106 & 1) == 0; uVar106 = uVar106 >> 1 | 0x80000000)
              {
                uVar107 = uVar107 + 1;
              }
              uVar105 = (ulong)uVar107;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar110->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar206 = local_660[uVar105];
                uVar174 = *(undefined4 *)((long)&local_640 + uVar105 * 4);
                fVar173 = 1.0 - fVar206;
                auVar117 = vfnmadd231ss_fma(ZEXT416((uint)(fVar206 * (fVar173 + fVar173))),
                                            ZEXT416((uint)fVar173),ZEXT416((uint)fVar173));
                auVar175 = ZEXT416((uint)fVar206);
                auVar118 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar175,
                                           ZEXT416(0xc0a00000));
                auVar176 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * fVar206 * 3.0)),
                                           ZEXT416((uint)(fVar206 + fVar206)),auVar118);
                auVar118 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar175,
                                           ZEXT416(0x40000000));
                auVar118 = vfmadd231ss_fma(ZEXT416((uint)(fVar173 * fVar173 * -3.0)),
                                           ZEXT416((uint)(fVar173 + fVar173)),auVar118);
                auVar175 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * fVar206)),auVar175,
                                           ZEXT416((uint)(fVar173 * -2.0)));
                fVar173 = auVar117._0_4_ * 0.5;
                fVar212 = auVar176._0_4_ * 0.5;
                fVar213 = auVar118._0_4_ * 0.5;
                fVar192 = auVar175._0_4_ * 0.5;
                auVar194._0_4_ = fVar192 * local_8e0;
                auVar194._4_4_ = fVar192 * fStack_8dc;
                auVar194._8_4_ = fVar192 * fStack_8d8;
                auVar194._12_4_ = fVar192 * fStack_8d4;
                auVar214._4_4_ = fVar213;
                auVar214._0_4_ = fVar213;
                auVar214._8_4_ = fVar213;
                auVar214._12_4_ = fVar213;
                auVar118 = vfmadd132ps_fma(auVar214,auVar194,*pauVar4);
                auVar195._4_4_ = fVar212;
                auVar195._0_4_ = fVar212;
                auVar195._8_4_ = fVar212;
                auVar195._12_4_ = fVar212;
                auVar118 = vfmadd132ps_fma(auVar195,auVar118,*pauVar3);
                auVar221 = ZEXT3264(auVar140);
                auVar189._4_4_ = fVar173;
                auVar189._0_4_ = fVar173;
                auVar189._8_4_ = fVar173;
                auVar189._12_4_ = fVar173;
                auVar118 = vfmadd213ps_fma(auVar189,auVar30,auVar118);
                *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_620 + uVar105 * 4);
                auVar204 = ZEXT3264(auVar125);
                *(int *)(ray + k * 4 + 0x300) = auVar118._0_4_;
                uVar14 = vextractps_avx(auVar118,1);
                *(undefined4 *)(ray + k * 4 + 0x340) = uVar14;
                uVar14 = vextractps_avx(auVar118,2);
                *(undefined4 *)(ray + k * 4 + 0x380) = uVar14;
                *(float *)(ray + k * 4 + 0x3c0) = fVar206;
                *(undefined4 *)(ray + k * 4 + 0x400) = uVar174;
                *(uint *)(ray + k * 4 + 0x440) = uVar12;
                *(uint *)(ray + k * 4 + 0x480) = uVar111;
                *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
              }
              else {
                auVar204 = vpbroadcastd_avx512f();
                local_500 = vmovdqa64_avx512f(auVar204);
                auVar204 = vpbroadcastd_avx512f();
                local_540 = vmovdqa64_avx512f(auVar204);
                local_800 = (undefined4)uVar31;
                uStack_7fc = (undefined4)((ulong)uVar31 >> 0x20);
                local_820 = local_8e0;
                fStack_81c = fStack_8dc;
                fStack_818 = fStack_8d8;
                fStack_814 = fStack_8d4;
                local_810 = uVar96;
                uStack_808 = uVar97;
                uStack_7f8 = uVar33;
                local_720 = auVar140;
                local_6e0 = auVar125;
                local_6bc = iVar13;
                local_6b0 = auVar30;
                local_6a0 = uVar31;
                uStack_698 = uVar33;
                local_690 = uVar96;
                uStack_688 = uVar97;
                local_670 = bVar114;
                do {
                  auVar117 = auVar239._0_16_;
                  local_4c0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x200);
                  local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_660[uVar105]));
                  local_1c0 = vbroadcastss_avx512f
                                        (ZEXT416(*(uint *)((long)&local_640 + uVar105 * 4)));
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_620 + uVar105 * 4);
                  local_910.context = context->user;
                  fVar173 = local_200._0_4_;
                  fVar206 = 1.0 - fVar173;
                  auVar175 = vfnmadd231ss_fma(ZEXT416((uint)(fVar173 * (fVar206 + fVar206))),
                                              ZEXT416((uint)fVar206),ZEXT416((uint)fVar206));
                  auVar176 = local_200._0_16_;
                  auVar119 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar176,
                                             ZEXT416(0xc0a00000));
                  auVar118 = vfmadd231ss_fma(ZEXT416((uint)(fVar173 * fVar173 * 3.0)),
                                             ZEXT416((uint)(fVar173 + fVar173)),auVar119);
                  auVar119 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar176,
                                             ZEXT416(0x40000000));
                  auVar119 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * fVar206 * -3.0)),
                                             ZEXT416((uint)(fVar206 + fVar206)),auVar119);
                  auVar176 = vfmadd231ss_fma(ZEXT416((uint)(fVar173 * fVar173)),auVar176,
                                             ZEXT416((uint)(fVar206 * -2.0)));
                  fVar206 = auVar175._0_4_ * 0.5;
                  fVar173 = auVar118._0_4_ * 0.5;
                  fVar212 = auVar119._0_4_ * 0.5;
                  fVar213 = auVar176._0_4_ * 0.5;
                  auVar200._0_4_ = fVar213 * local_820;
                  auVar200._4_4_ = fVar213 * fStack_81c;
                  auVar200._8_4_ = fVar213 * fStack_818;
                  auVar200._12_4_ = fVar213 * fStack_814;
                  auVar217._4_4_ = fVar212;
                  auVar217._0_4_ = fVar212;
                  auVar217._8_4_ = fVar212;
                  auVar217._12_4_ = fVar212;
                  auVar100._8_8_ = uStack_808;
                  auVar100._0_8_ = local_810;
                  auVar119 = vfmadd132ps_fma(auVar217,auVar200,auVar100);
                  auVar201._4_4_ = fVar173;
                  auVar201._0_4_ = fVar173;
                  auVar201._8_4_ = fVar173;
                  auVar201._12_4_ = fVar173;
                  auVar101._4_4_ = uStack_7fc;
                  auVar101._0_4_ = local_800;
                  auVar101._8_8_ = uStack_7f8;
                  auVar119 = vfmadd132ps_fma(auVar201,auVar119,auVar101);
                  auVar178._4_4_ = fVar206;
                  auVar178._0_4_ = fVar206;
                  auVar178._8_4_ = fVar206;
                  auVar178._12_4_ = fVar206;
                  auVar119 = vfmadd213ps_fma(auVar178,auVar30,auVar119);
                  auVar204 = vbroadcastss_avx512f(auVar119);
                  auVar221 = vbroadcastss_avx512f(ZEXT416(1));
                  local_280 = vpermps_avx512f(auVar221,ZEXT1664(auVar119));
                  auVar221 = vbroadcastss_avx512f(ZEXT416(2));
                  local_240 = vpermps_avx512f(auVar221,ZEXT1664(auVar119));
                  local_2c0[0] = (RTCHitN)auVar204[0];
                  local_2c0[1] = (RTCHitN)auVar204[1];
                  local_2c0[2] = (RTCHitN)auVar204[2];
                  local_2c0[3] = (RTCHitN)auVar204[3];
                  local_2c0[4] = (RTCHitN)auVar204[4];
                  local_2c0[5] = (RTCHitN)auVar204[5];
                  local_2c0[6] = (RTCHitN)auVar204[6];
                  local_2c0[7] = (RTCHitN)auVar204[7];
                  local_2c0[8] = (RTCHitN)auVar204[8];
                  local_2c0[9] = (RTCHitN)auVar204[9];
                  local_2c0[10] = (RTCHitN)auVar204[10];
                  local_2c0[0xb] = (RTCHitN)auVar204[0xb];
                  local_2c0[0xc] = (RTCHitN)auVar204[0xc];
                  local_2c0[0xd] = (RTCHitN)auVar204[0xd];
                  local_2c0[0xe] = (RTCHitN)auVar204[0xe];
                  local_2c0[0xf] = (RTCHitN)auVar204[0xf];
                  local_2c0[0x10] = (RTCHitN)auVar204[0x10];
                  local_2c0[0x11] = (RTCHitN)auVar204[0x11];
                  local_2c0[0x12] = (RTCHitN)auVar204[0x12];
                  local_2c0[0x13] = (RTCHitN)auVar204[0x13];
                  local_2c0[0x14] = (RTCHitN)auVar204[0x14];
                  local_2c0[0x15] = (RTCHitN)auVar204[0x15];
                  local_2c0[0x16] = (RTCHitN)auVar204[0x16];
                  local_2c0[0x17] = (RTCHitN)auVar204[0x17];
                  local_2c0[0x18] = (RTCHitN)auVar204[0x18];
                  local_2c0[0x19] = (RTCHitN)auVar204[0x19];
                  local_2c0[0x1a] = (RTCHitN)auVar204[0x1a];
                  local_2c0[0x1b] = (RTCHitN)auVar204[0x1b];
                  local_2c0[0x1c] = (RTCHitN)auVar204[0x1c];
                  local_2c0[0x1d] = (RTCHitN)auVar204[0x1d];
                  local_2c0[0x1e] = (RTCHitN)auVar204[0x1e];
                  local_2c0[0x1f] = (RTCHitN)auVar204[0x1f];
                  local_2c0[0x20] = (RTCHitN)auVar204[0x20];
                  local_2c0[0x21] = (RTCHitN)auVar204[0x21];
                  local_2c0[0x22] = (RTCHitN)auVar204[0x22];
                  local_2c0[0x23] = (RTCHitN)auVar204[0x23];
                  local_2c0[0x24] = (RTCHitN)auVar204[0x24];
                  local_2c0[0x25] = (RTCHitN)auVar204[0x25];
                  local_2c0[0x26] = (RTCHitN)auVar204[0x26];
                  local_2c0[0x27] = (RTCHitN)auVar204[0x27];
                  local_2c0[0x28] = (RTCHitN)auVar204[0x28];
                  local_2c0[0x29] = (RTCHitN)auVar204[0x29];
                  local_2c0[0x2a] = (RTCHitN)auVar204[0x2a];
                  local_2c0[0x2b] = (RTCHitN)auVar204[0x2b];
                  local_2c0[0x2c] = (RTCHitN)auVar204[0x2c];
                  local_2c0[0x2d] = (RTCHitN)auVar204[0x2d];
                  local_2c0[0x2e] = (RTCHitN)auVar204[0x2e];
                  local_2c0[0x2f] = (RTCHitN)auVar204[0x2f];
                  local_2c0[0x30] = (RTCHitN)auVar204[0x30];
                  local_2c0[0x31] = (RTCHitN)auVar204[0x31];
                  local_2c0[0x32] = (RTCHitN)auVar204[0x32];
                  local_2c0[0x33] = (RTCHitN)auVar204[0x33];
                  local_2c0[0x34] = (RTCHitN)auVar204[0x34];
                  local_2c0[0x35] = (RTCHitN)auVar204[0x35];
                  local_2c0[0x36] = (RTCHitN)auVar204[0x36];
                  local_2c0[0x37] = (RTCHitN)auVar204[0x37];
                  local_2c0[0x38] = (RTCHitN)auVar204[0x38];
                  local_2c0[0x39] = (RTCHitN)auVar204[0x39];
                  local_2c0[0x3a] = (RTCHitN)auVar204[0x3a];
                  local_2c0[0x3b] = (RTCHitN)auVar204[0x3b];
                  local_2c0[0x3c] = (RTCHitN)auVar204[0x3c];
                  local_2c0[0x3d] = (RTCHitN)auVar204[0x3d];
                  local_2c0[0x3e] = (RTCHitN)auVar204[0x3e];
                  local_2c0[0x3f] = (RTCHitN)auVar204[0x3f];
                  local_180 = local_540._0_8_;
                  uStack_178 = local_540._8_8_;
                  uStack_170 = local_540._16_8_;
                  uStack_168 = local_540._24_8_;
                  uStack_160 = local_540._32_8_;
                  uStack_158 = local_540._40_8_;
                  uStack_150 = local_540._48_8_;
                  uStack_148 = local_540._56_8_;
                  auVar204 = vmovdqa64_avx512f(local_500);
                  local_140 = vmovdqa64_avx512f(auVar204);
                  auVar127 = vpcmpeqd_avx2(auVar204._0_32_,auVar204._0_32_);
                  local_8c8[3] = auVar127;
                  local_8c8[2] = auVar127;
                  local_8c8[1] = auVar127;
                  *local_8c8 = auVar127;
                  local_100 = vbroadcastss_avx512f(ZEXT416((local_910.context)->instID[0]));
                  local_c0 = vbroadcastss_avx512f(ZEXT416((local_910.context)->instPrimID[0]));
                  local_600 = local_300;
                  local_910.valid = (int *)local_600;
                  local_910.geometryUserPtr = pGVar110->userPtr;
                  local_910.hit = local_2c0;
                  local_910.N = 0x10;
                  local_760 = (uint)uVar105;
                  uStack_75c = (uint)(uVar105 >> 0x20);
                  local_910.ray = (RTCRayN *)ray;
                  if (pGVar110->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar110->intersectionFilterN)(&local_910);
                    uVar105 = CONCAT44(uStack_75c,local_760);
                    auVar238 = ZEXT1664(local_780._0_16_);
                    auVar240 = ZEXT3264(local_8a0);
                    auVar186 = ZEXT3264(local_880);
                    auVar235 = ZEXT3264(local_8c0);
                    auVar236 = ZEXT3264(local_7c0);
                    auVar237 = ZEXT3264(local_7a0);
                    in_ZMM21 = ZEXT3264(local_860);
                    in_ZMM20 = ZEXT3264(local_840);
                    auVar119 = vxorps_avx512vl(auVar117,auVar117);
                    auVar239 = ZEXT1664(auVar119);
                    uVar109 = local_7e0._0_4_;
                  }
                  auVar119 = auVar239._0_16_;
                  auVar204 = vmovdqa64_avx512f(local_600);
                  uVar187 = vptestmd_avx512f(auVar204,auVar204);
                  if ((short)uVar187 == 0) {
LAB_01dc9de9:
                    *(undefined4 *)(ray + k * 4 + 0x200) = local_4c0._0_4_;
                  }
                  else {
                    p_Var15 = context->args->filter;
                    if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar110->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var15)(&local_910);
                      uVar105 = CONCAT44(uStack_75c,local_760);
                      auVar238 = ZEXT1664(local_780._0_16_);
                      auVar240 = ZEXT3264(local_8a0);
                      auVar186 = ZEXT3264(local_880);
                      auVar235 = ZEXT3264(local_8c0);
                      auVar236 = ZEXT3264(local_7c0);
                      auVar237 = ZEXT3264(local_7a0);
                      in_ZMM21 = ZEXT3264(local_860);
                      in_ZMM20 = ZEXT3264(local_840);
                      auVar119 = vxorps_avx512vl(auVar119,auVar119);
                      auVar239 = ZEXT1664(auVar119);
                      uVar109 = local_7e0._0_4_;
                    }
                    auVar204 = vmovdqa64_avx512f(local_600);
                    uVar108 = vptestmd_avx512f(auVar204,auVar204);
                    if ((short)uVar108 == 0) goto LAB_01dc9de9;
                    iVar1 = *(int *)(local_910.hit + 4);
                    iVar2 = *(int *)(local_910.hit + 8);
                    iVar83 = *(int *)(local_910.hit + 0xc);
                    iVar84 = *(int *)(local_910.hit + 0x10);
                    iVar85 = *(int *)(local_910.hit + 0x14);
                    iVar86 = *(int *)(local_910.hit + 0x18);
                    iVar87 = *(int *)(local_910.hit + 0x1c);
                    iVar88 = *(int *)(local_910.hit + 0x20);
                    iVar89 = *(int *)(local_910.hit + 0x24);
                    iVar90 = *(int *)(local_910.hit + 0x28);
                    iVar91 = *(int *)(local_910.hit + 0x2c);
                    iVar92 = *(int *)(local_910.hit + 0x30);
                    iVar93 = *(int *)(local_910.hit + 0x34);
                    iVar94 = *(int *)(local_910.hit + 0x38);
                    iVar95 = *(int *)(local_910.hit + 0x3c);
                    bVar104 = (byte)uVar108;
                    bVar16 = (bool)((byte)(uVar108 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar108 >> 2) & 1);
                    bVar18 = (bool)((byte)(uVar108 >> 3) & 1);
                    bVar19 = (bool)((byte)(uVar108 >> 4) & 1);
                    bVar20 = (bool)((byte)(uVar108 >> 5) & 1);
                    bVar21 = (bool)((byte)(uVar108 >> 6) & 1);
                    bVar22 = (bool)((byte)(uVar108 >> 7) & 1);
                    bVar103 = (byte)(uVar108 >> 8);
                    bVar23 = (bool)((byte)(uVar108 >> 9) & 1);
                    bVar24 = (bool)((byte)(uVar108 >> 10) & 1);
                    bVar25 = (bool)((byte)(uVar108 >> 0xb) & 1);
                    bVar26 = (bool)((byte)(uVar108 >> 0xc) & 1);
                    bVar27 = (bool)((byte)(uVar108 >> 0xd) & 1);
                    bVar28 = (bool)((byte)(uVar108 >> 0xe) & 1);
                    bVar29 = SUB81(uVar108 >> 0xf,0);
                    *(uint *)(local_910.ray + 0x300) =
                         (uint)(bVar104 & 1) * *(int *)local_910.hit |
                         (uint)!(bool)(bVar104 & 1) * *(int *)(local_910.ray + 0x300);
                    *(uint *)(local_910.ray + 0x304) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_910.ray + 0x304);
                    *(uint *)(local_910.ray + 0x308) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_910.ray + 0x308);
                    *(uint *)(local_910.ray + 0x30c) =
                         (uint)bVar18 * iVar83 | (uint)!bVar18 * *(int *)(local_910.ray + 0x30c);
                    *(uint *)(local_910.ray + 0x310) =
                         (uint)bVar19 * iVar84 | (uint)!bVar19 * *(int *)(local_910.ray + 0x310);
                    *(uint *)(local_910.ray + 0x314) =
                         (uint)bVar20 * iVar85 | (uint)!bVar20 * *(int *)(local_910.ray + 0x314);
                    *(uint *)(local_910.ray + 0x318) =
                         (uint)bVar21 * iVar86 | (uint)!bVar21 * *(int *)(local_910.ray + 0x318);
                    *(uint *)(local_910.ray + 0x31c) =
                         (uint)bVar22 * iVar87 | (uint)!bVar22 * *(int *)(local_910.ray + 0x31c);
                    *(uint *)(local_910.ray + 800) =
                         (uint)(bVar103 & 1) * iVar88 |
                         (uint)!(bool)(bVar103 & 1) * *(int *)(local_910.ray + 800);
                    *(uint *)(local_910.ray + 0x324) =
                         (uint)bVar23 * iVar89 | (uint)!bVar23 * *(int *)(local_910.ray + 0x324);
                    *(uint *)(local_910.ray + 0x328) =
                         (uint)bVar24 * iVar90 | (uint)!bVar24 * *(int *)(local_910.ray + 0x328);
                    *(uint *)(local_910.ray + 0x32c) =
                         (uint)bVar25 * iVar91 | (uint)!bVar25 * *(int *)(local_910.ray + 0x32c);
                    *(uint *)(local_910.ray + 0x330) =
                         (uint)bVar26 * iVar92 | (uint)!bVar26 * *(int *)(local_910.ray + 0x330);
                    *(uint *)(local_910.ray + 0x334) =
                         (uint)bVar27 * iVar93 | (uint)!bVar27 * *(int *)(local_910.ray + 0x334);
                    *(uint *)(local_910.ray + 0x338) =
                         (uint)bVar28 * iVar94 | (uint)!bVar28 * *(int *)(local_910.ray + 0x338);
                    *(uint *)(local_910.ray + 0x33c) =
                         (uint)bVar29 * iVar95 | (uint)!bVar29 * *(int *)(local_910.ray + 0x33c);
                    iVar1 = *(int *)(local_910.hit + 0x44);
                    iVar2 = *(int *)(local_910.hit + 0x48);
                    iVar83 = *(int *)(local_910.hit + 0x4c);
                    iVar84 = *(int *)(local_910.hit + 0x50);
                    iVar85 = *(int *)(local_910.hit + 0x54);
                    iVar86 = *(int *)(local_910.hit + 0x58);
                    iVar87 = *(int *)(local_910.hit + 0x5c);
                    iVar88 = *(int *)(local_910.hit + 0x60);
                    iVar89 = *(int *)(local_910.hit + 100);
                    iVar90 = *(int *)(local_910.hit + 0x68);
                    iVar91 = *(int *)(local_910.hit + 0x6c);
                    iVar92 = *(int *)(local_910.hit + 0x70);
                    iVar93 = *(int *)(local_910.hit + 0x74);
                    iVar94 = *(int *)(local_910.hit + 0x78);
                    iVar95 = *(int *)(local_910.hit + 0x7c);
                    bVar16 = (bool)((byte)(uVar108 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar108 >> 2) & 1);
                    bVar18 = (bool)((byte)(uVar108 >> 3) & 1);
                    bVar19 = (bool)((byte)(uVar108 >> 4) & 1);
                    bVar20 = (bool)((byte)(uVar108 >> 5) & 1);
                    bVar21 = (bool)((byte)(uVar108 >> 6) & 1);
                    bVar22 = (bool)((byte)(uVar108 >> 7) & 1);
                    bVar23 = (bool)((byte)(uVar108 >> 9) & 1);
                    bVar24 = (bool)((byte)(uVar108 >> 10) & 1);
                    bVar25 = (bool)((byte)(uVar108 >> 0xb) & 1);
                    bVar26 = (bool)((byte)(uVar108 >> 0xc) & 1);
                    bVar27 = (bool)((byte)(uVar108 >> 0xd) & 1);
                    bVar28 = (bool)((byte)(uVar108 >> 0xe) & 1);
                    bVar29 = SUB81(uVar108 >> 0xf,0);
                    *(uint *)(local_910.ray + 0x340) =
                         (uint)(bVar104 & 1) * *(int *)(local_910.hit + 0x40) |
                         (uint)!(bool)(bVar104 & 1) * *(int *)(local_910.ray + 0x340);
                    *(uint *)(local_910.ray + 0x344) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_910.ray + 0x344);
                    *(uint *)(local_910.ray + 0x348) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_910.ray + 0x348);
                    *(uint *)(local_910.ray + 0x34c) =
                         (uint)bVar18 * iVar83 | (uint)!bVar18 * *(int *)(local_910.ray + 0x34c);
                    *(uint *)(local_910.ray + 0x350) =
                         (uint)bVar19 * iVar84 | (uint)!bVar19 * *(int *)(local_910.ray + 0x350);
                    *(uint *)(local_910.ray + 0x354) =
                         (uint)bVar20 * iVar85 | (uint)!bVar20 * *(int *)(local_910.ray + 0x354);
                    *(uint *)(local_910.ray + 0x358) =
                         (uint)bVar21 * iVar86 | (uint)!bVar21 * *(int *)(local_910.ray + 0x358);
                    *(uint *)(local_910.ray + 0x35c) =
                         (uint)bVar22 * iVar87 | (uint)!bVar22 * *(int *)(local_910.ray + 0x35c);
                    *(uint *)(local_910.ray + 0x360) =
                         (uint)(bVar103 & 1) * iVar88 |
                         (uint)!(bool)(bVar103 & 1) * *(int *)(local_910.ray + 0x360);
                    *(uint *)(local_910.ray + 0x364) =
                         (uint)bVar23 * iVar89 | (uint)!bVar23 * *(int *)(local_910.ray + 0x364);
                    *(uint *)(local_910.ray + 0x368) =
                         (uint)bVar24 * iVar90 | (uint)!bVar24 * *(int *)(local_910.ray + 0x368);
                    *(uint *)(local_910.ray + 0x36c) =
                         (uint)bVar25 * iVar91 | (uint)!bVar25 * *(int *)(local_910.ray + 0x36c);
                    *(uint *)(local_910.ray + 0x370) =
                         (uint)bVar26 * iVar92 | (uint)!bVar26 * *(int *)(local_910.ray + 0x370);
                    *(uint *)(local_910.ray + 0x374) =
                         (uint)bVar27 * iVar93 | (uint)!bVar27 * *(int *)(local_910.ray + 0x374);
                    *(uint *)(local_910.ray + 0x378) =
                         (uint)bVar28 * iVar94 | (uint)!bVar28 * *(int *)(local_910.ray + 0x378);
                    *(uint *)(local_910.ray + 0x37c) =
                         (uint)bVar29 * iVar95 | (uint)!bVar29 * *(int *)(local_910.ray + 0x37c);
                    iVar1 = *(int *)(local_910.hit + 0x84);
                    iVar2 = *(int *)(local_910.hit + 0x88);
                    iVar83 = *(int *)(local_910.hit + 0x8c);
                    iVar84 = *(int *)(local_910.hit + 0x90);
                    iVar85 = *(int *)(local_910.hit + 0x94);
                    iVar86 = *(int *)(local_910.hit + 0x98);
                    iVar87 = *(int *)(local_910.hit + 0x9c);
                    iVar88 = *(int *)(local_910.hit + 0xa0);
                    iVar89 = *(int *)(local_910.hit + 0xa4);
                    iVar90 = *(int *)(local_910.hit + 0xa8);
                    iVar91 = *(int *)(local_910.hit + 0xac);
                    iVar92 = *(int *)(local_910.hit + 0xb0);
                    iVar93 = *(int *)(local_910.hit + 0xb4);
                    iVar94 = *(int *)(local_910.hit + 0xb8);
                    iVar95 = *(int *)(local_910.hit + 0xbc);
                    bVar16 = (bool)((byte)(uVar108 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar108 >> 2) & 1);
                    bVar18 = (bool)((byte)(uVar108 >> 3) & 1);
                    bVar19 = (bool)((byte)(uVar108 >> 4) & 1);
                    bVar20 = (bool)((byte)(uVar108 >> 5) & 1);
                    bVar21 = (bool)((byte)(uVar108 >> 6) & 1);
                    bVar22 = (bool)((byte)(uVar108 >> 7) & 1);
                    bVar23 = (bool)((byte)(uVar108 >> 9) & 1);
                    bVar24 = (bool)((byte)(uVar108 >> 10) & 1);
                    bVar25 = (bool)((byte)(uVar108 >> 0xb) & 1);
                    bVar26 = (bool)((byte)(uVar108 >> 0xc) & 1);
                    bVar27 = (bool)((byte)(uVar108 >> 0xd) & 1);
                    bVar28 = (bool)((byte)(uVar108 >> 0xe) & 1);
                    bVar29 = SUB81(uVar108 >> 0xf,0);
                    *(uint *)(local_910.ray + 0x380) =
                         (uint)(bVar104 & 1) * *(int *)(local_910.hit + 0x80) |
                         (uint)!(bool)(bVar104 & 1) * *(int *)(local_910.ray + 0x380);
                    *(uint *)(local_910.ray + 900) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_910.ray + 900);
                    *(uint *)(local_910.ray + 0x388) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_910.ray + 0x388);
                    *(uint *)(local_910.ray + 0x38c) =
                         (uint)bVar18 * iVar83 | (uint)!bVar18 * *(int *)(local_910.ray + 0x38c);
                    *(uint *)(local_910.ray + 0x390) =
                         (uint)bVar19 * iVar84 | (uint)!bVar19 * *(int *)(local_910.ray + 0x390);
                    *(uint *)(local_910.ray + 0x394) =
                         (uint)bVar20 * iVar85 | (uint)!bVar20 * *(int *)(local_910.ray + 0x394);
                    *(uint *)(local_910.ray + 0x398) =
                         (uint)bVar21 * iVar86 | (uint)!bVar21 * *(int *)(local_910.ray + 0x398);
                    *(uint *)(local_910.ray + 0x39c) =
                         (uint)bVar22 * iVar87 | (uint)!bVar22 * *(int *)(local_910.ray + 0x39c);
                    *(uint *)(local_910.ray + 0x3a0) =
                         (uint)(bVar103 & 1) * iVar88 |
                         (uint)!(bool)(bVar103 & 1) * *(int *)(local_910.ray + 0x3a0);
                    *(uint *)(local_910.ray + 0x3a4) =
                         (uint)bVar23 * iVar89 | (uint)!bVar23 * *(int *)(local_910.ray + 0x3a4);
                    *(uint *)(local_910.ray + 0x3a8) =
                         (uint)bVar24 * iVar90 | (uint)!bVar24 * *(int *)(local_910.ray + 0x3a8);
                    *(uint *)(local_910.ray + 0x3ac) =
                         (uint)bVar25 * iVar91 | (uint)!bVar25 * *(int *)(local_910.ray + 0x3ac);
                    *(uint *)(local_910.ray + 0x3b0) =
                         (uint)bVar26 * iVar92 | (uint)!bVar26 * *(int *)(local_910.ray + 0x3b0);
                    *(uint *)(local_910.ray + 0x3b4) =
                         (uint)bVar27 * iVar93 | (uint)!bVar27 * *(int *)(local_910.ray + 0x3b4);
                    *(uint *)(local_910.ray + 0x3b8) =
                         (uint)bVar28 * iVar94 | (uint)!bVar28 * *(int *)(local_910.ray + 0x3b8);
                    *(uint *)(local_910.ray + 0x3bc) =
                         (uint)bVar29 * iVar95 | (uint)!bVar29 * *(int *)(local_910.ray + 0x3bc);
                    iVar1 = *(int *)(local_910.hit + 0xc4);
                    iVar2 = *(int *)(local_910.hit + 200);
                    iVar83 = *(int *)(local_910.hit + 0xcc);
                    iVar84 = *(int *)(local_910.hit + 0xd0);
                    iVar85 = *(int *)(local_910.hit + 0xd4);
                    iVar86 = *(int *)(local_910.hit + 0xd8);
                    iVar87 = *(int *)(local_910.hit + 0xdc);
                    iVar88 = *(int *)(local_910.hit + 0xe0);
                    iVar89 = *(int *)(local_910.hit + 0xe4);
                    iVar90 = *(int *)(local_910.hit + 0xe8);
                    iVar91 = *(int *)(local_910.hit + 0xec);
                    iVar92 = *(int *)(local_910.hit + 0xf0);
                    iVar93 = *(int *)(local_910.hit + 0xf4);
                    iVar94 = *(int *)(local_910.hit + 0xf8);
                    iVar95 = *(int *)(local_910.hit + 0xfc);
                    bVar16 = (bool)((byte)(uVar108 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar108 >> 2) & 1);
                    bVar18 = (bool)((byte)(uVar108 >> 3) & 1);
                    bVar19 = (bool)((byte)(uVar108 >> 4) & 1);
                    bVar20 = (bool)((byte)(uVar108 >> 5) & 1);
                    bVar21 = (bool)((byte)(uVar108 >> 6) & 1);
                    bVar22 = (bool)((byte)(uVar108 >> 7) & 1);
                    bVar23 = (bool)((byte)(uVar108 >> 9) & 1);
                    bVar24 = (bool)((byte)(uVar108 >> 10) & 1);
                    bVar25 = (bool)((byte)(uVar108 >> 0xb) & 1);
                    bVar26 = (bool)((byte)(uVar108 >> 0xc) & 1);
                    bVar27 = (bool)((byte)(uVar108 >> 0xd) & 1);
                    bVar28 = (bool)((byte)(uVar108 >> 0xe) & 1);
                    bVar29 = SUB81(uVar108 >> 0xf,0);
                    *(uint *)(local_910.ray + 0x3c0) =
                         (uint)(bVar104 & 1) * *(int *)(local_910.hit + 0xc0) |
                         (uint)!(bool)(bVar104 & 1) * *(int *)(local_910.ray + 0x3c0);
                    *(uint *)(local_910.ray + 0x3c4) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_910.ray + 0x3c4);
                    *(uint *)(local_910.ray + 0x3c8) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_910.ray + 0x3c8);
                    *(uint *)(local_910.ray + 0x3cc) =
                         (uint)bVar18 * iVar83 | (uint)!bVar18 * *(int *)(local_910.ray + 0x3cc);
                    *(uint *)(local_910.ray + 0x3d0) =
                         (uint)bVar19 * iVar84 | (uint)!bVar19 * *(int *)(local_910.ray + 0x3d0);
                    *(uint *)(local_910.ray + 0x3d4) =
                         (uint)bVar20 * iVar85 | (uint)!bVar20 * *(int *)(local_910.ray + 0x3d4);
                    *(uint *)(local_910.ray + 0x3d8) =
                         (uint)bVar21 * iVar86 | (uint)!bVar21 * *(int *)(local_910.ray + 0x3d8);
                    *(uint *)(local_910.ray + 0x3dc) =
                         (uint)bVar22 * iVar87 | (uint)!bVar22 * *(int *)(local_910.ray + 0x3dc);
                    *(uint *)(local_910.ray + 0x3e0) =
                         (uint)(bVar103 & 1) * iVar88 |
                         (uint)!(bool)(bVar103 & 1) * *(int *)(local_910.ray + 0x3e0);
                    *(uint *)(local_910.ray + 0x3e4) =
                         (uint)bVar23 * iVar89 | (uint)!bVar23 * *(int *)(local_910.ray + 0x3e4);
                    *(uint *)(local_910.ray + 1000) =
                         (uint)bVar24 * iVar90 | (uint)!bVar24 * *(int *)(local_910.ray + 1000);
                    *(uint *)(local_910.ray + 0x3ec) =
                         (uint)bVar25 * iVar91 | (uint)!bVar25 * *(int *)(local_910.ray + 0x3ec);
                    *(uint *)(local_910.ray + 0x3f0) =
                         (uint)bVar26 * iVar92 | (uint)!bVar26 * *(int *)(local_910.ray + 0x3f0);
                    *(uint *)(local_910.ray + 0x3f4) =
                         (uint)bVar27 * iVar93 | (uint)!bVar27 * *(int *)(local_910.ray + 0x3f4);
                    *(uint *)(local_910.ray + 0x3f8) =
                         (uint)bVar28 * iVar94 | (uint)!bVar28 * *(int *)(local_910.ray + 0x3f8);
                    *(uint *)(local_910.ray + 0x3fc) =
                         (uint)bVar29 * iVar95 | (uint)!bVar29 * *(int *)(local_910.ray + 0x3fc);
                    iVar1 = *(int *)(local_910.hit + 0x104);
                    iVar2 = *(int *)(local_910.hit + 0x108);
                    iVar83 = *(int *)(local_910.hit + 0x10c);
                    iVar84 = *(int *)(local_910.hit + 0x110);
                    iVar85 = *(int *)(local_910.hit + 0x114);
                    iVar86 = *(int *)(local_910.hit + 0x118);
                    iVar87 = *(int *)(local_910.hit + 0x11c);
                    iVar88 = *(int *)(local_910.hit + 0x120);
                    iVar89 = *(int *)(local_910.hit + 0x124);
                    iVar90 = *(int *)(local_910.hit + 0x128);
                    iVar91 = *(int *)(local_910.hit + 300);
                    iVar92 = *(int *)(local_910.hit + 0x130);
                    iVar93 = *(int *)(local_910.hit + 0x134);
                    iVar94 = *(int *)(local_910.hit + 0x138);
                    iVar95 = *(int *)(local_910.hit + 0x13c);
                    bVar16 = (bool)((byte)(uVar108 >> 1) & 1);
                    bVar17 = (bool)((byte)(uVar108 >> 2) & 1);
                    bVar18 = (bool)((byte)(uVar108 >> 3) & 1);
                    bVar19 = (bool)((byte)(uVar108 >> 4) & 1);
                    bVar20 = (bool)((byte)(uVar108 >> 5) & 1);
                    bVar21 = (bool)((byte)(uVar108 >> 6) & 1);
                    bVar22 = (bool)((byte)(uVar108 >> 7) & 1);
                    bVar23 = (bool)((byte)(uVar108 >> 9) & 1);
                    bVar24 = (bool)((byte)(uVar108 >> 10) & 1);
                    bVar25 = (bool)((byte)(uVar108 >> 0xb) & 1);
                    bVar26 = (bool)((byte)(uVar108 >> 0xc) & 1);
                    bVar27 = (bool)((byte)(uVar108 >> 0xd) & 1);
                    bVar28 = (bool)((byte)(uVar108 >> 0xe) & 1);
                    bVar29 = SUB81(uVar108 >> 0xf,0);
                    *(uint *)(local_910.ray + 0x400) =
                         (uint)(bVar104 & 1) * *(int *)(local_910.hit + 0x100) |
                         (uint)!(bool)(bVar104 & 1) * *(int *)(local_910.ray + 0x400);
                    *(uint *)(local_910.ray + 0x404) =
                         (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_910.ray + 0x404);
                    *(uint *)(local_910.ray + 0x408) =
                         (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_910.ray + 0x408);
                    *(uint *)(local_910.ray + 0x40c) =
                         (uint)bVar18 * iVar83 | (uint)!bVar18 * *(int *)(local_910.ray + 0x40c);
                    *(uint *)(local_910.ray + 0x410) =
                         (uint)bVar19 * iVar84 | (uint)!bVar19 * *(int *)(local_910.ray + 0x410);
                    *(uint *)(local_910.ray + 0x414) =
                         (uint)bVar20 * iVar85 | (uint)!bVar20 * *(int *)(local_910.ray + 0x414);
                    *(uint *)(local_910.ray + 0x418) =
                         (uint)bVar21 * iVar86 | (uint)!bVar21 * *(int *)(local_910.ray + 0x418);
                    *(uint *)(local_910.ray + 0x41c) =
                         (uint)bVar22 * iVar87 | (uint)!bVar22 * *(int *)(local_910.ray + 0x41c);
                    *(uint *)(local_910.ray + 0x420) =
                         (uint)(bVar103 & 1) * iVar88 |
                         (uint)!(bool)(bVar103 & 1) * *(int *)(local_910.ray + 0x420);
                    *(uint *)(local_910.ray + 0x424) =
                         (uint)bVar23 * iVar89 | (uint)!bVar23 * *(int *)(local_910.ray + 0x424);
                    *(uint *)(local_910.ray + 0x428) =
                         (uint)bVar24 * iVar90 | (uint)!bVar24 * *(int *)(local_910.ray + 0x428);
                    *(uint *)(local_910.ray + 0x42c) =
                         (uint)bVar25 * iVar91 | (uint)!bVar25 * *(int *)(local_910.ray + 0x42c);
                    *(uint *)(local_910.ray + 0x430) =
                         (uint)bVar26 * iVar92 | (uint)!bVar26 * *(int *)(local_910.ray + 0x430);
                    *(uint *)(local_910.ray + 0x434) =
                         (uint)bVar27 * iVar93 | (uint)!bVar27 * *(int *)(local_910.ray + 0x434);
                    *(uint *)(local_910.ray + 0x438) =
                         (uint)bVar28 * iVar94 | (uint)!bVar28 * *(int *)(local_910.ray + 0x438);
                    *(uint *)(local_910.ray + 0x43c) =
                         (uint)bVar29 * iVar95 | (uint)!bVar29 * *(int *)(local_910.ray + 0x43c);
                    auVar204 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_910.hit + 0x140));
                    auVar204 = vmovdqu32_avx512f(auVar204);
                    *(undefined1 (*) [64])(local_910.ray + 0x440) = auVar204;
                    auVar204 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_910.hit + 0x180));
                    auVar204 = vmovdqu32_avx512f(auVar204);
                    *(undefined1 (*) [64])(local_910.ray + 0x480) = auVar204;
                    auVar204 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_910.hit + 0x1c0));
                    auVar204 = vmovdqa32_avx512f(auVar204);
                    *(undefined1 (*) [64])(local_910.ray + 0x4c0) = auVar204;
                    auVar204 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_910.hit + 0x200));
                    auVar204 = vmovdqa32_avx512f(auVar204);
                    *(undefined1 (*) [64])(local_910.ray + 0x500) = auVar204;
                  }
                  auVar221 = ZEXT3264(auVar140);
                  auVar204 = ZEXT3264(auVar125);
                  auVar119 = auVar238._0_16_;
                  bVar104 = ~(byte)(1 << ((uint)uVar105 & 0x1f)) & bVar114;
                  uVar174 = *(undefined4 *)(ray + k * 4 + 0x200);
                  auVar46._4_4_ = uVar174;
                  auVar46._0_4_ = uVar174;
                  auVar46._8_4_ = uVar174;
                  auVar46._12_4_ = uVar174;
                  auVar46._16_4_ = uVar174;
                  auVar46._20_4_ = uVar174;
                  auVar46._24_4_ = uVar174;
                  auVar46._28_4_ = uVar174;
                  uVar187 = vcmpps_avx512vl(auVar125,auVar46,2);
                  bVar114 = bVar104 & (byte)uVar187;
                  if ((bVar104 & (byte)uVar187) != 0) {
                    auVar185._8_4_ = 0x7f800000;
                    auVar185._0_8_ = 0x7f8000007f800000;
                    auVar185._12_4_ = 0x7f800000;
                    auVar185._16_4_ = 0x7f800000;
                    auVar185._20_4_ = 0x7f800000;
                    auVar185._24_4_ = 0x7f800000;
                    auVar185._28_4_ = 0x7f800000;
                    auVar127 = vblendmps_avx512vl(auVar185,auVar125);
                    auVar164._0_4_ =
                         (uint)(bVar114 & 1) * auVar127._0_4_ |
                         (uint)!(bool)(bVar114 & 1) * 0x7f800000;
                    bVar16 = (bool)(bVar114 >> 1 & 1);
                    auVar164._4_4_ = (uint)bVar16 * auVar127._4_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar114 >> 2 & 1);
                    auVar164._8_4_ = (uint)bVar16 * auVar127._8_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar114 >> 3 & 1);
                    auVar164._12_4_ = (uint)bVar16 * auVar127._12_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar114 >> 4 & 1);
                    auVar164._16_4_ = (uint)bVar16 * auVar127._16_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar114 >> 5 & 1);
                    auVar164._20_4_ = (uint)bVar16 * auVar127._20_4_ | (uint)!bVar16 * 0x7f800000;
                    bVar16 = (bool)(bVar114 >> 6 & 1);
                    auVar164._24_4_ = (uint)bVar16 * auVar127._24_4_ | (uint)!bVar16 * 0x7f800000;
                    auVar164._28_4_ =
                         (uint)(bVar114 >> 7) * auVar127._28_4_ |
                         (uint)!(bool)(bVar114 >> 7) * 0x7f800000;
                    auVar127 = vshufps_avx(auVar164,auVar164,0xb1);
                    auVar127 = vminps_avx(auVar164,auVar127);
                    auVar141 = vshufpd_avx(auVar127,auVar127,5);
                    auVar127 = vminps_avx(auVar127,auVar141);
                    auVar141 = vpermpd_avx2(auVar127,0x4e);
                    auVar127 = vminps_avx(auVar127,auVar141);
                    uVar187 = vcmpps_avx512vl(auVar164,auVar127,0);
                    bVar103 = (byte)uVar187 & bVar114;
                    bVar104 = bVar114;
                    if (bVar103 != 0) {
                      bVar104 = bVar103;
                    }
                    uVar107 = 0;
                    for (uVar106 = (uint)bVar104; (uVar106 & 1) == 0;
                        uVar106 = uVar106 >> 1 | 0x80000000) {
                      uVar107 = uVar107 + 1;
                    }
                    uVar105 = (ulong)uVar107;
                  }
                } while (bVar114 != 0);
              }
            }
          }
        }
      }
      if (8 < iVar13) {
        local_780 = vpbroadcastd_avx512vl();
        local_7e0 = vbroadcastss_avx512vl(auVar119);
        fStack_730 = 1.0 / local_740;
        auStack_73c._0_4_ = fStack_730;
        local_740 = fStack_730;
        auStack_73c._4_4_ = fStack_730;
        fStack_734 = fStack_730;
        auVar238 = vpbroadcastd_avx512f();
        local_4c0 = vmovdqa64_avx512f(auVar238);
        auVar238 = vpbroadcastd_avx512f();
        local_500 = vmovdqa64_avx512f(auVar238);
        lVar113 = 8;
        auVar125 = auVar221._0_32_;
        auVar127 = auVar204._0_32_;
        local_760 = uVar109;
        uStack_75c = uVar109;
        uStack_758 = uVar109;
        uStack_754 = uVar109;
        uStack_750 = uVar109;
        uStack_74c = uVar109;
        uStack_748 = uVar109;
        uStack_744 = uVar109;
        fStack_72c = fStack_730;
        fStack_728 = fStack_730;
        fStack_724 = fStack_730;
        do {
          auVar140 = vpbroadcastd_avx512vl();
          auVar128 = vpor_avx2(auVar140,_DAT_0205a920);
          uVar32 = vpcmpd_avx512vl(auVar128,local_780,1);
          auVar140 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar113 * 4 + lVar34);
          auVar141 = *(undefined1 (*) [32])(lVar34 + 0x22307f0 + lVar113 * 4);
          auVar139 = *(undefined1 (*) [32])(lVar34 + 0x2230c74 + lVar113 * 4);
          auVar126 = *(undefined1 (*) [32])(lVar34 + 0x22310f8 + lVar113 * 4);
          local_880 = auVar186._0_32_;
          auVar129 = vmulps_avx512vl(local_880,auVar126);
          local_8a0 = auVar240._0_32_;
          auVar130 = vmulps_avx512vl(local_8a0,auVar126);
          auVar64._4_4_ = auVar126._4_4_ * (float)local_3e0._4_4_;
          auVar64._0_4_ = auVar126._0_4_ * (float)local_3e0._0_4_;
          auVar64._8_4_ = auVar126._8_4_ * fStack_3d8;
          auVar64._12_4_ = auVar126._12_4_ * fStack_3d4;
          auVar64._16_4_ = auVar126._16_4_ * fStack_3d0;
          auVar64._20_4_ = auVar126._20_4_ * fStack_3cc;
          auVar64._24_4_ = auVar126._24_4_ * fStack_3c8;
          auVar64._28_4_ = auVar128._28_4_;
          auVar128 = vfmadd231ps_avx512vl(auVar129,auVar139,local_380);
          auVar129 = vfmadd231ps_avx512vl(auVar130,auVar139,local_3a0);
          auVar130 = vfmadd231ps_avx512vl(auVar64,auVar139,local_3c0);
          auVar137 = auVar235._0_32_;
          auVar128 = vfmadd231ps_avx512vl(auVar128,auVar141,auVar137);
          auVar129 = vfmadd231ps_avx512vl(auVar129,auVar141,local_560);
          auVar119 = vfmadd231ps_fma(auVar130,auVar141,local_360);
          auVar223 = auVar237._0_32_;
          auVar132 = vfmadd231ps_avx512vl(auVar128,auVar140,auVar223);
          auVar220 = auVar236._0_32_;
          auVar122 = vfmadd231ps_avx512vl(auVar129,auVar140,auVar220);
          auVar128 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar113 * 4 + lVar34);
          auVar129 = *(undefined1 (*) [32])(lVar34 + 0x2232c10 + lVar113 * 4);
          auVar119 = vfmadd231ps_fma(ZEXT1632(auVar119),auVar140,local_340);
          auVar130 = *(undefined1 (*) [32])(lVar34 + 0x2233094 + lVar113 * 4);
          auVar138 = *(undefined1 (*) [32])(lVar34 + 0x2233518 + lVar113 * 4);
          auVar124 = vmulps_avx512vl(local_880,auVar138);
          auVar131 = vmulps_avx512vl(local_8a0,auVar138);
          auVar65._4_4_ = auVar138._4_4_ * (float)local_3e0._4_4_;
          auVar65._0_4_ = auVar138._0_4_ * (float)local_3e0._0_4_;
          auVar65._8_4_ = auVar138._8_4_ * fStack_3d8;
          auVar65._12_4_ = auVar138._12_4_ * fStack_3d4;
          auVar65._16_4_ = auVar138._16_4_ * fStack_3d0;
          auVar65._20_4_ = auVar138._20_4_ * fStack_3cc;
          auVar65._24_4_ = auVar138._24_4_ * fStack_3c8;
          auVar65._28_4_ = uStack_3c4;
          auVar124 = vfmadd231ps_avx512vl(auVar124,auVar130,local_380);
          auVar131 = vfmadd231ps_avx512vl(auVar131,auVar130,local_3a0);
          auVar123 = vfmadd231ps_avx512vl(auVar65,auVar130,local_3c0);
          auVar124 = vfmadd231ps_avx512vl(auVar124,auVar129,auVar137);
          auVar131 = vfmadd231ps_avx512vl(auVar131,auVar129,local_560);
          auVar118 = vfmadd231ps_fma(auVar123,auVar129,local_360);
          auVar123 = vfmadd231ps_avx512vl(auVar124,auVar128,auVar223);
          auVar133 = vfmadd231ps_avx512vl(auVar131,auVar128,auVar220);
          auVar118 = vfmadd231ps_fma(ZEXT1632(auVar118),auVar128,local_340);
          auVar134 = vmaxps_avx512vl(ZEXT1632(auVar119),ZEXT1632(auVar118));
          auVar124 = vsubps_avx(auVar123,auVar132);
          auVar131 = vsubps_avx(auVar133,auVar122);
          auVar135 = vmulps_avx512vl(auVar122,auVar124);
          auVar136 = vmulps_avx512vl(auVar132,auVar131);
          auVar135 = vsubps_avx512vl(auVar135,auVar136);
          auVar136 = vmulps_avx512vl(auVar131,auVar131);
          auVar136 = vfmadd231ps_avx512vl(auVar136,auVar124,auVar124);
          auVar134 = vmulps_avx512vl(auVar134,auVar134);
          auVar134 = vmulps_avx512vl(auVar134,auVar136);
          auVar135 = vmulps_avx512vl(auVar135,auVar135);
          uVar187 = vcmpps_avx512vl(auVar135,auVar134,2);
          local_670 = (byte)uVar32 & (byte)uVar187;
          if (local_670 == 0) {
            auVar238 = ZEXT3264(auVar220);
            auVar235 = ZEXT3264(auVar137);
          }
          else {
            auVar138 = vmulps_avx512vl(local_460,auVar138);
            auVar130 = vfmadd213ps_avx512vl(auVar130,local_440,auVar138);
            auVar129 = vfmadd213ps_avx512vl(auVar129,local_420,auVar130);
            auVar128 = vfmadd213ps_avx512vl(auVar128,local_400,auVar129);
            auVar126 = vmulps_avx512vl(local_460,auVar126);
            auVar139 = vfmadd213ps_avx512vl(auVar139,local_440,auVar126);
            auVar141 = vfmadd213ps_avx512vl(auVar141,local_420,auVar139);
            auVar129 = vfmadd213ps_avx512vl(auVar140,local_400,auVar141);
            auVar140 = *(undefined1 (*) [32])(lVar34 + 0x223157c + lVar113 * 4);
            auVar141 = *(undefined1 (*) [32])(lVar34 + 0x2231a00 + lVar113 * 4);
            auVar139 = *(undefined1 (*) [32])(lVar34 + 0x2231e84 + lVar113 * 4);
            auVar126 = *(undefined1 (*) [32])(lVar34 + 0x2232308 + lVar113 * 4);
            auVar130 = vmulps_avx512vl(local_880,auVar126);
            auVar138 = vmulps_avx512vl(local_8a0,auVar126);
            auVar126 = vmulps_avx512vl(local_460,auVar126);
            auVar130 = vfmadd231ps_avx512vl(auVar130,auVar139,local_380);
            auVar138 = vfmadd231ps_avx512vl(auVar138,auVar139,local_3a0);
            auVar139 = vfmadd231ps_avx512vl(auVar126,local_440,auVar139);
            auVar126 = vfmadd231ps_avx512vl(auVar130,auVar141,auVar137);
            auVar130 = vfmadd231ps_avx512vl(auVar138,auVar141,local_560);
            auVar141 = vfmadd231ps_avx512vl(auVar139,local_420,auVar141);
            auVar126 = vfmadd231ps_avx512vl(auVar126,auVar140,auVar223);
            auVar130 = vfmadd231ps_avx512vl(auVar130,auVar140,auVar220);
            auVar138 = vfmadd231ps_avx512vl(auVar141,local_400,auVar140);
            auVar140 = *(undefined1 (*) [32])(lVar34 + 0x223399c + lVar113 * 4);
            auVar141 = *(undefined1 (*) [32])(lVar34 + 0x22342a4 + lVar113 * 4);
            auVar139 = *(undefined1 (*) [32])(lVar34 + 0x2234728 + lVar113 * 4);
            auVar134 = vmulps_avx512vl(local_880,auVar139);
            auVar135 = vmulps_avx512vl(local_8a0,auVar139);
            auVar139 = vmulps_avx512vl(local_460,auVar139);
            auVar134 = vfmadd231ps_avx512vl(auVar134,auVar141,local_380);
            auVar135 = vfmadd231ps_avx512vl(auVar135,auVar141,local_3a0);
            auVar139 = vfmadd231ps_avx512vl(auVar139,local_440,auVar141);
            auVar141 = *(undefined1 (*) [32])(lVar34 + 0x2233e20 + lVar113 * 4);
            auVar134 = vfmadd231ps_avx512vl(auVar134,auVar141,auVar137);
            auVar176 = vfmadd231ps_fma(auVar135,auVar141,local_560);
            auVar141 = vfmadd231ps_avx512vl(auVar139,local_420,auVar141);
            auVar139 = vfmadd231ps_avx512vl(auVar134,auVar140,auVar223);
            auVar134 = vfmadd231ps_avx512vl(ZEXT1632(auVar176),auVar140,auVar220);
            auVar141 = vfmadd231ps_avx512vl(auVar141,local_400,auVar140);
            auVar135 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar126,auVar135);
            vandps_avx512vl(auVar130,auVar135);
            auVar140 = vmaxps_avx(auVar135,auVar135);
            vandps_avx512vl(auVar138,auVar135);
            auVar140 = vmaxps_avx(auVar140,auVar135);
            uVar105 = vcmpps_avx512vl(auVar140,local_7e0,1);
            bVar16 = (bool)((byte)uVar105 & 1);
            auVar153._0_4_ = (float)((uint)bVar16 * auVar124._0_4_ | (uint)!bVar16 * auVar126._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
            auVar153._4_4_ = (float)((uint)bVar16 * auVar124._4_4_ | (uint)!bVar16 * auVar126._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar105 >> 2) & 1);
            auVar153._8_4_ = (float)((uint)bVar16 * auVar124._8_4_ | (uint)!bVar16 * auVar126._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar105 >> 3) & 1);
            auVar153._12_4_ =
                 (float)((uint)bVar16 * auVar124._12_4_ | (uint)!bVar16 * auVar126._12_4_);
            bVar16 = (bool)((byte)(uVar105 >> 4) & 1);
            auVar153._16_4_ =
                 (float)((uint)bVar16 * auVar124._16_4_ | (uint)!bVar16 * auVar126._16_4_);
            bVar16 = (bool)((byte)(uVar105 >> 5) & 1);
            auVar153._20_4_ =
                 (float)((uint)bVar16 * auVar124._20_4_ | (uint)!bVar16 * auVar126._20_4_);
            bVar16 = (bool)((byte)(uVar105 >> 6) & 1);
            auVar153._24_4_ =
                 (float)((uint)bVar16 * auVar124._24_4_ | (uint)!bVar16 * auVar126._24_4_);
            bVar16 = SUB81(uVar105 >> 7,0);
            auVar153._28_4_ = (uint)bVar16 * auVar124._28_4_ | (uint)!bVar16 * auVar126._28_4_;
            bVar16 = (bool)((byte)uVar105 & 1);
            auVar154._0_4_ = (float)((uint)bVar16 * auVar131._0_4_ | (uint)!bVar16 * auVar130._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
            auVar154._4_4_ = (float)((uint)bVar16 * auVar131._4_4_ | (uint)!bVar16 * auVar130._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar105 >> 2) & 1);
            auVar154._8_4_ = (float)((uint)bVar16 * auVar131._8_4_ | (uint)!bVar16 * auVar130._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar105 >> 3) & 1);
            auVar154._12_4_ =
                 (float)((uint)bVar16 * auVar131._12_4_ | (uint)!bVar16 * auVar130._12_4_);
            bVar16 = (bool)((byte)(uVar105 >> 4) & 1);
            auVar154._16_4_ =
                 (float)((uint)bVar16 * auVar131._16_4_ | (uint)!bVar16 * auVar130._16_4_);
            bVar16 = (bool)((byte)(uVar105 >> 5) & 1);
            auVar154._20_4_ =
                 (float)((uint)bVar16 * auVar131._20_4_ | (uint)!bVar16 * auVar130._20_4_);
            bVar16 = (bool)((byte)(uVar105 >> 6) & 1);
            auVar154._24_4_ =
                 (float)((uint)bVar16 * auVar131._24_4_ | (uint)!bVar16 * auVar130._24_4_);
            bVar16 = SUB81(uVar105 >> 7,0);
            auVar154._28_4_ = (uint)bVar16 * auVar131._28_4_ | (uint)!bVar16 * auVar130._28_4_;
            vandps_avx512vl(auVar139,auVar135);
            vandps_avx512vl(auVar134,auVar135);
            auVar140 = vmaxps_avx(auVar154,auVar154);
            vandps_avx512vl(auVar141,auVar135);
            auVar140 = vmaxps_avx(auVar140,auVar154);
            uVar105 = vcmpps_avx512vl(auVar140,local_7e0,1);
            bVar16 = (bool)((byte)uVar105 & 1);
            auVar155._0_4_ = (uint)bVar16 * auVar124._0_4_ | (uint)!bVar16 * auVar139._0_4_;
            bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
            auVar155._4_4_ = (uint)bVar16 * auVar124._4_4_ | (uint)!bVar16 * auVar139._4_4_;
            bVar16 = (bool)((byte)(uVar105 >> 2) & 1);
            auVar155._8_4_ = (uint)bVar16 * auVar124._8_4_ | (uint)!bVar16 * auVar139._8_4_;
            bVar16 = (bool)((byte)(uVar105 >> 3) & 1);
            auVar155._12_4_ = (uint)bVar16 * auVar124._12_4_ | (uint)!bVar16 * auVar139._12_4_;
            bVar16 = (bool)((byte)(uVar105 >> 4) & 1);
            auVar155._16_4_ = (uint)bVar16 * auVar124._16_4_ | (uint)!bVar16 * auVar139._16_4_;
            bVar16 = (bool)((byte)(uVar105 >> 5) & 1);
            auVar155._20_4_ = (uint)bVar16 * auVar124._20_4_ | (uint)!bVar16 * auVar139._20_4_;
            bVar16 = (bool)((byte)(uVar105 >> 6) & 1);
            auVar155._24_4_ = (uint)bVar16 * auVar124._24_4_ | (uint)!bVar16 * auVar139._24_4_;
            bVar16 = SUB81(uVar105 >> 7,0);
            auVar155._28_4_ = (uint)bVar16 * auVar124._28_4_ | (uint)!bVar16 * auVar139._28_4_;
            bVar16 = (bool)((byte)uVar105 & 1);
            auVar156._0_4_ = (float)((uint)bVar16 * auVar131._0_4_ | (uint)!bVar16 * auVar134._0_4_)
            ;
            bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
            auVar156._4_4_ = (float)((uint)bVar16 * auVar131._4_4_ | (uint)!bVar16 * auVar134._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar105 >> 2) & 1);
            auVar156._8_4_ = (float)((uint)bVar16 * auVar131._8_4_ | (uint)!bVar16 * auVar134._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar105 >> 3) & 1);
            auVar156._12_4_ =
                 (float)((uint)bVar16 * auVar131._12_4_ | (uint)!bVar16 * auVar134._12_4_);
            bVar16 = (bool)((byte)(uVar105 >> 4) & 1);
            auVar156._16_4_ =
                 (float)((uint)bVar16 * auVar131._16_4_ | (uint)!bVar16 * auVar134._16_4_);
            bVar16 = (bool)((byte)(uVar105 >> 5) & 1);
            auVar156._20_4_ =
                 (float)((uint)bVar16 * auVar131._20_4_ | (uint)!bVar16 * auVar134._20_4_);
            bVar16 = (bool)((byte)(uVar105 >> 6) & 1);
            auVar156._24_4_ =
                 (float)((uint)bVar16 * auVar131._24_4_ | (uint)!bVar16 * auVar134._24_4_);
            bVar16 = SUB81(uVar105 >> 7,0);
            auVar156._28_4_ = (uint)bVar16 * auVar131._28_4_ | (uint)!bVar16 * auVar134._28_4_;
            auVar227._8_4_ = 0x80000000;
            auVar227._0_8_ = 0x8000000080000000;
            auVar227._12_4_ = 0x80000000;
            auVar227._16_4_ = 0x80000000;
            auVar227._20_4_ = 0x80000000;
            auVar227._24_4_ = 0x80000000;
            auVar227._28_4_ = 0x80000000;
            auVar140 = vxorps_avx512vl(auVar155,auVar227);
            auVar134 = auVar239._0_32_;
            auVar141 = vfmadd213ps_avx512vl(auVar153,auVar153,auVar134);
            auVar176 = vfmadd231ps_fma(auVar141,auVar154,auVar154);
            auVar141 = vrsqrt14ps_avx512vl(ZEXT1632(auVar176));
            auVar234._8_4_ = 0xbf000000;
            auVar234._0_8_ = 0xbf000000bf000000;
            auVar234._12_4_ = 0xbf000000;
            auVar234._16_4_ = 0xbf000000;
            auVar234._20_4_ = 0xbf000000;
            auVar234._24_4_ = 0xbf000000;
            auVar234._28_4_ = 0xbf000000;
            fVar206 = auVar141._0_4_;
            fVar173 = auVar141._4_4_;
            fVar212 = auVar141._8_4_;
            fVar213 = auVar141._12_4_;
            fVar192 = auVar141._16_4_;
            fVar205 = auVar141._20_4_;
            fVar115 = auVar141._24_4_;
            auVar66._4_4_ = fVar173 * fVar173 * fVar173 * auVar176._4_4_ * -0.5;
            auVar66._0_4_ = fVar206 * fVar206 * fVar206 * auVar176._0_4_ * -0.5;
            auVar66._8_4_ = fVar212 * fVar212 * fVar212 * auVar176._8_4_ * -0.5;
            auVar66._12_4_ = fVar213 * fVar213 * fVar213 * auVar176._12_4_ * -0.5;
            auVar66._16_4_ = fVar192 * fVar192 * fVar192 * -0.0;
            auVar66._20_4_ = fVar205 * fVar205 * fVar205 * -0.0;
            auVar66._24_4_ = fVar115 * fVar115 * fVar115 * -0.0;
            auVar66._28_4_ = auVar154._28_4_;
            auVar139 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar141 = vfmadd231ps_avx512vl(auVar66,auVar139,auVar141);
            auVar67._4_4_ = auVar154._4_4_ * auVar141._4_4_;
            auVar67._0_4_ = auVar154._0_4_ * auVar141._0_4_;
            auVar67._8_4_ = auVar154._8_4_ * auVar141._8_4_;
            auVar67._12_4_ = auVar154._12_4_ * auVar141._12_4_;
            auVar67._16_4_ = auVar154._16_4_ * auVar141._16_4_;
            auVar67._20_4_ = auVar154._20_4_ * auVar141._20_4_;
            auVar67._24_4_ = auVar154._24_4_ * auVar141._24_4_;
            auVar67._28_4_ = 0;
            auVar68._4_4_ = auVar141._4_4_ * -auVar153._4_4_;
            auVar68._0_4_ = auVar141._0_4_ * -auVar153._0_4_;
            auVar68._8_4_ = auVar141._8_4_ * -auVar153._8_4_;
            auVar68._12_4_ = auVar141._12_4_ * -auVar153._12_4_;
            auVar68._16_4_ = auVar141._16_4_ * -auVar153._16_4_;
            auVar68._20_4_ = auVar141._20_4_ * -auVar153._20_4_;
            auVar68._24_4_ = auVar141._24_4_ * -auVar153._24_4_;
            auVar68._28_4_ = auVar154._28_4_;
            auVar126 = vmulps_avx512vl(auVar141,auVar134);
            auVar141 = vfmadd213ps_avx512vl(auVar155,auVar155,auVar134);
            auVar141 = vfmadd231ps_avx512vl(auVar141,auVar156,auVar156);
            auVar130 = vrsqrt14ps_avx512vl(auVar141);
            auVar141 = vmulps_avx512vl(auVar141,auVar234);
            fVar206 = auVar130._0_4_;
            fVar173 = auVar130._4_4_;
            fVar212 = auVar130._8_4_;
            fVar213 = auVar130._12_4_;
            fVar192 = auVar130._16_4_;
            fVar205 = auVar130._20_4_;
            fVar115 = auVar130._24_4_;
            auVar69._4_4_ = fVar173 * fVar173 * fVar173 * auVar141._4_4_;
            auVar69._0_4_ = fVar206 * fVar206 * fVar206 * auVar141._0_4_;
            auVar69._8_4_ = fVar212 * fVar212 * fVar212 * auVar141._8_4_;
            auVar69._12_4_ = fVar213 * fVar213 * fVar213 * auVar141._12_4_;
            auVar69._16_4_ = fVar192 * fVar192 * fVar192 * auVar141._16_4_;
            auVar69._20_4_ = fVar205 * fVar205 * fVar205 * auVar141._20_4_;
            auVar69._24_4_ = fVar115 * fVar115 * fVar115 * auVar141._24_4_;
            auVar69._28_4_ = auVar141._28_4_;
            auVar141 = vfmadd231ps_avx512vl(auVar69,auVar139,auVar130);
            auVar70._4_4_ = auVar156._4_4_ * auVar141._4_4_;
            auVar70._0_4_ = auVar156._0_4_ * auVar141._0_4_;
            auVar70._8_4_ = auVar156._8_4_ * auVar141._8_4_;
            auVar70._12_4_ = auVar156._12_4_ * auVar141._12_4_;
            auVar70._16_4_ = auVar156._16_4_ * auVar141._16_4_;
            auVar70._20_4_ = auVar156._20_4_ * auVar141._20_4_;
            auVar70._24_4_ = auVar156._24_4_ * auVar141._24_4_;
            auVar70._28_4_ = auVar130._28_4_;
            auVar71._4_4_ = auVar141._4_4_ * auVar140._4_4_;
            auVar71._0_4_ = auVar141._0_4_ * auVar140._0_4_;
            auVar71._8_4_ = auVar141._8_4_ * auVar140._8_4_;
            auVar71._12_4_ = auVar141._12_4_ * auVar140._12_4_;
            auVar71._16_4_ = auVar141._16_4_ * auVar140._16_4_;
            auVar71._20_4_ = auVar141._20_4_ * auVar140._20_4_;
            auVar71._24_4_ = auVar141._24_4_ * auVar140._24_4_;
            auVar71._28_4_ = auVar140._28_4_;
            auVar140 = vmulps_avx512vl(auVar141,auVar134);
            auVar176 = vfmadd213ps_fma(auVar67,ZEXT1632(auVar119),auVar132);
            auVar141 = ZEXT1632(auVar119);
            auVar175 = vfmadd213ps_fma(auVar68,auVar141,auVar122);
            auVar139 = vfmadd213ps_avx512vl(auVar126,auVar141,auVar129);
            auVar130 = vfmadd213ps_avx512vl(auVar70,ZEXT1632(auVar118),auVar123);
            auVar35 = vfnmadd213ps_fma(auVar67,auVar141,auVar132);
            auVar138 = ZEXT1632(auVar118);
            auVar117 = vfmadd213ps_fma(auVar71,auVar138,auVar133);
            auVar120 = vfnmadd213ps_fma(auVar68,auVar141,auVar122);
            auVar10 = vfmadd213ps_fma(auVar140,auVar138,auVar128);
            auVar122 = ZEXT1632(auVar119);
            auVar226 = vfnmadd231ps_fma(auVar129,auVar122,auVar126);
            auVar222 = vfnmadd213ps_fma(auVar70,auVar138,auVar123);
            auVar225 = vfnmadd213ps_fma(auVar71,auVar138,auVar133);
            auVar121 = vfnmadd231ps_fma(auVar128,ZEXT1632(auVar118),auVar140);
            auVar128 = vsubps_avx512vl(auVar130,ZEXT1632(auVar35));
            auVar140 = vsubps_avx(ZEXT1632(auVar117),ZEXT1632(auVar120));
            auVar141 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar226));
            auVar72._4_4_ = auVar140._4_4_ * auVar226._4_4_;
            auVar72._0_4_ = auVar140._0_4_ * auVar226._0_4_;
            auVar72._8_4_ = auVar140._8_4_ * auVar226._8_4_;
            auVar72._12_4_ = auVar140._12_4_ * auVar226._12_4_;
            auVar72._16_4_ = auVar140._16_4_ * 0.0;
            auVar72._20_4_ = auVar140._20_4_ * 0.0;
            auVar72._24_4_ = auVar140._24_4_ * 0.0;
            auVar72._28_4_ = auVar126._28_4_;
            auVar119 = vfmsub231ps_fma(auVar72,ZEXT1632(auVar120),auVar141);
            auVar73._4_4_ = auVar141._4_4_ * auVar35._4_4_;
            auVar73._0_4_ = auVar141._0_4_ * auVar35._0_4_;
            auVar73._8_4_ = auVar141._8_4_ * auVar35._8_4_;
            auVar73._12_4_ = auVar141._12_4_ * auVar35._12_4_;
            auVar73._16_4_ = auVar141._16_4_ * 0.0;
            auVar73._20_4_ = auVar141._20_4_ * 0.0;
            auVar73._24_4_ = auVar141._24_4_ * 0.0;
            auVar73._28_4_ = auVar141._28_4_;
            auVar188 = vfmsub231ps_fma(auVar73,ZEXT1632(auVar226),auVar128);
            auVar74._4_4_ = auVar120._4_4_ * auVar128._4_4_;
            auVar74._0_4_ = auVar120._0_4_ * auVar128._0_4_;
            auVar74._8_4_ = auVar120._8_4_ * auVar128._8_4_;
            auVar74._12_4_ = auVar120._12_4_ * auVar128._12_4_;
            auVar74._16_4_ = auVar128._16_4_ * 0.0;
            auVar74._20_4_ = auVar128._20_4_ * 0.0;
            auVar74._24_4_ = auVar128._24_4_ * 0.0;
            auVar74._28_4_ = auVar128._28_4_;
            auVar193 = vfmsub231ps_fma(auVar74,ZEXT1632(auVar35),auVar140);
            auVar140 = vfmadd231ps_avx512vl(ZEXT1632(auVar193),auVar134,ZEXT1632(auVar188));
            auVar140 = vfmadd231ps_avx512vl(auVar140,auVar134,ZEXT1632(auVar119));
            uVar105 = vcmpps_avx512vl(auVar140,auVar134,2);
            bVar114 = (byte)uVar105;
            fVar165 = (float)((uint)(bVar114 & 1) * auVar176._0_4_ |
                             (uint)!(bool)(bVar114 & 1) * auVar222._0_4_);
            bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
            fVar167 = (float)((uint)bVar16 * auVar176._4_4_ | (uint)!bVar16 * auVar222._4_4_);
            bVar16 = (bool)((byte)(uVar105 >> 2) & 1);
            fVar170 = (float)((uint)bVar16 * auVar176._8_4_ | (uint)!bVar16 * auVar222._8_4_);
            bVar16 = (bool)((byte)(uVar105 >> 3) & 1);
            fVar171 = (float)((uint)bVar16 * auVar176._12_4_ | (uint)!bVar16 * auVar222._12_4_);
            auVar138 = ZEXT1632(CONCAT412(fVar171,CONCAT48(fVar170,CONCAT44(fVar167,fVar165))));
            fVar166 = (float)((uint)(bVar114 & 1) * auVar175._0_4_ |
                             (uint)!(bool)(bVar114 & 1) * auVar225._0_4_);
            bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
            fVar169 = (float)((uint)bVar16 * auVar175._4_4_ | (uint)!bVar16 * auVar225._4_4_);
            bVar16 = (bool)((byte)(uVar105 >> 2) & 1);
            fVar168 = (float)((uint)bVar16 * auVar175._8_4_ | (uint)!bVar16 * auVar225._8_4_);
            bVar16 = (bool)((byte)(uVar105 >> 3) & 1);
            fVar172 = (float)((uint)bVar16 * auVar175._12_4_ | (uint)!bVar16 * auVar225._12_4_);
            auVar124 = ZEXT1632(CONCAT412(fVar172,CONCAT48(fVar168,CONCAT44(fVar169,fVar166))));
            auVar157._0_4_ =
                 (float)((uint)(bVar114 & 1) * auVar139._0_4_ |
                        (uint)!(bool)(bVar114 & 1) * auVar121._0_4_);
            bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
            auVar157._4_4_ = (float)((uint)bVar16 * auVar139._4_4_ | (uint)!bVar16 * auVar121._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar105 >> 2) & 1);
            auVar157._8_4_ = (float)((uint)bVar16 * auVar139._8_4_ | (uint)!bVar16 * auVar121._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar105 >> 3) & 1);
            auVar157._12_4_ =
                 (float)((uint)bVar16 * auVar139._12_4_ | (uint)!bVar16 * auVar121._12_4_);
            fVar206 = (float)((uint)((byte)(uVar105 >> 4) & 1) * auVar139._16_4_);
            auVar157._16_4_ = fVar206;
            fVar173 = (float)((uint)((byte)(uVar105 >> 5) & 1) * auVar139._20_4_);
            auVar157._20_4_ = fVar173;
            fVar212 = (float)((uint)((byte)(uVar105 >> 6) & 1) * auVar139._24_4_);
            auVar157._24_4_ = fVar212;
            iVar1 = (uint)(byte)(uVar105 >> 7) * auVar139._28_4_;
            auVar157._28_4_ = iVar1;
            auVar140 = vblendmps_avx512vl(ZEXT1632(auVar35),auVar130);
            auVar158._0_4_ =
                 (uint)(bVar114 & 1) * auVar140._0_4_ | (uint)!(bool)(bVar114 & 1) * auVar119._0_4_;
            bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
            auVar158._4_4_ = (uint)bVar16 * auVar140._4_4_ | (uint)!bVar16 * auVar119._4_4_;
            bVar16 = (bool)((byte)(uVar105 >> 2) & 1);
            auVar158._8_4_ = (uint)bVar16 * auVar140._8_4_ | (uint)!bVar16 * auVar119._8_4_;
            bVar16 = (bool)((byte)(uVar105 >> 3) & 1);
            auVar158._12_4_ = (uint)bVar16 * auVar140._12_4_ | (uint)!bVar16 * auVar119._12_4_;
            auVar158._16_4_ = (uint)((byte)(uVar105 >> 4) & 1) * auVar140._16_4_;
            auVar158._20_4_ = (uint)((byte)(uVar105 >> 5) & 1) * auVar140._20_4_;
            auVar158._24_4_ = (uint)((byte)(uVar105 >> 6) & 1) * auVar140._24_4_;
            auVar158._28_4_ = (uint)(byte)(uVar105 >> 7) * auVar140._28_4_;
            auVar140 = vblendmps_avx512vl(ZEXT1632(auVar120),ZEXT1632(auVar117));
            auVar159._0_4_ =
                 (float)((uint)(bVar114 & 1) * auVar140._0_4_ |
                        (uint)!(bool)(bVar114 & 1) * auVar176._0_4_);
            bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
            auVar159._4_4_ = (float)((uint)bVar16 * auVar140._4_4_ | (uint)!bVar16 * auVar176._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar105 >> 2) & 1);
            auVar159._8_4_ = (float)((uint)bVar16 * auVar140._8_4_ | (uint)!bVar16 * auVar176._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar105 >> 3) & 1);
            auVar159._12_4_ =
                 (float)((uint)bVar16 * auVar140._12_4_ | (uint)!bVar16 * auVar176._12_4_);
            fVar213 = (float)((uint)((byte)(uVar105 >> 4) & 1) * auVar140._16_4_);
            auVar159._16_4_ = fVar213;
            fVar192 = (float)((uint)((byte)(uVar105 >> 5) & 1) * auVar140._20_4_);
            auVar159._20_4_ = fVar192;
            fVar205 = (float)((uint)((byte)(uVar105 >> 6) & 1) * auVar140._24_4_);
            auVar159._24_4_ = fVar205;
            auVar159._28_4_ = (uint)(byte)(uVar105 >> 7) * auVar140._28_4_;
            auVar140 = vblendmps_avx512vl(ZEXT1632(auVar226),ZEXT1632(auVar10));
            auVar160._0_4_ =
                 (float)((uint)(bVar114 & 1) * auVar140._0_4_ |
                        (uint)!(bool)(bVar114 & 1) * auVar175._0_4_);
            bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
            auVar160._4_4_ = (float)((uint)bVar16 * auVar140._4_4_ | (uint)!bVar16 * auVar175._4_4_)
            ;
            bVar16 = (bool)((byte)(uVar105 >> 2) & 1);
            auVar160._8_4_ = (float)((uint)bVar16 * auVar140._8_4_ | (uint)!bVar16 * auVar175._8_4_)
            ;
            bVar16 = (bool)((byte)(uVar105 >> 3) & 1);
            auVar160._12_4_ =
                 (float)((uint)bVar16 * auVar140._12_4_ | (uint)!bVar16 * auVar175._12_4_);
            fVar116 = (float)((uint)((byte)(uVar105 >> 4) & 1) * auVar140._16_4_);
            auVar160._16_4_ = fVar116;
            fVar191 = (float)((uint)((byte)(uVar105 >> 5) & 1) * auVar140._20_4_);
            auVar160._20_4_ = fVar191;
            fVar115 = (float)((uint)((byte)(uVar105 >> 6) & 1) * auVar140._24_4_);
            auVar160._24_4_ = fVar115;
            iVar2 = (uint)(byte)(uVar105 >> 7) * auVar140._28_4_;
            auVar160._28_4_ = iVar2;
            auVar161._0_4_ =
                 (uint)(bVar114 & 1) * (int)auVar35._0_4_ |
                 (uint)!(bool)(bVar114 & 1) * auVar130._0_4_;
            bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
            auVar161._4_4_ = (uint)bVar16 * (int)auVar35._4_4_ | (uint)!bVar16 * auVar130._4_4_;
            bVar16 = (bool)((byte)(uVar105 >> 2) & 1);
            auVar161._8_4_ = (uint)bVar16 * (int)auVar35._8_4_ | (uint)!bVar16 * auVar130._8_4_;
            bVar16 = (bool)((byte)(uVar105 >> 3) & 1);
            auVar161._12_4_ = (uint)bVar16 * (int)auVar35._12_4_ | (uint)!bVar16 * auVar130._12_4_;
            auVar161._16_4_ = (uint)!(bool)((byte)(uVar105 >> 4) & 1) * auVar130._16_4_;
            auVar161._20_4_ = (uint)!(bool)((byte)(uVar105 >> 5) & 1) * auVar130._20_4_;
            auVar161._24_4_ = (uint)!(bool)((byte)(uVar105 >> 6) & 1) * auVar130._24_4_;
            auVar161._28_4_ = (uint)!SUB81(uVar105 >> 7,0) * auVar130._28_4_;
            bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar105 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar105 >> 3) & 1);
            bVar17 = (bool)((byte)(uVar105 >> 1) & 1);
            bVar19 = (bool)((byte)(uVar105 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar105 >> 3) & 1);
            auVar130 = vsubps_avx512vl(auVar161,auVar138);
            auVar141 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar120._12_4_ |
                                                     (uint)!bVar20 * auVar117._12_4_,
                                                     CONCAT48((uint)bVar18 * (int)auVar120._8_4_ |
                                                              (uint)!bVar18 * auVar117._8_4_,
                                                              CONCAT44((uint)bVar16 *
                                                                       (int)auVar120._4_4_ |
                                                                       (uint)!bVar16 *
                                                                       auVar117._4_4_,
                                                                       (uint)(bVar114 & 1) *
                                                                       (int)auVar120._0_4_ |
                                                                       (uint)!(bool)(bVar114 & 1) *
                                                                       auVar117._0_4_)))),auVar124);
            auVar139 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar21 * (int)auVar226._12_4_ |
                                                     (uint)!bVar21 * auVar10._12_4_,
                                                     CONCAT48((uint)bVar19 * (int)auVar226._8_4_ |
                                                              (uint)!bVar19 * auVar10._8_4_,
                                                              CONCAT44((uint)bVar17 *
                                                                       (int)auVar226._4_4_ |
                                                                       (uint)!bVar17 * auVar10._4_4_
                                                                       ,(uint)(bVar114 & 1) *
                                                                        (int)auVar226._0_4_ |
                                                                        (uint)!(bool)(bVar114 & 1) *
                                                                        auVar10._0_4_)))),auVar157);
            auVar126 = vsubps_avx(auVar138,auVar158);
            auVar128 = vsubps_avx(auVar124,auVar159);
            auVar129 = vsubps_avx(auVar157,auVar160);
            auVar75._4_4_ = auVar139._4_4_ * fVar167;
            auVar75._0_4_ = auVar139._0_4_ * fVar165;
            auVar75._8_4_ = auVar139._8_4_ * fVar170;
            auVar75._12_4_ = auVar139._12_4_ * fVar171;
            auVar75._16_4_ = auVar139._16_4_ * 0.0;
            auVar75._20_4_ = auVar139._20_4_ * 0.0;
            auVar75._24_4_ = auVar139._24_4_ * 0.0;
            auVar75._28_4_ = 0;
            auVar119 = vfmsub231ps_fma(auVar75,auVar157,auVar130);
            auVar203._0_4_ = fVar166 * auVar130._0_4_;
            auVar203._4_4_ = fVar169 * auVar130._4_4_;
            auVar203._8_4_ = fVar168 * auVar130._8_4_;
            auVar203._12_4_ = fVar172 * auVar130._12_4_;
            auVar203._16_4_ = auVar130._16_4_ * 0.0;
            auVar203._20_4_ = auVar130._20_4_ * 0.0;
            auVar203._24_4_ = auVar130._24_4_ * 0.0;
            auVar203._28_4_ = 0;
            auVar176 = vfmsub231ps_fma(auVar203,auVar138,auVar141);
            auVar140 = vfmadd231ps_avx512vl(ZEXT1632(auVar176),auVar134,ZEXT1632(auVar119));
            auVar210._0_4_ = auVar141._0_4_ * auVar157._0_4_;
            auVar210._4_4_ = auVar141._4_4_ * auVar157._4_4_;
            auVar210._8_4_ = auVar141._8_4_ * auVar157._8_4_;
            auVar210._12_4_ = auVar141._12_4_ * auVar157._12_4_;
            auVar210._16_4_ = auVar141._16_4_ * fVar206;
            auVar210._20_4_ = auVar141._20_4_ * fVar173;
            auVar210._24_4_ = auVar141._24_4_ * fVar212;
            auVar210._28_4_ = 0;
            auVar119 = vfmsub231ps_fma(auVar210,auVar124,auVar139);
            auVar131 = vfmadd231ps_avx512vl(auVar140,auVar134,ZEXT1632(auVar119));
            auVar140 = vmulps_avx512vl(auVar129,auVar158);
            auVar140 = vfmsub231ps_avx512vl(auVar140,auVar126,auVar160);
            auVar76._4_4_ = auVar128._4_4_ * auVar160._4_4_;
            auVar76._0_4_ = auVar128._0_4_ * auVar160._0_4_;
            auVar76._8_4_ = auVar128._8_4_ * auVar160._8_4_;
            auVar76._12_4_ = auVar128._12_4_ * auVar160._12_4_;
            auVar76._16_4_ = auVar128._16_4_ * fVar116;
            auVar76._20_4_ = auVar128._20_4_ * fVar191;
            auVar76._24_4_ = auVar128._24_4_ * fVar115;
            auVar76._28_4_ = iVar2;
            auVar119 = vfmsub231ps_fma(auVar76,auVar159,auVar129);
            auVar211._0_4_ = auVar159._0_4_ * auVar126._0_4_;
            auVar211._4_4_ = auVar159._4_4_ * auVar126._4_4_;
            auVar211._8_4_ = auVar159._8_4_ * auVar126._8_4_;
            auVar211._12_4_ = auVar159._12_4_ * auVar126._12_4_;
            auVar211._16_4_ = fVar213 * auVar126._16_4_;
            auVar211._20_4_ = fVar192 * auVar126._20_4_;
            auVar211._24_4_ = fVar205 * auVar126._24_4_;
            auVar211._28_4_ = 0;
            auVar176 = vfmsub231ps_fma(auVar211,auVar128,auVar158);
            auVar140 = vfmadd231ps_avx512vl(ZEXT1632(auVar176),auVar134,auVar140);
            auVar132 = vfmadd231ps_avx512vl(auVar140,auVar134,ZEXT1632(auVar119));
            auVar140 = vmaxps_avx(auVar131,auVar132);
            uVar187 = vcmpps_avx512vl(auVar140,auVar134,2);
            local_670 = local_670 & (byte)uVar187;
            auVar238 = ZEXT3264(auVar220);
            if (local_670 == 0) {
LAB_01dc939c:
              local_670 = 0;
            }
            else {
              auVar77._4_4_ = auVar129._4_4_ * auVar141._4_4_;
              auVar77._0_4_ = auVar129._0_4_ * auVar141._0_4_;
              auVar77._8_4_ = auVar129._8_4_ * auVar141._8_4_;
              auVar77._12_4_ = auVar129._12_4_ * auVar141._12_4_;
              auVar77._16_4_ = auVar129._16_4_ * auVar141._16_4_;
              auVar77._20_4_ = auVar129._20_4_ * auVar141._20_4_;
              auVar77._24_4_ = auVar129._24_4_ * auVar141._24_4_;
              auVar77._28_4_ = auVar140._28_4_;
              auVar175 = vfmsub231ps_fma(auVar77,auVar128,auVar139);
              auVar78._4_4_ = auVar139._4_4_ * auVar126._4_4_;
              auVar78._0_4_ = auVar139._0_4_ * auVar126._0_4_;
              auVar78._8_4_ = auVar139._8_4_ * auVar126._8_4_;
              auVar78._12_4_ = auVar139._12_4_ * auVar126._12_4_;
              auVar78._16_4_ = auVar139._16_4_ * auVar126._16_4_;
              auVar78._20_4_ = auVar139._20_4_ * auVar126._20_4_;
              auVar78._24_4_ = auVar139._24_4_ * auVar126._24_4_;
              auVar78._28_4_ = auVar139._28_4_;
              auVar176 = vfmsub231ps_fma(auVar78,auVar130,auVar129);
              auVar79._4_4_ = auVar128._4_4_ * auVar130._4_4_;
              auVar79._0_4_ = auVar128._0_4_ * auVar130._0_4_;
              auVar79._8_4_ = auVar128._8_4_ * auVar130._8_4_;
              auVar79._12_4_ = auVar128._12_4_ * auVar130._12_4_;
              auVar79._16_4_ = auVar128._16_4_ * auVar130._16_4_;
              auVar79._20_4_ = auVar128._20_4_ * auVar130._20_4_;
              auVar79._24_4_ = auVar128._24_4_ * auVar130._24_4_;
              auVar79._28_4_ = auVar128._28_4_;
              auVar117 = vfmsub231ps_fma(auVar79,auVar126,auVar141);
              auVar119 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar176),ZEXT1632(auVar117));
              auVar140 = vfmadd231ps_avx512vl(ZEXT1632(auVar119),ZEXT1632(auVar175),auVar134);
              auVar141 = vrcp14ps_avx512vl(auVar140);
              auVar41._8_4_ = 0x3f800000;
              auVar41._0_8_ = &DAT_3f8000003f800000;
              auVar41._12_4_ = 0x3f800000;
              auVar41._16_4_ = 0x3f800000;
              auVar41._20_4_ = 0x3f800000;
              auVar41._24_4_ = 0x3f800000;
              auVar41._28_4_ = 0x3f800000;
              auVar139 = vfnmadd213ps_avx512vl(auVar141,auVar140,auVar41);
              auVar119 = vfmadd132ps_fma(auVar139,auVar141,auVar141);
              auVar80._4_4_ = auVar117._4_4_ * auVar157._4_4_;
              auVar80._0_4_ = auVar117._0_4_ * auVar157._0_4_;
              auVar80._8_4_ = auVar117._8_4_ * auVar157._8_4_;
              auVar80._12_4_ = auVar117._12_4_ * auVar157._12_4_;
              auVar80._16_4_ = fVar206 * 0.0;
              auVar80._20_4_ = fVar173 * 0.0;
              auVar80._24_4_ = fVar212 * 0.0;
              auVar80._28_4_ = iVar1;
              auVar176 = vfmadd231ps_fma(auVar80,auVar124,ZEXT1632(auVar176));
              auVar176 = vfmadd231ps_fma(ZEXT1632(auVar176),auVar138,ZEXT1632(auVar175));
              fVar206 = auVar119._0_4_;
              fVar173 = auVar119._4_4_;
              fVar212 = auVar119._8_4_;
              fVar213 = auVar119._12_4_;
              auVar141 = ZEXT1632(CONCAT412(auVar176._12_4_ * fVar213,
                                            CONCAT48(auVar176._8_4_ * fVar212,
                                                     CONCAT44(auVar176._4_4_ * fVar173,
                                                              auVar176._0_4_ * fVar206))));
              auVar102._4_4_ = uStack_75c;
              auVar102._0_4_ = local_760;
              auVar102._8_4_ = uStack_758;
              auVar102._12_4_ = uStack_754;
              auVar102._16_4_ = uStack_750;
              auVar102._20_4_ = uStack_74c;
              auVar102._24_4_ = uStack_748;
              auVar102._28_4_ = uStack_744;
              uVar187 = vcmpps_avx512vl(auVar141,auVar102,0xd);
              uVar174 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar42._4_4_ = uVar174;
              auVar42._0_4_ = uVar174;
              auVar42._8_4_ = uVar174;
              auVar42._12_4_ = uVar174;
              auVar42._16_4_ = uVar174;
              auVar42._20_4_ = uVar174;
              auVar42._24_4_ = uVar174;
              auVar42._28_4_ = uVar174;
              uVar32 = vcmpps_avx512vl(auVar141,auVar42,2);
              local_670 = (byte)uVar187 & (byte)uVar32 & local_670;
              if (local_670 == 0) goto LAB_01dc939c;
              uVar187 = vcmpps_avx512vl(auVar140,auVar134,4);
              if ((local_670 & (byte)uVar187) == 0) {
                local_670 = 0;
              }
              else {
                local_670 = local_670 & (byte)uVar187;
                fVar192 = auVar131._0_4_ * fVar206;
                fVar205 = auVar131._4_4_ * fVar173;
                auVar81._4_4_ = fVar205;
                auVar81._0_4_ = fVar192;
                fVar115 = auVar131._8_4_ * fVar212;
                auVar81._8_4_ = fVar115;
                fVar116 = auVar131._12_4_ * fVar213;
                auVar81._12_4_ = fVar116;
                fVar191 = auVar131._16_4_ * 0.0;
                auVar81._16_4_ = fVar191;
                fVar165 = auVar131._20_4_ * 0.0;
                auVar81._20_4_ = fVar165;
                fVar166 = auVar131._24_4_ * 0.0;
                auVar81._24_4_ = fVar166;
                auVar81._28_4_ = auVar131._28_4_;
                fVar206 = auVar132._0_4_ * fVar206;
                fVar173 = auVar132._4_4_ * fVar173;
                auVar82._4_4_ = fVar173;
                auVar82._0_4_ = fVar206;
                fVar212 = auVar132._8_4_ * fVar212;
                auVar82._8_4_ = fVar212;
                fVar213 = auVar132._12_4_ * fVar213;
                auVar82._12_4_ = fVar213;
                fVar167 = auVar132._16_4_ * 0.0;
                auVar82._16_4_ = fVar167;
                fVar169 = auVar132._20_4_ * 0.0;
                auVar82._20_4_ = fVar169;
                fVar170 = auVar132._24_4_ * 0.0;
                auVar82._24_4_ = fVar170;
                auVar82._28_4_ = auVar132._28_4_;
                auVar219._8_4_ = 0x3f800000;
                auVar219._0_8_ = &DAT_3f8000003f800000;
                auVar219._12_4_ = 0x3f800000;
                auVar219._16_4_ = 0x3f800000;
                auVar219._20_4_ = 0x3f800000;
                auVar219._24_4_ = 0x3f800000;
                auVar219._28_4_ = 0x3f800000;
                auVar140 = vsubps_avx512vl(auVar219,auVar81);
                bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
                bVar17 = (bool)((byte)(uVar105 >> 2) & 1);
                bVar18 = (bool)((byte)(uVar105 >> 3) & 1);
                bVar19 = (bool)((byte)(uVar105 >> 4) & 1);
                bVar20 = (bool)((byte)(uVar105 >> 5) & 1);
                bVar21 = (bool)((byte)(uVar105 >> 6) & 1);
                bVar22 = SUB81(uVar105 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar22 * auVar131._28_4_ |
                                              (uint)!bVar22 * auVar140._28_4_,
                                              CONCAT424((uint)bVar21 * (int)fVar166 |
                                                        (uint)!bVar21 * auVar140._24_4_,
                                                        CONCAT420((uint)bVar20 * (int)fVar165 |
                                                                  (uint)!bVar20 * auVar140._20_4_,
                                                                  CONCAT416((uint)bVar19 *
                                                                            (int)fVar191 |
                                                                            (uint)!bVar19 *
                                                                            auVar140._16_4_,
                                                                            CONCAT412((uint)bVar18 *
                                                                                      (int)fVar116 |
                                                                                      (uint)!bVar18
                                                                                      * auVar140.
                                                  _12_4_,CONCAT48((uint)bVar17 * (int)fVar115 |
                                                                  (uint)!bVar17 * auVar140._8_4_,
                                                                  CONCAT44((uint)bVar16 *
                                                                           (int)fVar205 |
                                                                           (uint)!bVar16 *
                                                                           auVar140._4_4_,
                                                                           (uint)(bVar114 & 1) *
                                                                           (int)fVar192 |
                                                                           (uint)!(bool)(bVar114 & 1
                                                                                        ) *
                                                                           auVar140._0_4_))))))));
                auVar140 = vsubps_avx(auVar219,auVar82);
                bVar16 = (bool)((byte)(uVar105 >> 1) & 1);
                bVar17 = (bool)((byte)(uVar105 >> 2) & 1);
                bVar18 = (bool)((byte)(uVar105 >> 3) & 1);
                bVar19 = (bool)((byte)(uVar105 >> 4) & 1);
                bVar20 = (bool)((byte)(uVar105 >> 5) & 1);
                bVar21 = (bool)((byte)(uVar105 >> 6) & 1);
                bVar22 = SUB81(uVar105 >> 7,0);
                local_5c0._4_4_ = (uint)bVar16 * (int)fVar173 | (uint)!bVar16 * auVar140._4_4_;
                local_5c0._0_4_ =
                     (uint)(bVar114 & 1) * (int)fVar206 |
                     (uint)!(bool)(bVar114 & 1) * auVar140._0_4_;
                local_5c0._8_4_ = (uint)bVar17 * (int)fVar212 | (uint)!bVar17 * auVar140._8_4_;
                local_5c0._12_4_ = (uint)bVar18 * (int)fVar213 | (uint)!bVar18 * auVar140._12_4_;
                local_5c0._16_4_ = (uint)bVar19 * (int)fVar167 | (uint)!bVar19 * auVar140._16_4_;
                local_5c0._20_4_ = (uint)bVar20 * (int)fVar169 | (uint)!bVar20 * auVar140._20_4_;
                local_5c0._24_4_ = (uint)bVar21 * (int)fVar170 | (uint)!bVar21 * auVar140._24_4_;
                local_5c0._28_4_ = (uint)bVar22 * auVar132._28_4_ | (uint)!bVar22 * auVar140._28_4_;
                in_ZMM21 = ZEXT3264(auVar141);
              }
            }
            auVar235 = ZEXT3264(local_8c0);
            if (local_670 != 0) {
              auVar140 = vsubps_avx(ZEXT1632(auVar118),auVar122);
              local_840 = in_ZMM20._0_32_;
              auVar140 = vfmadd213ps_avx512vl(auVar140,local_840,auVar122);
              auVar181._0_4_ = auVar140._0_4_ + auVar140._0_4_;
              auVar181._4_4_ = auVar140._4_4_ + auVar140._4_4_;
              auVar181._8_4_ = auVar140._8_4_ + auVar140._8_4_;
              auVar181._12_4_ = auVar140._12_4_ + auVar140._12_4_;
              auVar181._16_4_ = auVar140._16_4_ + auVar140._16_4_;
              auVar181._20_4_ = auVar140._20_4_ + auVar140._20_4_;
              auVar181._24_4_ = auVar140._24_4_ + auVar140._24_4_;
              auVar181._28_4_ = auVar140._28_4_ + auVar140._28_4_;
              uVar174 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar43._4_4_ = uVar174;
              auVar43._0_4_ = uVar174;
              auVar43._8_4_ = uVar174;
              auVar43._12_4_ = uVar174;
              auVar43._16_4_ = uVar174;
              auVar43._20_4_ = uVar174;
              auVar43._24_4_ = uVar174;
              auVar43._28_4_ = uVar174;
              auVar140 = vmulps_avx512vl(auVar181,auVar43);
              local_860 = in_ZMM21._0_32_;
              uVar187 = vcmpps_avx512vl(local_860,auVar140,6);
              local_670 = local_670 & (byte)uVar187;
              uVar109 = (uint)local_670;
              if (local_670 != 0) {
                auVar182._8_4_ = 0xbf800000;
                auVar182._0_8_ = 0xbf800000bf800000;
                auVar182._12_4_ = 0xbf800000;
                auVar182._16_4_ = 0xbf800000;
                auVar182._20_4_ = 0xbf800000;
                auVar182._24_4_ = 0xbf800000;
                auVar182._28_4_ = 0xbf800000;
                auVar44._8_4_ = 0x40000000;
                auVar44._0_8_ = 0x4000000040000000;
                auVar44._12_4_ = 0x40000000;
                auVar44._16_4_ = 0x40000000;
                auVar44._20_4_ = 0x40000000;
                auVar44._24_4_ = 0x40000000;
                auVar44._28_4_ = 0x40000000;
                local_700 = vfmadd132ps_avx512vl(local_5c0,auVar182,auVar44);
                local_5c0 = local_700;
                auVar140 = local_5c0;
                local_6c0 = (undefined4)lVar113;
                local_680 = CONCAT44(fStack_8dc,local_8e0);
                uStack_678 = CONCAT44(fStack_8d4,fStack_8d8);
                pGVar110 = (context->scene->geometries).items[uVar111].ptr;
                local_5c0 = auVar140;
                if ((pGVar110->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  auVar140 = vaddps_avx512vl(local_840,_DAT_02020f40);
                  auVar119 = vcvtsi2ss_avx512f(auVar236._0_16_,local_6c0);
                  fVar206 = auVar119._0_4_;
                  local_660[0] = (fVar206 + auVar140._0_4_) * local_740;
                  local_660[1] = (fVar206 + auVar140._4_4_) * (float)auStack_73c._0_4_;
                  local_660[2] = (fVar206 + auVar140._8_4_) * (float)auStack_73c._4_4_;
                  local_660[3] = (fVar206 + auVar140._12_4_) * fStack_734;
                  fStack_650 = (fVar206 + auVar140._16_4_) * fStack_730;
                  fStack_64c = (fVar206 + auVar140._20_4_) * fStack_72c;
                  fStack_648 = (fVar206 + auVar140._24_4_) * fStack_728;
                  fStack_644 = fVar206 + auVar140._28_4_;
                  local_5c0._0_8_ = local_700._0_8_;
                  local_5c0._8_8_ = local_700._8_8_;
                  local_5c0._16_8_ = local_700._16_8_;
                  local_5c0._24_8_ = local_700._24_8_;
                  local_640 = local_5c0._0_8_;
                  uStack_638 = local_5c0._8_8_;
                  uStack_630 = local_5c0._16_8_;
                  uStack_628 = local_5c0._24_8_;
                  local_620 = local_860;
                  auVar183._8_4_ = 0x7f800000;
                  auVar183._0_8_ = 0x7f8000007f800000;
                  auVar183._12_4_ = 0x7f800000;
                  auVar183._16_4_ = 0x7f800000;
                  auVar183._20_4_ = 0x7f800000;
                  auVar183._24_4_ = 0x7f800000;
                  auVar183._28_4_ = 0x7f800000;
                  auVar140 = vblendmps_avx512vl(auVar183,local_860);
                  auVar162._0_4_ =
                       (uint)(local_670 & 1) * auVar140._0_4_ |
                       (uint)!(bool)(local_670 & 1) * 0x7f800000;
                  bVar16 = (bool)(local_670 >> 1 & 1);
                  auVar162._4_4_ = (uint)bVar16 * auVar140._4_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_670 >> 2 & 1);
                  auVar162._8_4_ = (uint)bVar16 * auVar140._8_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_670 >> 3 & 1);
                  auVar162._12_4_ = (uint)bVar16 * auVar140._12_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_670 >> 4 & 1);
                  auVar162._16_4_ = (uint)bVar16 * auVar140._16_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_670 >> 5 & 1);
                  auVar162._20_4_ = (uint)bVar16 * auVar140._20_4_ | (uint)!bVar16 * 0x7f800000;
                  bVar16 = (bool)(local_670 >> 6 & 1);
                  auVar162._24_4_ = (uint)bVar16 * auVar140._24_4_ | (uint)!bVar16 * 0x7f800000;
                  auVar162._28_4_ =
                       (uint)(local_670 >> 7) * auVar140._28_4_ |
                       (uint)!(bool)(local_670 >> 7) * 0x7f800000;
                  auVar140 = vshufps_avx(auVar162,auVar162,0xb1);
                  auVar140 = vminps_avx(auVar162,auVar140);
                  auVar141 = vshufpd_avx(auVar140,auVar140,5);
                  auVar140 = vminps_avx(auVar140,auVar141);
                  auVar141 = vpermpd_avx2(auVar140,0x4e);
                  auVar140 = vminps_avx(auVar140,auVar141);
                  uVar187 = vcmpps_avx512vl(auVar162,auVar140,0);
                  bVar104 = (byte)uVar187 & local_670;
                  bVar114 = local_670;
                  if (bVar104 != 0) {
                    bVar114 = bVar104;
                  }
                  uVar107 = 0;
                  for (uVar106 = (uint)bVar114; (uVar106 & 1) == 0;
                      uVar106 = uVar106 >> 1 | 0x80000000) {
                    uVar107 = uVar107 + 1;
                  }
                  uVar105 = (ulong)uVar107;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar110->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar206 = local_660[uVar105];
                    uVar174 = *(undefined4 *)((long)&local_640 + uVar105 * 4);
                    fVar173 = 1.0 - fVar206;
                    auVar175 = vfnmadd231ss_fma(ZEXT416((uint)(fVar206 * (fVar173 + fVar173))),
                                                ZEXT416((uint)fVar173),ZEXT416((uint)fVar173));
                    auVar176 = ZEXT416((uint)fVar206);
                    auVar119 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar176,
                                               ZEXT416(0xc0a00000));
                    auVar118 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * fVar206 * 3.0)),
                                               ZEXT416((uint)(fVar206 + fVar206)),auVar119);
                    auVar119 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar176,
                                               ZEXT416(0x40000000));
                    auVar119 = vfmadd231ss_fma(ZEXT416((uint)(fVar173 * fVar173 * -3.0)),
                                               ZEXT416((uint)(fVar173 + fVar173)),auVar119);
                    auVar176 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * fVar206)),auVar176,
                                               ZEXT416((uint)(fVar173 * -2.0)));
                    fVar173 = auVar175._0_4_ * 0.5;
                    fVar212 = auVar118._0_4_ * 0.5;
                    fVar213 = auVar119._0_4_ * 0.5;
                    fVar192 = auVar176._0_4_ * 0.5;
                    auVar196._0_4_ = fVar192 * local_8e0;
                    auVar196._4_4_ = fVar192 * fStack_8dc;
                    auVar196._8_4_ = fVar192 * fStack_8d8;
                    auVar196._12_4_ = fVar192 * fStack_8d4;
                    auVar215._4_4_ = fVar213;
                    auVar215._0_4_ = fVar213;
                    auVar215._8_4_ = fVar213;
                    auVar215._12_4_ = fVar213;
                    auVar119 = vfmadd132ps_fma(auVar215,auVar196,auVar8);
                    auVar197._4_4_ = fVar212;
                    auVar197._0_4_ = fVar212;
                    auVar197._8_4_ = fVar212;
                    auVar197._12_4_ = fVar212;
                    auVar119 = vfmadd132ps_fma(auVar197,auVar119,auVar9);
                    auVar190._4_4_ = fVar173;
                    auVar190._0_4_ = fVar173;
                    auVar190._8_4_ = fVar173;
                    auVar190._12_4_ = fVar173;
                    auVar119 = vfmadd213ps_fma(auVar190,auVar30,auVar119);
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_620 + uVar105 * 4);
                    *(int *)(ray + k * 4 + 0x300) = auVar119._0_4_;
                    uVar14 = vextractps_avx(auVar119,1);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar14;
                    uVar14 = vextractps_avx(auVar119,2);
                    *(undefined4 *)(ray + k * 4 + 0x380) = uVar14;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar206;
                    *(undefined4 *)(ray + k * 4 + 0x400) = uVar174;
                    *(uint *)(ray + k * 4 + 0x440) = uVar12;
                    *(uint *)(ray + k * 4 + 0x480) = uVar111;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                  else {
                    local_820 = (float)uVar96;
                    fStack_81c = (float)((ulong)uVar96 >> 0x20);
                    fStack_818 = (float)uVar97;
                    fStack_814 = (float)((ulong)uVar97 >> 0x20);
                    local_570 = local_680;
                    uStack_568 = uStack_678;
                    local_8d0 = pGVar110;
                    local_810 = uVar31;
                    uStack_808 = uVar33;
                    local_720 = local_840;
                    local_6e0 = local_860;
                    local_6bc = iVar13;
                    local_6b0 = auVar30;
                    local_6a0 = uVar31;
                    uStack_698 = uVar33;
                    local_690 = uVar96;
                    uStack_688 = uVar97;
                    do {
                      auVar117 = auVar239._0_16_;
                      local_800 = *(undefined4 *)(ray + k * 4 + 0x200);
                      local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_660[uVar105]));
                      local_1c0 = vbroadcastss_avx512f
                                            (ZEXT416(*(uint *)((long)&local_640 + uVar105 * 4)));
                      *(undefined4 *)(ray + k * 4 + 0x200) =
                           *(undefined4 *)(local_620 + uVar105 * 4);
                      local_910.context = context->user;
                      fVar173 = local_200._0_4_;
                      fVar206 = 1.0 - fVar173;
                      auVar175 = vfnmadd231ss_fma(ZEXT416((uint)(fVar173 * (fVar206 + fVar206))),
                                                  ZEXT416((uint)fVar206),ZEXT416((uint)fVar206));
                      auVar176 = local_200._0_16_;
                      auVar119 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar176,
                                                 ZEXT416(0xc0a00000));
                      auVar118 = vfmadd231ss_fma(ZEXT416((uint)(fVar173 * fVar173 * 3.0)),
                                                 ZEXT416((uint)(fVar173 + fVar173)),auVar119);
                      auVar119 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar176,
                                                 ZEXT416(0x40000000));
                      auVar119 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * fVar206 * -3.0)),
                                                 ZEXT416((uint)(fVar206 + fVar206)),auVar119);
                      auVar176 = vfmadd231ss_fma(ZEXT416((uint)(fVar173 * fVar173)),auVar176,
                                                 ZEXT416((uint)(fVar206 * -2.0)));
                      fVar206 = auVar175._0_4_ * 0.5;
                      fVar173 = auVar118._0_4_ * 0.5;
                      fVar212 = auVar119._0_4_ * 0.5;
                      fVar213 = auVar176._0_4_ * 0.5;
                      auVar198._0_4_ = fVar213 * (float)local_570;
                      auVar198._4_4_ = fVar213 * local_570._4_4_;
                      auVar198._8_4_ = fVar213 * (float)uStack_568;
                      auVar198._12_4_ = fVar213 * uStack_568._4_4_;
                      auVar216._4_4_ = fVar212;
                      auVar216._0_4_ = fVar212;
                      auVar216._8_4_ = fVar212;
                      auVar216._12_4_ = fVar212;
                      auVar98._4_4_ = fStack_81c;
                      auVar98._0_4_ = local_820;
                      auVar98._8_4_ = fStack_818;
                      auVar98._12_4_ = fStack_814;
                      auVar119 = vfmadd132ps_fma(auVar216,auVar198,auVar98);
                      auVar199._4_4_ = fVar173;
                      auVar199._0_4_ = fVar173;
                      auVar199._8_4_ = fVar173;
                      auVar199._12_4_ = fVar173;
                      auVar99._8_8_ = uStack_808;
                      auVar99._0_8_ = local_810;
                      auVar119 = vfmadd132ps_fma(auVar199,auVar119,auVar99);
                      auVar177._4_4_ = fVar206;
                      auVar177._0_4_ = fVar206;
                      auVar177._8_4_ = fVar206;
                      auVar177._12_4_ = fVar206;
                      auVar119 = vfmadd213ps_fma(auVar177,auVar30,auVar119);
                      auVar204 = vbroadcastss_avx512f(auVar119);
                      auVar221 = vbroadcastss_avx512f(ZEXT416(1));
                      local_280 = vpermps_avx512f(auVar221,ZEXT1664(auVar119));
                      auVar221 = vbroadcastss_avx512f(ZEXT416(2));
                      local_240 = vpermps_avx512f(auVar221,ZEXT1664(auVar119));
                      local_2c0[0] = (RTCHitN)auVar204[0];
                      local_2c0[1] = (RTCHitN)auVar204[1];
                      local_2c0[2] = (RTCHitN)auVar204[2];
                      local_2c0[3] = (RTCHitN)auVar204[3];
                      local_2c0[4] = (RTCHitN)auVar204[4];
                      local_2c0[5] = (RTCHitN)auVar204[5];
                      local_2c0[6] = (RTCHitN)auVar204[6];
                      local_2c0[7] = (RTCHitN)auVar204[7];
                      local_2c0[8] = (RTCHitN)auVar204[8];
                      local_2c0[9] = (RTCHitN)auVar204[9];
                      local_2c0[10] = (RTCHitN)auVar204[10];
                      local_2c0[0xb] = (RTCHitN)auVar204[0xb];
                      local_2c0[0xc] = (RTCHitN)auVar204[0xc];
                      local_2c0[0xd] = (RTCHitN)auVar204[0xd];
                      local_2c0[0xe] = (RTCHitN)auVar204[0xe];
                      local_2c0[0xf] = (RTCHitN)auVar204[0xf];
                      local_2c0[0x10] = (RTCHitN)auVar204[0x10];
                      local_2c0[0x11] = (RTCHitN)auVar204[0x11];
                      local_2c0[0x12] = (RTCHitN)auVar204[0x12];
                      local_2c0[0x13] = (RTCHitN)auVar204[0x13];
                      local_2c0[0x14] = (RTCHitN)auVar204[0x14];
                      local_2c0[0x15] = (RTCHitN)auVar204[0x15];
                      local_2c0[0x16] = (RTCHitN)auVar204[0x16];
                      local_2c0[0x17] = (RTCHitN)auVar204[0x17];
                      local_2c0[0x18] = (RTCHitN)auVar204[0x18];
                      local_2c0[0x19] = (RTCHitN)auVar204[0x19];
                      local_2c0[0x1a] = (RTCHitN)auVar204[0x1a];
                      local_2c0[0x1b] = (RTCHitN)auVar204[0x1b];
                      local_2c0[0x1c] = (RTCHitN)auVar204[0x1c];
                      local_2c0[0x1d] = (RTCHitN)auVar204[0x1d];
                      local_2c0[0x1e] = (RTCHitN)auVar204[0x1e];
                      local_2c0[0x1f] = (RTCHitN)auVar204[0x1f];
                      local_2c0[0x20] = (RTCHitN)auVar204[0x20];
                      local_2c0[0x21] = (RTCHitN)auVar204[0x21];
                      local_2c0[0x22] = (RTCHitN)auVar204[0x22];
                      local_2c0[0x23] = (RTCHitN)auVar204[0x23];
                      local_2c0[0x24] = (RTCHitN)auVar204[0x24];
                      local_2c0[0x25] = (RTCHitN)auVar204[0x25];
                      local_2c0[0x26] = (RTCHitN)auVar204[0x26];
                      local_2c0[0x27] = (RTCHitN)auVar204[0x27];
                      local_2c0[0x28] = (RTCHitN)auVar204[0x28];
                      local_2c0[0x29] = (RTCHitN)auVar204[0x29];
                      local_2c0[0x2a] = (RTCHitN)auVar204[0x2a];
                      local_2c0[0x2b] = (RTCHitN)auVar204[0x2b];
                      local_2c0[0x2c] = (RTCHitN)auVar204[0x2c];
                      local_2c0[0x2d] = (RTCHitN)auVar204[0x2d];
                      local_2c0[0x2e] = (RTCHitN)auVar204[0x2e];
                      local_2c0[0x2f] = (RTCHitN)auVar204[0x2f];
                      local_2c0[0x30] = (RTCHitN)auVar204[0x30];
                      local_2c0[0x31] = (RTCHitN)auVar204[0x31];
                      local_2c0[0x32] = (RTCHitN)auVar204[0x32];
                      local_2c0[0x33] = (RTCHitN)auVar204[0x33];
                      local_2c0[0x34] = (RTCHitN)auVar204[0x34];
                      local_2c0[0x35] = (RTCHitN)auVar204[0x35];
                      local_2c0[0x36] = (RTCHitN)auVar204[0x36];
                      local_2c0[0x37] = (RTCHitN)auVar204[0x37];
                      local_2c0[0x38] = (RTCHitN)auVar204[0x38];
                      local_2c0[0x39] = (RTCHitN)auVar204[0x39];
                      local_2c0[0x3a] = (RTCHitN)auVar204[0x3a];
                      local_2c0[0x3b] = (RTCHitN)auVar204[0x3b];
                      local_2c0[0x3c] = (RTCHitN)auVar204[0x3c];
                      local_2c0[0x3d] = (RTCHitN)auVar204[0x3d];
                      local_2c0[0x3e] = (RTCHitN)auVar204[0x3e];
                      local_2c0[0x3f] = (RTCHitN)auVar204[0x3f];
                      local_180 = local_500._0_8_;
                      uStack_178 = local_500._8_8_;
                      uStack_170 = local_500._16_8_;
                      uStack_168 = local_500._24_8_;
                      uStack_160 = local_500._32_8_;
                      uStack_158 = local_500._40_8_;
                      uStack_150 = local_500._48_8_;
                      uStack_148 = local_500._56_8_;
                      auVar204 = vmovdqa64_avx512f(local_4c0);
                      local_140 = vmovdqa64_avx512f(auVar204);
                      auVar140 = vpcmpeqd_avx2(auVar204._0_32_,auVar204._0_32_);
                      local_8c8[3] = auVar140;
                      local_8c8[2] = auVar140;
                      local_8c8[1] = auVar140;
                      *local_8c8 = auVar140;
                      local_100 = vbroadcastss_avx512f(ZEXT416((local_910.context)->instID[0]));
                      local_c0 = vbroadcastss_avx512f(ZEXT416((local_910.context)->instPrimID[0]));
                      local_600 = local_300;
                      local_910.valid = (int *)local_600;
                      local_910.geometryUserPtr = pGVar110->userPtr;
                      local_910.hit = local_2c0;
                      local_910.N = 0x10;
                      local_540._0_4_ = uVar109;
                      local_910.ray = (RTCRayN *)ray;
                      if (pGVar110->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar110->intersectionFilterN)(&local_910);
                        auVar240 = ZEXT3264(local_8a0);
                        auVar186 = ZEXT3264(local_880);
                        auVar235 = ZEXT3264(local_8c0);
                        auVar238 = ZEXT3264(local_7c0);
                        auVar237 = ZEXT3264(local_7a0);
                        in_ZMM21 = ZEXT3264(local_860);
                        in_ZMM20 = ZEXT3264(local_840);
                        auVar119 = vxorps_avx512vl(auVar117,auVar117);
                        auVar239 = ZEXT1664(auVar119);
                        pGVar110 = local_8d0;
                        uVar109 = local_540._0_4_;
                      }
                      bVar114 = (byte)uVar109;
                      auVar119 = auVar239._0_16_;
                      auVar204 = vmovdqa64_avx512f(local_600);
                      uVar187 = vptestmd_avx512f(auVar204,auVar204);
                      if ((short)uVar187 == 0) {
LAB_01dc9846:
                        *(undefined4 *)(ray + k * 4 + 0x200) = local_800;
                      }
                      else {
                        p_Var15 = context->args->filter;
                        if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar110->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var15)(&local_910);
                          bVar114 = local_540[0];
                          auVar240 = ZEXT3264(local_8a0);
                          auVar186 = ZEXT3264(local_880);
                          auVar235 = ZEXT3264(local_8c0);
                          auVar238 = ZEXT3264(local_7c0);
                          auVar237 = ZEXT3264(local_7a0);
                          in_ZMM21 = ZEXT3264(local_860);
                          in_ZMM20 = ZEXT3264(local_840);
                          auVar119 = vxorps_avx512vl(auVar119,auVar119);
                          auVar239 = ZEXT1664(auVar119);
                          pGVar110 = local_8d0;
                        }
                        auVar204 = vmovdqa64_avx512f(local_600);
                        uVar108 = vptestmd_avx512f(auVar204,auVar204);
                        if ((short)uVar108 == 0) goto LAB_01dc9846;
                        iVar1 = *(int *)(local_910.hit + 4);
                        iVar2 = *(int *)(local_910.hit + 8);
                        iVar83 = *(int *)(local_910.hit + 0xc);
                        iVar84 = *(int *)(local_910.hit + 0x10);
                        iVar85 = *(int *)(local_910.hit + 0x14);
                        iVar86 = *(int *)(local_910.hit + 0x18);
                        iVar87 = *(int *)(local_910.hit + 0x1c);
                        iVar88 = *(int *)(local_910.hit + 0x20);
                        iVar89 = *(int *)(local_910.hit + 0x24);
                        iVar90 = *(int *)(local_910.hit + 0x28);
                        iVar91 = *(int *)(local_910.hit + 0x2c);
                        iVar92 = *(int *)(local_910.hit + 0x30);
                        iVar93 = *(int *)(local_910.hit + 0x34);
                        iVar94 = *(int *)(local_910.hit + 0x38);
                        iVar95 = *(int *)(local_910.hit + 0x3c);
                        bVar104 = (byte)uVar108;
                        bVar16 = (bool)((byte)(uVar108 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar108 >> 2) & 1);
                        bVar18 = (bool)((byte)(uVar108 >> 3) & 1);
                        bVar19 = (bool)((byte)(uVar108 >> 4) & 1);
                        bVar20 = (bool)((byte)(uVar108 >> 5) & 1);
                        bVar21 = (bool)((byte)(uVar108 >> 6) & 1);
                        bVar22 = (bool)((byte)(uVar108 >> 7) & 1);
                        bVar103 = (byte)(uVar108 >> 8);
                        bVar23 = (bool)((byte)(uVar108 >> 9) & 1);
                        bVar24 = (bool)((byte)(uVar108 >> 10) & 1);
                        bVar25 = (bool)((byte)(uVar108 >> 0xb) & 1);
                        bVar26 = (bool)((byte)(uVar108 >> 0xc) & 1);
                        bVar27 = (bool)((byte)(uVar108 >> 0xd) & 1);
                        bVar28 = (bool)((byte)(uVar108 >> 0xe) & 1);
                        bVar29 = SUB81(uVar108 >> 0xf,0);
                        *(uint *)(local_910.ray + 0x300) =
                             (uint)(bVar104 & 1) * *(int *)local_910.hit |
                             (uint)!(bool)(bVar104 & 1) * *(int *)(local_910.ray + 0x300);
                        *(uint *)(local_910.ray + 0x304) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_910.ray + 0x304);
                        *(uint *)(local_910.ray + 0x308) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_910.ray + 0x308);
                        *(uint *)(local_910.ray + 0x30c) =
                             (uint)bVar18 * iVar83 | (uint)!bVar18 * *(int *)(local_910.ray + 0x30c)
                        ;
                        *(uint *)(local_910.ray + 0x310) =
                             (uint)bVar19 * iVar84 | (uint)!bVar19 * *(int *)(local_910.ray + 0x310)
                        ;
                        *(uint *)(local_910.ray + 0x314) =
                             (uint)bVar20 * iVar85 | (uint)!bVar20 * *(int *)(local_910.ray + 0x314)
                        ;
                        *(uint *)(local_910.ray + 0x318) =
                             (uint)bVar21 * iVar86 | (uint)!bVar21 * *(int *)(local_910.ray + 0x318)
                        ;
                        *(uint *)(local_910.ray + 0x31c) =
                             (uint)bVar22 * iVar87 | (uint)!bVar22 * *(int *)(local_910.ray + 0x31c)
                        ;
                        *(uint *)(local_910.ray + 800) =
                             (uint)(bVar103 & 1) * iVar88 |
                             (uint)!(bool)(bVar103 & 1) * *(int *)(local_910.ray + 800);
                        *(uint *)(local_910.ray + 0x324) =
                             (uint)bVar23 * iVar89 | (uint)!bVar23 * *(int *)(local_910.ray + 0x324)
                        ;
                        *(uint *)(local_910.ray + 0x328) =
                             (uint)bVar24 * iVar90 | (uint)!bVar24 * *(int *)(local_910.ray + 0x328)
                        ;
                        *(uint *)(local_910.ray + 0x32c) =
                             (uint)bVar25 * iVar91 | (uint)!bVar25 * *(int *)(local_910.ray + 0x32c)
                        ;
                        *(uint *)(local_910.ray + 0x330) =
                             (uint)bVar26 * iVar92 | (uint)!bVar26 * *(int *)(local_910.ray + 0x330)
                        ;
                        *(uint *)(local_910.ray + 0x334) =
                             (uint)bVar27 * iVar93 | (uint)!bVar27 * *(int *)(local_910.ray + 0x334)
                        ;
                        *(uint *)(local_910.ray + 0x338) =
                             (uint)bVar28 * iVar94 | (uint)!bVar28 * *(int *)(local_910.ray + 0x338)
                        ;
                        *(uint *)(local_910.ray + 0x33c) =
                             (uint)bVar29 * iVar95 | (uint)!bVar29 * *(int *)(local_910.ray + 0x33c)
                        ;
                        iVar1 = *(int *)(local_910.hit + 0x44);
                        iVar2 = *(int *)(local_910.hit + 0x48);
                        iVar83 = *(int *)(local_910.hit + 0x4c);
                        iVar84 = *(int *)(local_910.hit + 0x50);
                        iVar85 = *(int *)(local_910.hit + 0x54);
                        iVar86 = *(int *)(local_910.hit + 0x58);
                        iVar87 = *(int *)(local_910.hit + 0x5c);
                        iVar88 = *(int *)(local_910.hit + 0x60);
                        iVar89 = *(int *)(local_910.hit + 100);
                        iVar90 = *(int *)(local_910.hit + 0x68);
                        iVar91 = *(int *)(local_910.hit + 0x6c);
                        iVar92 = *(int *)(local_910.hit + 0x70);
                        iVar93 = *(int *)(local_910.hit + 0x74);
                        iVar94 = *(int *)(local_910.hit + 0x78);
                        iVar95 = *(int *)(local_910.hit + 0x7c);
                        bVar16 = (bool)((byte)(uVar108 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar108 >> 2) & 1);
                        bVar18 = (bool)((byte)(uVar108 >> 3) & 1);
                        bVar19 = (bool)((byte)(uVar108 >> 4) & 1);
                        bVar20 = (bool)((byte)(uVar108 >> 5) & 1);
                        bVar21 = (bool)((byte)(uVar108 >> 6) & 1);
                        bVar22 = (bool)((byte)(uVar108 >> 7) & 1);
                        bVar23 = (bool)((byte)(uVar108 >> 9) & 1);
                        bVar24 = (bool)((byte)(uVar108 >> 10) & 1);
                        bVar25 = (bool)((byte)(uVar108 >> 0xb) & 1);
                        bVar26 = (bool)((byte)(uVar108 >> 0xc) & 1);
                        bVar27 = (bool)((byte)(uVar108 >> 0xd) & 1);
                        bVar28 = (bool)((byte)(uVar108 >> 0xe) & 1);
                        bVar29 = SUB81(uVar108 >> 0xf,0);
                        *(uint *)(local_910.ray + 0x340) =
                             (uint)(bVar104 & 1) * *(int *)(local_910.hit + 0x40) |
                             (uint)!(bool)(bVar104 & 1) * *(int *)(local_910.ray + 0x340);
                        *(uint *)(local_910.ray + 0x344) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_910.ray + 0x344);
                        *(uint *)(local_910.ray + 0x348) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_910.ray + 0x348);
                        *(uint *)(local_910.ray + 0x34c) =
                             (uint)bVar18 * iVar83 | (uint)!bVar18 * *(int *)(local_910.ray + 0x34c)
                        ;
                        *(uint *)(local_910.ray + 0x350) =
                             (uint)bVar19 * iVar84 | (uint)!bVar19 * *(int *)(local_910.ray + 0x350)
                        ;
                        *(uint *)(local_910.ray + 0x354) =
                             (uint)bVar20 * iVar85 | (uint)!bVar20 * *(int *)(local_910.ray + 0x354)
                        ;
                        *(uint *)(local_910.ray + 0x358) =
                             (uint)bVar21 * iVar86 | (uint)!bVar21 * *(int *)(local_910.ray + 0x358)
                        ;
                        *(uint *)(local_910.ray + 0x35c) =
                             (uint)bVar22 * iVar87 | (uint)!bVar22 * *(int *)(local_910.ray + 0x35c)
                        ;
                        *(uint *)(local_910.ray + 0x360) =
                             (uint)(bVar103 & 1) * iVar88 |
                             (uint)!(bool)(bVar103 & 1) * *(int *)(local_910.ray + 0x360);
                        *(uint *)(local_910.ray + 0x364) =
                             (uint)bVar23 * iVar89 | (uint)!bVar23 * *(int *)(local_910.ray + 0x364)
                        ;
                        *(uint *)(local_910.ray + 0x368) =
                             (uint)bVar24 * iVar90 | (uint)!bVar24 * *(int *)(local_910.ray + 0x368)
                        ;
                        *(uint *)(local_910.ray + 0x36c) =
                             (uint)bVar25 * iVar91 | (uint)!bVar25 * *(int *)(local_910.ray + 0x36c)
                        ;
                        *(uint *)(local_910.ray + 0x370) =
                             (uint)bVar26 * iVar92 | (uint)!bVar26 * *(int *)(local_910.ray + 0x370)
                        ;
                        *(uint *)(local_910.ray + 0x374) =
                             (uint)bVar27 * iVar93 | (uint)!bVar27 * *(int *)(local_910.ray + 0x374)
                        ;
                        *(uint *)(local_910.ray + 0x378) =
                             (uint)bVar28 * iVar94 | (uint)!bVar28 * *(int *)(local_910.ray + 0x378)
                        ;
                        *(uint *)(local_910.ray + 0x37c) =
                             (uint)bVar29 * iVar95 | (uint)!bVar29 * *(int *)(local_910.ray + 0x37c)
                        ;
                        iVar1 = *(int *)(local_910.hit + 0x84);
                        iVar2 = *(int *)(local_910.hit + 0x88);
                        iVar83 = *(int *)(local_910.hit + 0x8c);
                        iVar84 = *(int *)(local_910.hit + 0x90);
                        iVar85 = *(int *)(local_910.hit + 0x94);
                        iVar86 = *(int *)(local_910.hit + 0x98);
                        iVar87 = *(int *)(local_910.hit + 0x9c);
                        iVar88 = *(int *)(local_910.hit + 0xa0);
                        iVar89 = *(int *)(local_910.hit + 0xa4);
                        iVar90 = *(int *)(local_910.hit + 0xa8);
                        iVar91 = *(int *)(local_910.hit + 0xac);
                        iVar92 = *(int *)(local_910.hit + 0xb0);
                        iVar93 = *(int *)(local_910.hit + 0xb4);
                        iVar94 = *(int *)(local_910.hit + 0xb8);
                        iVar95 = *(int *)(local_910.hit + 0xbc);
                        bVar16 = (bool)((byte)(uVar108 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar108 >> 2) & 1);
                        bVar18 = (bool)((byte)(uVar108 >> 3) & 1);
                        bVar19 = (bool)((byte)(uVar108 >> 4) & 1);
                        bVar20 = (bool)((byte)(uVar108 >> 5) & 1);
                        bVar21 = (bool)((byte)(uVar108 >> 6) & 1);
                        bVar22 = (bool)((byte)(uVar108 >> 7) & 1);
                        bVar23 = (bool)((byte)(uVar108 >> 9) & 1);
                        bVar24 = (bool)((byte)(uVar108 >> 10) & 1);
                        bVar25 = (bool)((byte)(uVar108 >> 0xb) & 1);
                        bVar26 = (bool)((byte)(uVar108 >> 0xc) & 1);
                        bVar27 = (bool)((byte)(uVar108 >> 0xd) & 1);
                        bVar28 = (bool)((byte)(uVar108 >> 0xe) & 1);
                        bVar29 = SUB81(uVar108 >> 0xf,0);
                        *(uint *)(local_910.ray + 0x380) =
                             (uint)(bVar104 & 1) * *(int *)(local_910.hit + 0x80) |
                             (uint)!(bool)(bVar104 & 1) * *(int *)(local_910.ray + 0x380);
                        *(uint *)(local_910.ray + 900) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_910.ray + 900);
                        *(uint *)(local_910.ray + 0x388) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_910.ray + 0x388);
                        *(uint *)(local_910.ray + 0x38c) =
                             (uint)bVar18 * iVar83 | (uint)!bVar18 * *(int *)(local_910.ray + 0x38c)
                        ;
                        *(uint *)(local_910.ray + 0x390) =
                             (uint)bVar19 * iVar84 | (uint)!bVar19 * *(int *)(local_910.ray + 0x390)
                        ;
                        *(uint *)(local_910.ray + 0x394) =
                             (uint)bVar20 * iVar85 | (uint)!bVar20 * *(int *)(local_910.ray + 0x394)
                        ;
                        *(uint *)(local_910.ray + 0x398) =
                             (uint)bVar21 * iVar86 | (uint)!bVar21 * *(int *)(local_910.ray + 0x398)
                        ;
                        *(uint *)(local_910.ray + 0x39c) =
                             (uint)bVar22 * iVar87 | (uint)!bVar22 * *(int *)(local_910.ray + 0x39c)
                        ;
                        *(uint *)(local_910.ray + 0x3a0) =
                             (uint)(bVar103 & 1) * iVar88 |
                             (uint)!(bool)(bVar103 & 1) * *(int *)(local_910.ray + 0x3a0);
                        *(uint *)(local_910.ray + 0x3a4) =
                             (uint)bVar23 * iVar89 | (uint)!bVar23 * *(int *)(local_910.ray + 0x3a4)
                        ;
                        *(uint *)(local_910.ray + 0x3a8) =
                             (uint)bVar24 * iVar90 | (uint)!bVar24 * *(int *)(local_910.ray + 0x3a8)
                        ;
                        *(uint *)(local_910.ray + 0x3ac) =
                             (uint)bVar25 * iVar91 | (uint)!bVar25 * *(int *)(local_910.ray + 0x3ac)
                        ;
                        *(uint *)(local_910.ray + 0x3b0) =
                             (uint)bVar26 * iVar92 | (uint)!bVar26 * *(int *)(local_910.ray + 0x3b0)
                        ;
                        *(uint *)(local_910.ray + 0x3b4) =
                             (uint)bVar27 * iVar93 | (uint)!bVar27 * *(int *)(local_910.ray + 0x3b4)
                        ;
                        *(uint *)(local_910.ray + 0x3b8) =
                             (uint)bVar28 * iVar94 | (uint)!bVar28 * *(int *)(local_910.ray + 0x3b8)
                        ;
                        *(uint *)(local_910.ray + 0x3bc) =
                             (uint)bVar29 * iVar95 | (uint)!bVar29 * *(int *)(local_910.ray + 0x3bc)
                        ;
                        iVar1 = *(int *)(local_910.hit + 0xc4);
                        iVar2 = *(int *)(local_910.hit + 200);
                        iVar83 = *(int *)(local_910.hit + 0xcc);
                        iVar84 = *(int *)(local_910.hit + 0xd0);
                        iVar85 = *(int *)(local_910.hit + 0xd4);
                        iVar86 = *(int *)(local_910.hit + 0xd8);
                        iVar87 = *(int *)(local_910.hit + 0xdc);
                        iVar88 = *(int *)(local_910.hit + 0xe0);
                        iVar89 = *(int *)(local_910.hit + 0xe4);
                        iVar90 = *(int *)(local_910.hit + 0xe8);
                        iVar91 = *(int *)(local_910.hit + 0xec);
                        iVar92 = *(int *)(local_910.hit + 0xf0);
                        iVar93 = *(int *)(local_910.hit + 0xf4);
                        iVar94 = *(int *)(local_910.hit + 0xf8);
                        iVar95 = *(int *)(local_910.hit + 0xfc);
                        bVar16 = (bool)((byte)(uVar108 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar108 >> 2) & 1);
                        bVar18 = (bool)((byte)(uVar108 >> 3) & 1);
                        bVar19 = (bool)((byte)(uVar108 >> 4) & 1);
                        bVar20 = (bool)((byte)(uVar108 >> 5) & 1);
                        bVar21 = (bool)((byte)(uVar108 >> 6) & 1);
                        bVar22 = (bool)((byte)(uVar108 >> 7) & 1);
                        bVar23 = (bool)((byte)(uVar108 >> 9) & 1);
                        bVar24 = (bool)((byte)(uVar108 >> 10) & 1);
                        bVar25 = (bool)((byte)(uVar108 >> 0xb) & 1);
                        bVar26 = (bool)((byte)(uVar108 >> 0xc) & 1);
                        bVar27 = (bool)((byte)(uVar108 >> 0xd) & 1);
                        bVar28 = (bool)((byte)(uVar108 >> 0xe) & 1);
                        bVar29 = SUB81(uVar108 >> 0xf,0);
                        *(uint *)(local_910.ray + 0x3c0) =
                             (uint)(bVar104 & 1) * *(int *)(local_910.hit + 0xc0) |
                             (uint)!(bool)(bVar104 & 1) * *(int *)(local_910.ray + 0x3c0);
                        *(uint *)(local_910.ray + 0x3c4) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_910.ray + 0x3c4);
                        *(uint *)(local_910.ray + 0x3c8) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_910.ray + 0x3c8);
                        *(uint *)(local_910.ray + 0x3cc) =
                             (uint)bVar18 * iVar83 | (uint)!bVar18 * *(int *)(local_910.ray + 0x3cc)
                        ;
                        *(uint *)(local_910.ray + 0x3d0) =
                             (uint)bVar19 * iVar84 | (uint)!bVar19 * *(int *)(local_910.ray + 0x3d0)
                        ;
                        *(uint *)(local_910.ray + 0x3d4) =
                             (uint)bVar20 * iVar85 | (uint)!bVar20 * *(int *)(local_910.ray + 0x3d4)
                        ;
                        *(uint *)(local_910.ray + 0x3d8) =
                             (uint)bVar21 * iVar86 | (uint)!bVar21 * *(int *)(local_910.ray + 0x3d8)
                        ;
                        *(uint *)(local_910.ray + 0x3dc) =
                             (uint)bVar22 * iVar87 | (uint)!bVar22 * *(int *)(local_910.ray + 0x3dc)
                        ;
                        *(uint *)(local_910.ray + 0x3e0) =
                             (uint)(bVar103 & 1) * iVar88 |
                             (uint)!(bool)(bVar103 & 1) * *(int *)(local_910.ray + 0x3e0);
                        *(uint *)(local_910.ray + 0x3e4) =
                             (uint)bVar23 * iVar89 | (uint)!bVar23 * *(int *)(local_910.ray + 0x3e4)
                        ;
                        *(uint *)(local_910.ray + 1000) =
                             (uint)bVar24 * iVar90 | (uint)!bVar24 * *(int *)(local_910.ray + 1000);
                        *(uint *)(local_910.ray + 0x3ec) =
                             (uint)bVar25 * iVar91 | (uint)!bVar25 * *(int *)(local_910.ray + 0x3ec)
                        ;
                        *(uint *)(local_910.ray + 0x3f0) =
                             (uint)bVar26 * iVar92 | (uint)!bVar26 * *(int *)(local_910.ray + 0x3f0)
                        ;
                        *(uint *)(local_910.ray + 0x3f4) =
                             (uint)bVar27 * iVar93 | (uint)!bVar27 * *(int *)(local_910.ray + 0x3f4)
                        ;
                        *(uint *)(local_910.ray + 0x3f8) =
                             (uint)bVar28 * iVar94 | (uint)!bVar28 * *(int *)(local_910.ray + 0x3f8)
                        ;
                        *(uint *)(local_910.ray + 0x3fc) =
                             (uint)bVar29 * iVar95 | (uint)!bVar29 * *(int *)(local_910.ray + 0x3fc)
                        ;
                        iVar1 = *(int *)(local_910.hit + 0x104);
                        iVar2 = *(int *)(local_910.hit + 0x108);
                        iVar83 = *(int *)(local_910.hit + 0x10c);
                        iVar84 = *(int *)(local_910.hit + 0x110);
                        iVar85 = *(int *)(local_910.hit + 0x114);
                        iVar86 = *(int *)(local_910.hit + 0x118);
                        iVar87 = *(int *)(local_910.hit + 0x11c);
                        iVar88 = *(int *)(local_910.hit + 0x120);
                        iVar89 = *(int *)(local_910.hit + 0x124);
                        iVar90 = *(int *)(local_910.hit + 0x128);
                        iVar91 = *(int *)(local_910.hit + 300);
                        iVar92 = *(int *)(local_910.hit + 0x130);
                        iVar93 = *(int *)(local_910.hit + 0x134);
                        iVar94 = *(int *)(local_910.hit + 0x138);
                        iVar95 = *(int *)(local_910.hit + 0x13c);
                        bVar16 = (bool)((byte)(uVar108 >> 1) & 1);
                        bVar17 = (bool)((byte)(uVar108 >> 2) & 1);
                        bVar18 = (bool)((byte)(uVar108 >> 3) & 1);
                        bVar19 = (bool)((byte)(uVar108 >> 4) & 1);
                        bVar20 = (bool)((byte)(uVar108 >> 5) & 1);
                        bVar21 = (bool)((byte)(uVar108 >> 6) & 1);
                        bVar22 = (bool)((byte)(uVar108 >> 7) & 1);
                        bVar23 = (bool)((byte)(uVar108 >> 9) & 1);
                        bVar24 = (bool)((byte)(uVar108 >> 10) & 1);
                        bVar25 = (bool)((byte)(uVar108 >> 0xb) & 1);
                        bVar26 = (bool)((byte)(uVar108 >> 0xc) & 1);
                        bVar27 = (bool)((byte)(uVar108 >> 0xd) & 1);
                        bVar28 = (bool)((byte)(uVar108 >> 0xe) & 1);
                        bVar29 = SUB81(uVar108 >> 0xf,0);
                        *(uint *)(local_910.ray + 0x400) =
                             (uint)(bVar104 & 1) * *(int *)(local_910.hit + 0x100) |
                             (uint)!(bool)(bVar104 & 1) * *(int *)(local_910.ray + 0x400);
                        *(uint *)(local_910.ray + 0x404) =
                             (uint)bVar16 * iVar1 | (uint)!bVar16 * *(int *)(local_910.ray + 0x404);
                        *(uint *)(local_910.ray + 0x408) =
                             (uint)bVar17 * iVar2 | (uint)!bVar17 * *(int *)(local_910.ray + 0x408);
                        *(uint *)(local_910.ray + 0x40c) =
                             (uint)bVar18 * iVar83 | (uint)!bVar18 * *(int *)(local_910.ray + 0x40c)
                        ;
                        *(uint *)(local_910.ray + 0x410) =
                             (uint)bVar19 * iVar84 | (uint)!bVar19 * *(int *)(local_910.ray + 0x410)
                        ;
                        *(uint *)(local_910.ray + 0x414) =
                             (uint)bVar20 * iVar85 | (uint)!bVar20 * *(int *)(local_910.ray + 0x414)
                        ;
                        *(uint *)(local_910.ray + 0x418) =
                             (uint)bVar21 * iVar86 | (uint)!bVar21 * *(int *)(local_910.ray + 0x418)
                        ;
                        *(uint *)(local_910.ray + 0x41c) =
                             (uint)bVar22 * iVar87 | (uint)!bVar22 * *(int *)(local_910.ray + 0x41c)
                        ;
                        *(uint *)(local_910.ray + 0x420) =
                             (uint)(bVar103 & 1) * iVar88 |
                             (uint)!(bool)(bVar103 & 1) * *(int *)(local_910.ray + 0x420);
                        *(uint *)(local_910.ray + 0x424) =
                             (uint)bVar23 * iVar89 | (uint)!bVar23 * *(int *)(local_910.ray + 0x424)
                        ;
                        *(uint *)(local_910.ray + 0x428) =
                             (uint)bVar24 * iVar90 | (uint)!bVar24 * *(int *)(local_910.ray + 0x428)
                        ;
                        *(uint *)(local_910.ray + 0x42c) =
                             (uint)bVar25 * iVar91 | (uint)!bVar25 * *(int *)(local_910.ray + 0x42c)
                        ;
                        *(uint *)(local_910.ray + 0x430) =
                             (uint)bVar26 * iVar92 | (uint)!bVar26 * *(int *)(local_910.ray + 0x430)
                        ;
                        *(uint *)(local_910.ray + 0x434) =
                             (uint)bVar27 * iVar93 | (uint)!bVar27 * *(int *)(local_910.ray + 0x434)
                        ;
                        *(uint *)(local_910.ray + 0x438) =
                             (uint)bVar28 * iVar94 | (uint)!bVar28 * *(int *)(local_910.ray + 0x438)
                        ;
                        *(uint *)(local_910.ray + 0x43c) =
                             (uint)bVar29 * iVar95 | (uint)!bVar29 * *(int *)(local_910.ray + 0x43c)
                        ;
                        auVar204 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_910.hit + 0x140));
                        auVar204 = vmovdqu32_avx512f(auVar204);
                        *(undefined1 (*) [64])(local_910.ray + 0x440) = auVar204;
                        auVar204 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_910.hit + 0x180));
                        auVar204 = vmovdqu32_avx512f(auVar204);
                        *(undefined1 (*) [64])(local_910.ray + 0x480) = auVar204;
                        auVar204 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_910.hit + 0x1c0));
                        auVar204 = vmovdqa32_avx512f(auVar204);
                        *(undefined1 (*) [64])(local_910.ray + 0x4c0) = auVar204;
                        auVar204 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_910.hit + 0x200));
                        auVar204 = vmovdqa32_avx512f(auVar204);
                        *(undefined1 (*) [64])(local_910.ray + 0x500) = auVar204;
                      }
                      bVar114 = ~(byte)(1 << ((uint)uVar105 & 0x1f)) & bVar114;
                      uVar174 = *(undefined4 *)(ray + k * 4 + 0x200);
                      auVar45._4_4_ = uVar174;
                      auVar45._0_4_ = uVar174;
                      auVar45._8_4_ = uVar174;
                      auVar45._12_4_ = uVar174;
                      auVar45._16_4_ = uVar174;
                      auVar45._20_4_ = uVar174;
                      auVar45._24_4_ = uVar174;
                      auVar45._28_4_ = uVar174;
                      uVar187 = vcmpps_avx512vl(in_ZMM21._0_32_,auVar45,2);
                      bVar104 = bVar114 & (byte)uVar187;
                      uVar109 = (uint)bVar104;
                      if ((bVar114 & (byte)uVar187) != 0) {
                        auVar184._8_4_ = 0x7f800000;
                        auVar184._0_8_ = 0x7f8000007f800000;
                        auVar184._12_4_ = 0x7f800000;
                        auVar184._16_4_ = 0x7f800000;
                        auVar184._20_4_ = 0x7f800000;
                        auVar184._24_4_ = 0x7f800000;
                        auVar184._28_4_ = 0x7f800000;
                        auVar140 = vblendmps_avx512vl(auVar184,in_ZMM21._0_32_);
                        auVar163._0_4_ =
                             (uint)(bVar104 & 1) * auVar140._0_4_ |
                             (uint)!(bool)(bVar104 & 1) * 0x7f800000;
                        bVar16 = (bool)(bVar104 >> 1 & 1);
                        auVar163._4_4_ = (uint)bVar16 * auVar140._4_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar104 >> 2 & 1);
                        auVar163._8_4_ = (uint)bVar16 * auVar140._8_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar104 >> 3 & 1);
                        auVar163._12_4_ =
                             (uint)bVar16 * auVar140._12_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar104 >> 4 & 1);
                        auVar163._16_4_ =
                             (uint)bVar16 * auVar140._16_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar104 >> 5 & 1);
                        auVar163._20_4_ =
                             (uint)bVar16 * auVar140._20_4_ | (uint)!bVar16 * 0x7f800000;
                        bVar16 = (bool)(bVar104 >> 6 & 1);
                        auVar163._24_4_ =
                             (uint)bVar16 * auVar140._24_4_ | (uint)!bVar16 * 0x7f800000;
                        auVar163._28_4_ =
                             (uint)(bVar104 >> 7) * auVar140._28_4_ |
                             (uint)!(bool)(bVar104 >> 7) * 0x7f800000;
                        auVar140 = vshufps_avx(auVar163,auVar163,0xb1);
                        auVar140 = vminps_avx(auVar163,auVar140);
                        auVar141 = vshufpd_avx(auVar140,auVar140,5);
                        auVar140 = vminps_avx(auVar140,auVar141);
                        auVar141 = vpermpd_avx2(auVar140,0x4e);
                        auVar140 = vminps_avx(auVar140,auVar141);
                        uVar187 = vcmpps_avx512vl(auVar163,auVar140,0);
                        bVar114 = (byte)uVar187 & bVar104;
                        uVar107 = uVar109;
                        if (bVar114 != 0) {
                          uVar107 = (uint)bVar114;
                        }
                        uVar106 = 0;
                        for (; (uVar107 & 1) == 0; uVar107 = uVar107 >> 1 | 0x80000000) {
                          uVar106 = uVar106 + 1;
                        }
                        uVar105 = (ulong)uVar106;
                      }
                    } while (bVar104 != 0);
                  }
                }
              }
            }
          }
          auVar221 = ZEXT3264(auVar125);
          auVar204 = ZEXT3264(auVar127);
          lVar113 = lVar113 + 8;
          auVar236 = auVar238;
        } while ((int)lVar113 < iVar13);
      }
      uVar174 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar40._4_4_ = uVar174;
      auVar40._0_4_ = uVar174;
      auVar40._8_4_ = uVar174;
      auVar40._12_4_ = uVar174;
      auVar40._16_4_ = uVar174;
      auVar40._20_4_ = uVar174;
      auVar40._24_4_ = uVar174;
      auVar40._28_4_ = uVar174;
      uVar31 = vcmpps_avx512vl(local_320,auVar40,2);
      uVar111 = (uint)uVar112 & (uint)uVar31;
      uVar112 = (ulong)uVar111;
    } while (uVar111 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }